

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

void embree::avx512::CurveNiMBIntersectorK<4,8>::
     intersect_t<embree::avx512::SweepCurve1IntersectorK<embree::BSplineCurveT,8>,embree::avx512::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  Primitive PVar2;
  undefined4 uVar3;
  Geometry *pGVar4;
  __int_type_conflict _Var5;
  long lVar6;
  long lVar7;
  RTCRayQueryContext *pRVar8;
  RTCFilterFunctionN p_Var9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  undefined1 auVar18 [16];
  undefined8 uVar19;
  ulong uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  int iVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [12];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  int iVar52;
  int iVar53;
  int iVar54;
  int iVar55;
  int iVar56;
  int iVar57;
  int iVar58;
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  byte bVar62;
  byte bVar63;
  byte bVar64;
  uint uVar65;
  ulong uVar66;
  byte bVar67;
  byte bVar68;
  int iVar69;
  long lVar70;
  byte bVar71;
  long lVar72;
  ulong uVar73;
  uint uVar74;
  uint uVar75;
  uint uVar145;
  uint uVar146;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  uint uVar148;
  uint uVar149;
  uint uVar150;
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  uint uVar147;
  uint uVar151;
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  float fVar152;
  float fVar173;
  float fVar175;
  vint4 bi_2;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  float fVar177;
  float fVar178;
  float fVar179;
  undefined1 auVar164 [32];
  float fVar174;
  float fVar176;
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined4 uVar180;
  vint4 bi_1;
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar194 [16];
  undefined1 auVar198 [32];
  undefined1 auVar199 [64];
  float fVar200;
  float fVar221;
  float fVar222;
  vint4 bi;
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  float fVar223;
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  float fVar241;
  float fVar242;
  float fVar243;
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  float fVar244;
  float fVar245;
  float fVar254;
  float fVar255;
  vint4 ai_2;
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  float fVar256;
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  vint4 ai_1;
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  float fVar264;
  undefined1 auVar263 [64];
  vint4 ai;
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [32];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar274 [32];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar275 [64];
  float fVar276;
  float fVar281;
  float fVar282;
  undefined1 auVar277 [16];
  float fVar283;
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [64];
  undefined1 auVar284 [16];
  undefined1 auVar285 [64];
  float fVar287;
  undefined1 auVar286 [64];
  undefined1 auVar288 [64];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [32];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [64];
  undefined1 auVar298 [64];
  undefined1 auVar299 [64];
  undefined1 auVar300 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vfloatx_conflict vu0;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  RTCFilterFunctionNArguments local_950;
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  undefined1 local_860 [32];
  undefined1 local_840 [16];
  undefined1 (*local_830) [32];
  ulong local_828;
  undefined1 local_820 [32];
  undefined1 local_800 [16];
  undefined1 local_7f0 [16];
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  float fStack_7c4;
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_6f0 [16];
  undefined1 local_6e0 [16];
  undefined1 local_6d0 [8];
  float fStack_6c8;
  float fStack_6c4;
  undefined1 local_6c0 [16];
  undefined1 local_6b0 [16];
  undefined1 local_6a0 [16];
  Primitive *local_690;
  ulong local_688;
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  float fStack_664;
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  undefined1 auStack_5f0 [16];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  undefined1 local_560 [32];
  float local_540;
  float fStack_53c;
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [16];
  undefined1 local_510 [16];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  RTCHitN local_480 [32];
  undefined1 local_460 [32];
  undefined4 local_440;
  undefined4 uStack_43c;
  undefined4 uStack_438;
  undefined4 uStack_434;
  undefined4 uStack_430;
  undefined4 uStack_42c;
  undefined4 uStack_428;
  undefined4 uStack_424;
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined1 local_3c0 [32];
  uint local_3a0;
  uint uStack_39c;
  uint uStack_398;
  uint uStack_394;
  uint uStack_390;
  uint uStack_38c;
  uint uStack_388;
  uint uStack_384;
  uint local_380;
  uint uStack_37c;
  uint uStack_378;
  uint uStack_374;
  uint uStack_370;
  uint uStack_36c;
  uint uStack_368;
  uint uStack_364;
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  float local_2e0;
  float fStack_2dc;
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  byte abStack_180 [32];
  undefined1 auStack_160 [32];
  ulong uStack_140;
  int aiStack_138 [66];
  undefined1 auVar293 [64];
  
  PVar2 = prim[1];
  uVar73 = (ulong)(byte)PVar2;
  lVar72 = uVar73 * 0x25;
  fVar276 = *(float *)(prim + lVar72 + 0x12);
  auVar80 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar80 = vinsertps_avx(auVar80,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar79 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar79 = vinsertps_avx(auVar79,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar80 = vsubps_avx(auVar80,*(undefined1 (*) [16])(prim + lVar72 + 6));
  auVar224._0_4_ = fVar276 * auVar80._0_4_;
  auVar224._4_4_ = fVar276 * auVar80._4_4_;
  auVar224._8_4_ = fVar276 * auVar80._8_4_;
  auVar224._12_4_ = fVar276 * auVar80._12_4_;
  auVar80 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 4 + 6)));
  auVar153._0_4_ = fVar276 * auVar79._0_4_;
  auVar153._4_4_ = fVar276 * auVar79._4_4_;
  auVar153._8_4_ = fVar276 * auVar79._8_4_;
  auVar153._12_4_ = fVar276 * auVar79._12_4_;
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar79 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 5 + 6)));
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar82 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 6 + 6)));
  auVar83 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 0xf + 6)));
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar2 * 0x10 + 6)));
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar84 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar2 * 0x10 + uVar73 + 6)));
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar89 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 0x1a + 6)));
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar81 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 0x1b + 6)));
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar85 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 0x1c + 6)));
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar257._4_4_ = auVar153._0_4_;
  auVar257._0_4_ = auVar153._0_4_;
  auVar257._8_4_ = auVar153._0_4_;
  auVar257._12_4_ = auVar153._0_4_;
  auVar86 = vshufps_avx(auVar153,auVar153,0x55);
  auVar87 = vshufps_avx(auVar153,auVar153,0xaa);
  fVar276 = auVar87._0_4_;
  auVar201._0_4_ = fVar276 * auVar82._0_4_;
  fVar173 = auVar87._4_4_;
  auVar201._4_4_ = fVar173 * auVar82._4_4_;
  fVar281 = auVar87._8_4_;
  auVar201._8_4_ = fVar281 * auVar82._8_4_;
  fVar282 = auVar87._12_4_;
  auVar201._12_4_ = fVar282 * auVar82._12_4_;
  auVar181._0_4_ = auVar84._0_4_ * fVar276;
  auVar181._4_4_ = auVar84._4_4_ * fVar173;
  auVar181._8_4_ = auVar84._8_4_ * fVar281;
  auVar181._12_4_ = auVar84._12_4_ * fVar282;
  auVar154._0_4_ = auVar85._0_4_ * fVar276;
  auVar154._4_4_ = auVar85._4_4_ * fVar173;
  auVar154._8_4_ = auVar85._8_4_ * fVar281;
  auVar154._12_4_ = auVar85._12_4_ * fVar282;
  auVar87 = vfmadd231ps_fma(auVar201,auVar86,auVar79);
  auVar90 = vfmadd231ps_fma(auVar181,auVar86,auVar18);
  auVar86 = vfmadd231ps_fma(auVar154,auVar81,auVar86);
  auVar91 = vfmadd231ps_fma(auVar87,auVar257,auVar80);
  auVar90 = vfmadd231ps_fma(auVar90,auVar257,auVar83);
  auVar88 = vfmadd231ps_fma(auVar86,auVar89,auVar257);
  auVar295._4_4_ = auVar224._0_4_;
  auVar295._0_4_ = auVar224._0_4_;
  auVar295._8_4_ = auVar224._0_4_;
  auVar295._12_4_ = auVar224._0_4_;
  auVar86 = vshufps_avx(auVar224,auVar224,0x55);
  auVar87 = vshufps_avx(auVar224,auVar224,0xaa);
  fVar276 = auVar87._0_4_;
  auVar258._0_4_ = fVar276 * auVar82._0_4_;
  fVar173 = auVar87._4_4_;
  auVar258._4_4_ = fVar173 * auVar82._4_4_;
  fVar281 = auVar87._8_4_;
  auVar258._8_4_ = fVar281 * auVar82._8_4_;
  fVar282 = auVar87._12_4_;
  auVar258._12_4_ = fVar282 * auVar82._12_4_;
  auVar246._0_4_ = auVar84._0_4_ * fVar276;
  auVar246._4_4_ = auVar84._4_4_ * fVar173;
  auVar246._8_4_ = auVar84._8_4_ * fVar281;
  auVar246._12_4_ = auVar84._12_4_ * fVar282;
  auVar225._0_4_ = auVar85._0_4_ * fVar276;
  auVar225._4_4_ = auVar85._4_4_ * fVar173;
  auVar225._8_4_ = auVar85._8_4_ * fVar281;
  auVar225._12_4_ = auVar85._12_4_ * fVar282;
  auVar79 = vfmadd231ps_fma(auVar258,auVar86,auVar79);
  auVar82 = vfmadd231ps_fma(auVar246,auVar86,auVar18);
  auVar18 = vfmadd231ps_fma(auVar225,auVar86,auVar81);
  auVar284 = vfmadd231ps_fma(auVar79,auVar295,auVar80);
  auVar153 = vfmadd231ps_fma(auVar82,auVar295,auVar83);
  auVar277._8_4_ = 0x7fffffff;
  auVar277._0_8_ = 0x7fffffff7fffffff;
  auVar277._12_4_ = 0x7fffffff;
  auVar154 = vfmadd231ps_fma(auVar18,auVar295,auVar89);
  auVar80 = vandps_avx(auVar277,auVar91);
  auVar270._8_4_ = 0x219392ef;
  auVar270._0_8_ = 0x219392ef219392ef;
  auVar270._12_4_ = 0x219392ef;
  uVar66 = vcmpps_avx512vl(auVar80,auVar270,1);
  bVar10 = (bool)((byte)uVar66 & 1);
  auVar76._0_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar91._0_4_;
  bVar10 = (bool)((byte)(uVar66 >> 1) & 1);
  auVar76._4_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar91._4_4_;
  bVar10 = (bool)((byte)(uVar66 >> 2) & 1);
  auVar76._8_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar91._8_4_;
  bVar10 = (bool)((byte)(uVar66 >> 3) & 1);
  auVar76._12_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar91._12_4_;
  auVar80 = vandps_avx(auVar277,auVar90);
  uVar66 = vcmpps_avx512vl(auVar80,auVar270,1);
  bVar10 = (bool)((byte)uVar66 & 1);
  auVar77._0_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar90._0_4_;
  bVar10 = (bool)((byte)(uVar66 >> 1) & 1);
  auVar77._4_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar90._4_4_;
  bVar10 = (bool)((byte)(uVar66 >> 2) & 1);
  auVar77._8_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar90._8_4_;
  bVar10 = (bool)((byte)(uVar66 >> 3) & 1);
  auVar77._12_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar90._12_4_;
  auVar80 = vandps_avx(auVar277,auVar88);
  uVar66 = vcmpps_avx512vl(auVar80,auVar270,1);
  bVar10 = (bool)((byte)uVar66 & 1);
  auVar78._0_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar88._0_4_;
  bVar10 = (bool)((byte)(uVar66 >> 1) & 1);
  auVar78._4_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar88._4_4_;
  bVar10 = (bool)((byte)(uVar66 >> 2) & 1);
  auVar78._8_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar88._8_4_;
  bVar10 = (bool)((byte)(uVar66 >> 3) & 1);
  auVar78._12_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar88._12_4_;
  auVar79 = vrcp14ps_avx512vl(auVar76);
  auVar271._8_4_ = 0x3f800000;
  auVar271._0_8_ = 0x3f8000003f800000;
  auVar271._12_4_ = 0x3f800000;
  auVar80 = vfnmadd213ps_fma(auVar76,auVar79,auVar271);
  auVar91 = vfmadd132ps_fma(auVar80,auVar79,auVar79);
  auVar79 = vrcp14ps_avx512vl(auVar77);
  auVar80 = vfnmadd213ps_fma(auVar77,auVar79,auVar271);
  auVar88 = vfmadd132ps_fma(auVar80,auVar79,auVar79);
  auVar79 = vrcp14ps_avx512vl(auVar78);
  auVar80 = vfnmadd213ps_fma(auVar78,auVar79,auVar271);
  auVar92 = vfmadd132ps_fma(auVar80,auVar79,auVar79);
  fVar276 = (*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar72 + 0x16)) *
            *(float *)(prim + lVar72 + 0x1a);
  auVar265._4_4_ = fVar276;
  auVar265._0_4_ = fVar276;
  auVar265._8_4_ = fVar276;
  auVar265._12_4_ = fVar276;
  auVar80._8_8_ = 0;
  auVar80._0_8_ = *(ulong *)(prim + uVar73 * 7 + 6);
  auVar80 = vpmovsxwd_avx(auVar80);
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar79._8_8_ = 0;
  auVar79._0_8_ = *(ulong *)(prim + uVar73 * 0xb + 6);
  auVar79 = vpmovsxwd_avx(auVar79);
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar83 = vsubps_avx(auVar79,auVar80);
  auVar82._8_8_ = 0;
  auVar82._0_8_ = *(ulong *)(prim + uVar73 * 9 + 6);
  auVar79 = vpmovsxwd_avx(auVar82);
  auVar82 = vfmadd213ps_fma(auVar83,auVar265,auVar80);
  auVar80 = vcvtdq2ps_avx(auVar79);
  auVar83._8_8_ = 0;
  auVar83._0_8_ = *(ulong *)(prim + uVar73 * 0xd + 6);
  auVar79 = vpmovsxwd_avx(auVar83);
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar79 = vsubps_avx(auVar79,auVar80);
  auVar83 = vfmadd213ps_fma(auVar79,auVar265,auVar80);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar73 * 0x12 + 6);
  auVar80 = vpmovsxwd_avx(auVar18);
  auVar80 = vcvtdq2ps_avx(auVar80);
  uVar66 = (ulong)(uint)((int)(uVar73 * 5) << 2);
  auVar84._8_8_ = 0;
  auVar84._0_8_ = *(ulong *)(prim + uVar73 * 2 + uVar66 + 6);
  auVar79 = vpmovsxwd_avx(auVar84);
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar79 = vsubps_avx(auVar79,auVar80);
  auVar18 = vfmadd213ps_fma(auVar79,auVar265,auVar80);
  auVar89._8_8_ = 0;
  auVar89._0_8_ = *(ulong *)(prim + uVar66 + 6);
  auVar80 = vpmovsxwd_avx(auVar89);
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar81._8_8_ = 0;
  auVar81._0_8_ = *(ulong *)(prim + uVar73 * 0x18 + 6);
  auVar79 = vpmovsxwd_avx(auVar81);
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar79 = vsubps_avx(auVar79,auVar80);
  auVar84 = vfmadd213ps_fma(auVar79,auVar265,auVar80);
  auVar85._8_8_ = 0;
  auVar85._0_8_ = *(ulong *)(prim + uVar73 * 0x1d + 6);
  auVar80 = vpmovsxwd_avx(auVar85);
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar86._8_8_ = 0;
  auVar86._0_8_ = *(ulong *)(prim + uVar73 + (ulong)(byte)PVar2 * 0x20 + 6);
  auVar79 = vpmovsxwd_avx(auVar86);
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar79 = vsubps_avx(auVar79,auVar80);
  auVar89 = vfmadd213ps_fma(auVar79,auVar265,auVar80);
  auVar87._8_8_ = 0;
  auVar87._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar2 * 0x20 - uVar73) + 6);
  auVar80 = vpmovsxwd_avx(auVar87);
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar90._8_8_ = 0;
  auVar90._0_8_ = *(ulong *)(prim + uVar73 * 0x23 + 6);
  auVar79 = vpmovsxwd_avx(auVar90);
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar79 = vsubps_avx(auVar79,auVar80);
  auVar79 = vfmadd213ps_fma(auVar79,auVar265,auVar80);
  auVar80 = vsubps_avx(auVar82,auVar284);
  auVar266._0_4_ = auVar91._0_4_ * auVar80._0_4_;
  auVar266._4_4_ = auVar91._4_4_ * auVar80._4_4_;
  auVar266._8_4_ = auVar91._8_4_ * auVar80._8_4_;
  auVar266._12_4_ = auVar91._12_4_ * auVar80._12_4_;
  auVar80 = vsubps_avx(auVar83,auVar284);
  auVar202._0_4_ = auVar91._0_4_ * auVar80._0_4_;
  auVar202._4_4_ = auVar91._4_4_ * auVar80._4_4_;
  auVar202._8_4_ = auVar91._8_4_ * auVar80._8_4_;
  auVar202._12_4_ = auVar91._12_4_ * auVar80._12_4_;
  auVar80 = vsubps_avx(auVar18,auVar153);
  auVar259._0_4_ = auVar88._0_4_ * auVar80._0_4_;
  auVar259._4_4_ = auVar88._4_4_ * auVar80._4_4_;
  auVar259._8_4_ = auVar88._8_4_ * auVar80._8_4_;
  auVar259._12_4_ = auVar88._12_4_ * auVar80._12_4_;
  auVar80 = vsubps_avx(auVar84,auVar153);
  auVar182._0_4_ = auVar88._0_4_ * auVar80._0_4_;
  auVar182._4_4_ = auVar88._4_4_ * auVar80._4_4_;
  auVar182._8_4_ = auVar88._8_4_ * auVar80._8_4_;
  auVar182._12_4_ = auVar88._12_4_ * auVar80._12_4_;
  auVar80 = vsubps_avx(auVar89,auVar154);
  auVar247._0_4_ = auVar92._0_4_ * auVar80._0_4_;
  auVar247._4_4_ = auVar92._4_4_ * auVar80._4_4_;
  auVar247._8_4_ = auVar92._8_4_ * auVar80._8_4_;
  auVar247._12_4_ = auVar92._12_4_ * auVar80._12_4_;
  auVar80 = vsubps_avx(auVar79,auVar154);
  auVar155._0_4_ = auVar92._0_4_ * auVar80._0_4_;
  auVar155._4_4_ = auVar92._4_4_ * auVar80._4_4_;
  auVar155._8_4_ = auVar92._8_4_ * auVar80._8_4_;
  auVar155._12_4_ = auVar92._12_4_ * auVar80._12_4_;
  auVar80 = vpminsd_avx(auVar266,auVar202);
  auVar79 = vpminsd_avx(auVar259,auVar182);
  auVar80 = vmaxps_avx(auVar80,auVar79);
  auVar79 = vpminsd_avx(auVar247,auVar155);
  uVar180 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar91._4_4_ = uVar180;
  auVar91._0_4_ = uVar180;
  auVar91._8_4_ = uVar180;
  auVar91._12_4_ = uVar180;
  auVar79 = vmaxps_avx512vl(auVar79,auVar91);
  auVar80 = vmaxps_avx(auVar80,auVar79);
  auVar88._8_4_ = 0x3f7ffffa;
  auVar88._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar88._12_4_ = 0x3f7ffffa;
  local_520 = vmulps_avx512vl(auVar80,auVar88);
  auVar80 = vpmaxsd_avx(auVar266,auVar202);
  auVar79 = vpmaxsd_avx(auVar259,auVar182);
  auVar80 = vminps_avx(auVar80,auVar79);
  auVar79 = vpmaxsd_avx(auVar247,auVar155);
  uVar180 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar92._4_4_ = uVar180;
  auVar92._0_4_ = uVar180;
  auVar92._8_4_ = uVar180;
  auVar92._12_4_ = uVar180;
  auVar79 = vminps_avx512vl(auVar79,auVar92);
  auVar80 = vminps_avx(auVar80,auVar79);
  auVar284._8_4_ = 0x3f800003;
  auVar284._0_8_ = 0x3f8000033f800003;
  auVar284._12_4_ = 0x3f800003;
  auVar80 = vmulps_avx512vl(auVar80,auVar284);
  auVar79 = vpbroadcastd_avx512vl();
  uVar19 = vcmpps_avx512vl(local_520,auVar80,2);
  local_688 = vpcmpgtd_avx512vl(auVar79,_DAT_01f7fcf0);
  local_688 = ((byte)uVar19 & 0xf) & local_688;
  if ((char)local_688 == '\0') {
    return;
  }
  local_830 = (undefined1 (*) [32])&local_3a0;
  local_500 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_690 = prim;
LAB_01ba4336:
  lVar72 = 0;
  for (uVar66 = local_688; (uVar66 & 1) == 0; uVar66 = uVar66 >> 1 | 0x8000000000000000) {
    lVar72 = lVar72 + 1;
  }
  uVar65 = *(uint *)(local_690 + 2);
  local_828 = (ulong)*(uint *)(local_690 + lVar72 * 4 + 6);
  pGVar4 = (context->scene->geometries).items[uVar65].ptr;
  uVar66 = (ulong)*(uint *)(*(long *)&pGVar4->field_0x58 +
                           local_828 *
                           pGVar4[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  fVar276 = (pGVar4->time_range).lower;
  fVar276 = pGVar4->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0xe0) - fVar276) / ((pGVar4->time_range).upper - fVar276));
  auVar80 = vroundss_avx(ZEXT416((uint)fVar276),ZEXT416((uint)fVar276),9);
  auVar80 = vminss_avx(auVar80,ZEXT416((uint)(pGVar4->fnumTimeSegments + -1.0)));
  auVar80 = vmaxss_avx(ZEXT816(0) << 0x20,auVar80);
  fVar276 = fVar276 - auVar80._0_4_;
  _Var5 = pGVar4[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar70 = (long)(int)auVar80._0_4_ * 0x38;
  lVar72 = *(long *)(_Var5 + 0x10 + lVar70);
  lVar6 = *(long *)(_Var5 + 0x38 + lVar70);
  lVar7 = *(long *)(_Var5 + 0x48 + lVar70);
  pfVar1 = (float *)(lVar6 + uVar66 * lVar7);
  auVar203._0_4_ = fVar276 * *pfVar1;
  auVar203._4_4_ = fVar276 * pfVar1[1];
  auVar203._8_4_ = fVar276 * pfVar1[2];
  auVar203._12_4_ = fVar276 * pfVar1[3];
  pfVar1 = (float *)(lVar6 + (uVar66 + 1) * lVar7);
  auVar226._0_4_ = fVar276 * *pfVar1;
  auVar226._4_4_ = fVar276 * pfVar1[1];
  auVar226._8_4_ = fVar276 * pfVar1[2];
  auVar226._12_4_ = fVar276 * pfVar1[3];
  pfVar1 = (float *)(lVar6 + (uVar66 + 2) * lVar7);
  auVar248._0_4_ = fVar276 * *pfVar1;
  auVar248._4_4_ = fVar276 * pfVar1[1];
  auVar248._8_4_ = fVar276 * pfVar1[2];
  auVar248._12_4_ = fVar276 * pfVar1[3];
  pfVar1 = (float *)(lVar6 + lVar7 * (uVar66 + 3));
  auVar183._0_4_ = fVar276 * *pfVar1;
  auVar183._4_4_ = fVar276 * pfVar1[1];
  auVar183._8_4_ = fVar276 * pfVar1[2];
  auVar183._12_4_ = fVar276 * pfVar1[3];
  lVar6 = *(long *)(_Var5 + lVar70);
  fVar276 = 1.0 - fVar276;
  auVar156._4_4_ = fVar276;
  auVar156._0_4_ = fVar276;
  auVar156._8_4_ = fVar276;
  auVar156._12_4_ = fVar276;
  auVar82 = vfmadd231ps_fma(auVar203,auVar156,*(undefined1 (*) [16])(lVar6 + lVar72 * uVar66));
  auVar83 = vfmadd231ps_fma(auVar226,auVar156,*(undefined1 (*) [16])(lVar6 + lVar72 * (uVar66 + 1)))
  ;
  auVar18 = vfmadd231ps_fma(auVar248,auVar156,*(undefined1 (*) [16])(lVar6 + lVar72 * (uVar66 + 2)))
  ;
  auVar84 = vfmadd231ps_fma(auVar183,auVar156,*(undefined1 (*) [16])(lVar6 + lVar72 * (uVar66 + 3)))
  ;
  auVar80 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar79 = vinsertps_avx(auVar80,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  uVar180 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar289._4_4_ = uVar180;
  auVar289._0_4_ = uVar180;
  auVar289._8_4_ = uVar180;
  auVar289._12_4_ = uVar180;
  fStack_570 = (float)uVar180;
  _local_580 = auVar289;
  fStack_56c = (float)uVar180;
  fStack_568 = (float)uVar180;
  register0x0000151c = uVar180;
  auVar293 = ZEXT3264(_local_580);
  uVar180 = *(undefined4 *)(ray + k * 4 + 0xa0);
  auVar294._4_4_ = uVar180;
  auVar294._0_4_ = uVar180;
  auVar294._8_4_ = uVar180;
  auVar294._12_4_ = uVar180;
  local_5a0._16_4_ = uVar180;
  local_5a0._0_16_ = auVar294;
  local_5a0._20_4_ = uVar180;
  local_5a0._24_4_ = uVar180;
  local_5a0._28_4_ = uVar180;
  auVar80 = vunpcklps_avx(auVar289,auVar294);
  fVar276 = *(float *)(ray + k * 4 + 0xc0);
  auVar296._4_4_ = fVar276;
  auVar296._0_4_ = fVar276;
  auVar296._8_4_ = fVar276;
  auVar296._12_4_ = fVar276;
  local_5c0._16_4_ = fVar276;
  local_5c0._0_16_ = auVar296;
  local_5c0._20_4_ = fVar276;
  local_5c0._24_4_ = fVar276;
  local_5c0._28_4_ = fVar276;
  local_7f0 = vinsertps_avx(auVar80,auVar296,0x28);
  auVar285 = ZEXT1664(local_7f0);
  auVar260._0_4_ = auVar82._0_4_ + auVar83._0_4_ + auVar18._0_4_ + auVar84._0_4_;
  auVar260._4_4_ = auVar82._4_4_ + auVar83._4_4_ + auVar18._4_4_ + auVar84._4_4_;
  auVar260._8_4_ = auVar82._8_4_ + auVar83._8_4_ + auVar18._8_4_ + auVar84._8_4_;
  auVar260._12_4_ = auVar82._12_4_ + auVar83._12_4_ + auVar18._12_4_ + auVar84._12_4_;
  auVar24._8_4_ = 0x3e800000;
  auVar24._0_8_ = 0x3e8000003e800000;
  auVar24._12_4_ = 0x3e800000;
  auVar80 = vmulps_avx512vl(auVar260,auVar24);
  auVar80 = vsubps_avx(auVar80,auVar79);
  auVar80 = vdpps_avx(auVar80,local_7f0,0x7f);
  fVar173 = *(float *)(ray + k * 4 + 0x60);
  auVar286 = ZEXT464((uint)fVar173);
  local_800 = vdpps_avx(local_7f0,local_7f0,0x7f);
  auVar288 = ZEXT1664(local_800);
  auVar85 = ZEXT816(0) << 0x40;
  auVar280 = ZEXT1664(auVar85);
  auVar267._4_12_ = ZEXT812(0) << 0x20;
  auVar267._0_4_ = local_800._0_4_;
  auVar81 = vrcp14ss_avx512f(auVar85,auVar267);
  auVar89 = vfnmadd213ss_fma(auVar81,local_800,ZEXT416(0x40000000));
  local_2e0 = auVar80._0_4_ * auVar81._0_4_ * auVar89._0_4_;
  auVar263 = ZEXT464((uint)local_2e0);
  auVar268._4_4_ = local_2e0;
  auVar268._0_4_ = local_2e0;
  auVar268._8_4_ = local_2e0;
  auVar268._12_4_ = local_2e0;
  fStack_7d0 = local_2e0;
  _local_7e0 = auVar268;
  fStack_7cc = local_2e0;
  fStack_7c8 = local_2e0;
  fStack_7c4 = local_2e0;
  auVar80 = vfmadd231ps_fma(auVar79,local_7f0,auVar268);
  auVar80 = vblendps_avx(auVar80,auVar85,8);
  auVar79 = vsubps_avx(auVar82,auVar80);
  auVar82 = vsubps_avx(auVar18,auVar80);
  auVar83 = vsubps_avx(auVar83,auVar80);
  auVar80 = vsubps_avx(auVar84,auVar80);
  auVar275 = ZEXT1664(auVar80);
  auVar93 = vbroadcastss_avx512vl(auVar79);
  auVar101._8_4_ = 1;
  auVar101._0_8_ = 0x100000001;
  auVar101._12_4_ = 1;
  auVar101._16_4_ = 1;
  auVar101._20_4_ = 1;
  auVar101._24_4_ = 1;
  auVar101._28_4_ = 1;
  local_760 = ZEXT1632(auVar79);
  auVar94 = vpermps_avx512vl(auVar101,local_760);
  auVar102._8_4_ = 2;
  auVar102._0_8_ = 0x200000002;
  auVar102._12_4_ = 2;
  auVar102._16_4_ = 2;
  auVar102._20_4_ = 2;
  auVar102._24_4_ = 2;
  auVar102._28_4_ = 2;
  auVar95 = vpermps_avx512vl(auVar102,local_760);
  auVar105._8_4_ = 3;
  auVar105._0_8_ = 0x300000003;
  auVar105._12_4_ = 3;
  auVar105._16_4_ = 3;
  auVar105._20_4_ = 3;
  auVar105._24_4_ = 3;
  auVar105._28_4_ = 3;
  auVar96 = vpermps_avx512vl(auVar105,local_760);
  local_8c0 = vbroadcastss_avx512vl(auVar83);
  auVar297 = ZEXT3264(local_8c0);
  local_7a0 = ZEXT1632(auVar83);
  auVar97 = vpermps_avx512vl(auVar101,local_7a0);
  local_8e0 = vpermps_avx512vl(auVar102,local_7a0);
  auVar298 = ZEXT3264(local_8e0);
  auVar98 = vpermps_avx512vl(auVar105,local_7a0);
  auVar99 = vbroadcastss_avx512vl(auVar82);
  local_780 = ZEXT1632(auVar82);
  local_900 = vpermps_avx512vl(auVar101,local_780);
  auVar299 = ZEXT3264(local_900);
  local_920 = vpermps_avx512vl(auVar102,local_780);
  auVar300 = ZEXT3264(local_920);
  auVar100 = vpermps_avx512vl(auVar105,local_780);
  local_260 = vbroadcastss_avx512vl(auVar80);
  _local_7c0 = ZEXT1632(auVar80);
  local_280 = vpermps_avx2(auVar101,_local_7c0);
  local_240 = vpermps_avx512vl(auVar102,_local_7c0);
  local_2c0 = vpermps_avx2(auVar105,_local_7c0);
  auVar80 = vfmadd231ps_fma(ZEXT432((uint)(fVar276 * fVar276)),local_5a0,local_5a0);
  auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),_local_580,_local_580);
  local_220._0_4_ = auVar80._0_4_;
  local_220._4_4_ = local_220._0_4_;
  local_220._8_4_ = local_220._0_4_;
  local_220._12_4_ = local_220._0_4_;
  local_220._16_4_ = local_220._0_4_;
  local_220._20_4_ = local_220._0_4_;
  local_220._24_4_ = local_220._0_4_;
  local_220._28_4_ = local_220._0_4_;
  auVar104._8_4_ = 0x7fffffff;
  auVar104._0_8_ = 0x7fffffff7fffffff;
  auVar104._12_4_ = 0x7fffffff;
  auVar104._16_4_ = 0x7fffffff;
  auVar104._20_4_ = 0x7fffffff;
  auVar104._24_4_ = 0x7fffffff;
  auVar104._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_220,auVar104);
  local_6f0 = ZEXT416((uint)local_2e0);
  local_2e0 = fVar173 - local_2e0;
  fStack_2dc = local_2e0;
  fStack_2d8 = local_2e0;
  fStack_2d4 = local_2e0;
  fStack_2d0 = local_2e0;
  fStack_2cc = local_2e0;
  fStack_2c8 = local_2e0;
  fStack_2c4 = local_2e0;
  local_4a0 = vpbroadcastd_avx512vl();
  uVar66 = 0;
  iVar69 = 1;
  local_4c0 = vpbroadcastd_avx512vl();
  auVar80 = vsqrtss_avx(local_800,local_800);
  auVar79 = vsqrtss_avx(local_800,local_800);
  auVar199 = ZEXT1664(ZEXT816(0x3f80000000000000));
  local_2a0 = local_240;
  do {
    local_510 = auVar199._0_16_;
    auVar82 = vmovshdup_avx(local_510);
    auVar82 = vsubps_avx(auVar82,local_510);
    auVar164._0_4_ = auVar82._0_4_;
    fVar256 = auVar164._0_4_ * 0.04761905;
    uVar180 = auVar199._0_4_;
    local_860._4_4_ = uVar180;
    local_860._0_4_ = uVar180;
    local_860._8_4_ = uVar180;
    local_860._12_4_ = uVar180;
    local_860._16_4_ = uVar180;
    local_860._20_4_ = uVar180;
    local_860._24_4_ = uVar180;
    local_860._28_4_ = uVar180;
    auVar164._4_4_ = auVar164._0_4_;
    auVar164._8_4_ = auVar164._0_4_;
    auVar164._12_4_ = auVar164._0_4_;
    auVar164._16_4_ = auVar164._0_4_;
    auVar164._20_4_ = auVar164._0_4_;
    auVar164._24_4_ = auVar164._0_4_;
    auVar164._28_4_ = auVar164._0_4_;
    auVar82 = vfmadd231ps_fma(local_860,auVar164,_DAT_01faff20);
    auVar101 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar102 = vsubps_avx512vl(auVar101,ZEXT1632(auVar82));
    fVar276 = auVar102._0_4_;
    fVar282 = auVar102._4_4_;
    fVar241 = auVar102._8_4_;
    fVar243 = auVar102._12_4_;
    fVar245 = auVar102._16_4_;
    fVar254 = auVar102._20_4_;
    fVar255 = auVar102._24_4_;
    fVar152 = fVar276 * fVar276 * fVar276;
    fVar174 = fVar282 * fVar282 * fVar282;
    auVar106._4_4_ = fVar174;
    auVar106._0_4_ = fVar152;
    fVar175 = fVar241 * fVar241 * fVar241;
    auVar106._8_4_ = fVar175;
    fVar176 = fVar243 * fVar243 * fVar243;
    auVar106._12_4_ = fVar176;
    fVar177 = fVar245 * fVar245 * fVar245;
    auVar106._16_4_ = fVar177;
    fVar178 = fVar254 * fVar254 * fVar254;
    auVar106._20_4_ = fVar178;
    fVar179 = fVar255 * fVar255 * fVar255;
    auVar106._24_4_ = fVar179;
    auVar106._28_4_ = auVar164._0_4_;
    auVar103 = vbroadcastss_avx512vl(ZEXT416(0x40800000));
    auVar104 = vmulps_avx512vl(auVar106,auVar103);
    fVar281 = auVar82._0_4_;
    fVar283 = auVar82._4_4_;
    fVar242 = auVar82._8_4_;
    fVar244 = auVar82._12_4_;
    fVar200 = fVar281 * fVar281 * fVar281;
    fVar221 = fVar283 * fVar283 * fVar283;
    fVar222 = fVar242 * fVar242 * fVar242;
    fVar223 = fVar244 * fVar244 * fVar244;
    auVar126._28_4_ = DAT_01faff20._28_4_;
    auVar126._0_28_ = ZEXT1628(CONCAT412(fVar223,CONCAT48(fVar222,CONCAT44(fVar221,fVar200))));
    auVar199._0_4_ = fVar281 * fVar276;
    auVar199._4_4_ = fVar283 * fVar282;
    auVar199._8_4_ = fVar242 * fVar241;
    auVar199._12_4_ = fVar244 * fVar243;
    auVar199._16_4_ = fVar245 * 0.0;
    auVar199._20_4_ = fVar254 * 0.0;
    auVar199._28_36_ = auVar285._28_36_;
    auVar199._24_4_ = fVar255 * 0.0;
    auVar105 = vmulps_avx512vl(auVar126,auVar103);
    fVar287 = auVar105._28_4_ + auVar164._0_4_;
    fVar264 = fVar287 + auVar288._28_4_ + auVar263._28_4_;
    auVar111._4_4_ = fVar174 * 0.16666667;
    auVar111._0_4_ = fVar152 * 0.16666667;
    auVar111._8_4_ = fVar175 * 0.16666667;
    auVar111._12_4_ = fVar176 * 0.16666667;
    auVar111._16_4_ = fVar177 * 0.16666667;
    auVar111._20_4_ = fVar178 * 0.16666667;
    auVar111._24_4_ = fVar179 * 0.16666667;
    auVar111._28_4_ = fVar287;
    auVar108._4_4_ =
         (auVar199._4_4_ * fVar282 * 12.0 + auVar199._4_4_ * fVar283 * 6.0 +
         fVar221 + auVar104._4_4_) * 0.16666667;
    auVar108._0_4_ =
         (auVar199._0_4_ * fVar276 * 12.0 + auVar199._0_4_ * fVar281 * 6.0 +
         fVar200 + auVar104._0_4_) * 0.16666667;
    auVar108._8_4_ =
         (auVar199._8_4_ * fVar241 * 12.0 + auVar199._8_4_ * fVar242 * 6.0 +
         fVar222 + auVar104._8_4_) * 0.16666667;
    auVar108._12_4_ =
         (auVar199._12_4_ * fVar243 * 12.0 + auVar199._12_4_ * fVar244 * 6.0 +
         fVar223 + auVar104._12_4_) * 0.16666667;
    auVar108._16_4_ =
         (auVar199._16_4_ * fVar245 * 12.0 + auVar199._16_4_ * 0.0 * 6.0 + auVar104._16_4_ + 0.0) *
         0.16666667;
    auVar108._20_4_ =
         (auVar199._20_4_ * fVar254 * 12.0 + auVar199._20_4_ * 0.0 * 6.0 + auVar104._20_4_ + 0.0) *
         0.16666667;
    auVar108._24_4_ =
         (auVar199._24_4_ * fVar255 * 12.0 + auVar199._24_4_ * 0.0 * 6.0 + auVar104._24_4_ + 0.0) *
         0.16666667;
    auVar108._28_4_ = auVar288._28_4_;
    auVar109._4_4_ =
         (auVar105._4_4_ + fVar174 +
         auVar199._4_4_ * fVar283 * 12.0 + auVar199._4_4_ * fVar282 * 6.0) * 0.16666667;
    auVar109._0_4_ =
         (auVar105._0_4_ + fVar152 +
         auVar199._0_4_ * fVar281 * 12.0 + auVar199._0_4_ * fVar276 * 6.0) * 0.16666667;
    auVar109._8_4_ =
         (auVar105._8_4_ + fVar175 +
         auVar199._8_4_ * fVar242 * 12.0 + auVar199._8_4_ * fVar241 * 6.0) * 0.16666667;
    auVar109._12_4_ =
         (auVar105._12_4_ + fVar176 +
         auVar199._12_4_ * fVar244 * 12.0 + auVar199._12_4_ * fVar243 * 6.0) * 0.16666667;
    auVar109._16_4_ =
         (auVar105._16_4_ + fVar177 + auVar199._16_4_ * 0.0 * 12.0 + auVar199._16_4_ * fVar245 * 6.0
         ) * 0.16666667;
    auVar109._20_4_ =
         (auVar105._20_4_ + fVar178 + auVar199._20_4_ * 0.0 * 12.0 + auVar199._20_4_ * fVar254 * 6.0
         ) * 0.16666667;
    auVar109._24_4_ =
         (auVar105._24_4_ + fVar179 + auVar199._24_4_ * 0.0 * 12.0 + auVar199._24_4_ * fVar255 * 6.0
         ) * 0.16666667;
    auVar109._28_4_ = auVar293._28_4_;
    fVar200 = fVar200 * 0.16666667;
    fVar221 = fVar221 * 0.16666667;
    fVar222 = fVar222 * 0.16666667;
    fVar223 = fVar223 * 0.16666667;
    auVar110._28_4_ = fVar264;
    auVar110._0_28_ = ZEXT1628(CONCAT412(fVar223,CONCAT48(fVar222,CONCAT44(fVar221,fVar200))));
    auVar105 = vmulps_avx512vl(local_260,auVar110);
    auVar113._4_4_ = local_280._4_4_ * fVar221;
    auVar113._0_4_ = local_280._0_4_ * fVar200;
    auVar113._8_4_ = local_280._8_4_ * fVar222;
    auVar113._12_4_ = local_280._12_4_ * fVar223;
    auVar113._16_4_ = local_280._16_4_ * 0.0;
    auVar113._20_4_ = local_280._20_4_ * 0.0;
    auVar113._24_4_ = local_280._24_4_ * 0.0;
    auVar113._28_4_ = auVar286._28_4_ + auVar293._28_4_ + DAT_01faff20._28_4_ + auVar104._28_4_;
    auVar104 = vmulps_avx512vl(local_2a0,auVar110);
    auVar114._4_4_ = local_2c0._4_4_ * fVar221;
    auVar114._0_4_ = local_2c0._0_4_ * fVar200;
    auVar114._8_4_ = local_2c0._8_4_ * fVar222;
    auVar114._12_4_ = local_2c0._12_4_ * fVar223;
    auVar114._16_4_ = local_2c0._16_4_ * 0.0;
    auVar114._20_4_ = local_2c0._20_4_ * 0.0;
    auVar114._24_4_ = local_2c0._24_4_ * 0.0;
    auVar114._28_4_ = fVar264;
    auVar105 = vfmadd231ps_avx512vl(auVar105,auVar109,auVar99);
    auVar106 = vfmadd231ps_avx512vl(auVar113,auVar109,auVar299._0_32_);
    auVar104 = vfmadd231ps_avx512vl(auVar104,auVar109,auVar300._0_32_);
    auVar107 = vfmadd231ps_avx512vl(auVar114,auVar100,auVar109);
    auVar105 = vfmadd231ps_avx512vl(auVar105,auVar108,auVar297._0_32_);
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar108,auVar97);
    auVar104 = vfmadd231ps_avx512vl(auVar104,auVar108,auVar298._0_32_);
    auVar107 = vfmadd231ps_avx512vl(auVar107,auVar98,auVar108);
    auVar108 = vfmadd231ps_avx512vl(auVar105,auVar111,auVar93);
    auVar109 = vfmadd231ps_avx512vl(auVar106,auVar111,auVar94);
    auVar110 = vfmadd231ps_avx512vl(auVar104,auVar111,auVar95);
    auVar105 = vfmadd231ps_avx512vl(auVar107,auVar96,auVar111);
    auVar111 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar106 = vxorps_avx512vl(auVar102,auVar111);
    auVar107 = vxorps_avx512vl(ZEXT1632(auVar82),auVar111);
    auVar127._0_4_ = auVar107._0_4_ * fVar281;
    auVar127._4_4_ = auVar107._4_4_ * fVar283;
    auVar127._8_4_ = auVar107._8_4_ * fVar242;
    auVar127._12_4_ = auVar107._12_4_ * fVar244;
    auVar127._16_4_ = auVar107._16_4_ * 0.0;
    auVar127._20_4_ = auVar107._20_4_ * 0.0;
    auVar127._24_4_ = auVar107._24_4_ * 0.0;
    auVar127._28_4_ = 0;
    auVar112 = vmulps_avx512vl(auVar199._0_32_,auVar103);
    auVar104 = vsubps_avx(auVar127,auVar112);
    auVar115._4_4_ = auVar106._4_4_ * fVar282 * 0.5;
    auVar115._0_4_ = auVar106._0_4_ * fVar276 * 0.5;
    auVar115._8_4_ = auVar106._8_4_ * fVar241 * 0.5;
    auVar115._12_4_ = auVar106._12_4_ * fVar243 * 0.5;
    auVar115._16_4_ = auVar106._16_4_ * fVar245 * 0.5;
    auVar115._20_4_ = auVar106._20_4_ * fVar254 * 0.5;
    auVar115._24_4_ = auVar106._24_4_ * fVar255 * 0.5;
    auVar115._28_4_ = auVar102._28_4_;
    auVar116._4_4_ = auVar104._4_4_ * 0.5;
    auVar116._0_4_ = auVar104._0_4_ * 0.5;
    auVar116._8_4_ = auVar104._8_4_ * 0.5;
    auVar116._12_4_ = auVar104._12_4_ * 0.5;
    auVar116._16_4_ = auVar104._16_4_ * 0.5;
    auVar116._20_4_ = auVar104._20_4_ * 0.5;
    auVar116._24_4_ = auVar104._24_4_ * 0.5;
    auVar116._28_4_ = auVar104._28_4_;
    auVar117._4_4_ = (auVar112._4_4_ + fVar282 * fVar282) * 0.5;
    auVar117._0_4_ = (auVar112._0_4_ + fVar276 * fVar276) * 0.5;
    auVar117._8_4_ = (auVar112._8_4_ + fVar241 * fVar241) * 0.5;
    auVar117._12_4_ = (auVar112._12_4_ + fVar243 * fVar243) * 0.5;
    auVar117._16_4_ = (auVar112._16_4_ + fVar245 * fVar245) * 0.5;
    auVar117._20_4_ = (auVar112._20_4_ + fVar254 * fVar254) * 0.5;
    auVar117._24_4_ = (auVar112._24_4_ + fVar255 * fVar255) * 0.5;
    auVar117._28_4_ = auVar112._28_4_ + auVar275._28_4_;
    fVar276 = fVar281 * fVar281 * 0.5;
    fVar281 = fVar283 * fVar283 * 0.5;
    fVar282 = fVar242 * fVar242 * 0.5;
    fVar283 = fVar244 * fVar244 * 0.5;
    auVar118._28_4_ = auVar280._28_4_;
    auVar118._0_28_ = ZEXT1628(CONCAT412(fVar283,CONCAT48(fVar282,CONCAT44(fVar281,fVar276))));
    auVar104 = vmulps_avx512vl(local_260,auVar118);
    auVar122._4_4_ = local_280._4_4_ * fVar281;
    auVar122._0_4_ = local_280._0_4_ * fVar276;
    auVar122._8_4_ = local_280._8_4_ * fVar282;
    auVar122._12_4_ = local_280._12_4_ * fVar283;
    auVar122._16_4_ = local_280._16_4_ * 0.0;
    auVar122._20_4_ = local_280._20_4_ * 0.0;
    auVar122._24_4_ = local_280._24_4_ * 0.0;
    auVar122._28_4_ = auVar107._28_4_;
    auVar102 = vmulps_avx512vl(local_2a0,auVar118);
    auVar123._4_4_ = fVar281 * local_2c0._4_4_;
    auVar123._0_4_ = fVar276 * local_2c0._0_4_;
    auVar123._8_4_ = fVar282 * local_2c0._8_4_;
    auVar123._12_4_ = fVar283 * local_2c0._12_4_;
    auVar123._16_4_ = local_2c0._16_4_ * 0.0;
    auVar123._20_4_ = local_2c0._20_4_ * 0.0;
    auVar123._24_4_ = local_2c0._24_4_ * 0.0;
    auVar123._28_4_ = auVar280._28_4_;
    auVar104 = vfmadd231ps_avx512vl(auVar104,auVar117,auVar99);
    auVar106 = vfmadd231ps_avx512vl(auVar122,auVar117,auVar299._0_32_);
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar117,auVar300._0_32_);
    auVar82 = vfmadd231ps_fma(auVar123,auVar100,auVar117);
    auVar104 = vfmadd231ps_avx512vl(auVar104,auVar116,auVar297._0_32_);
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar116,auVar97);
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar116,auVar298._0_32_);
    auVar107 = vfmadd231ps_avx512vl(ZEXT1632(auVar82),auVar98,auVar116);
    auVar104 = vfmadd231ps_avx512vl(auVar104,auVar115,auVar93);
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar115,auVar94);
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar115,auVar95);
    auVar107 = vfmadd231ps_avx512vl(auVar107,auVar96,auVar115);
    auVar130._4_4_ = auVar104._4_4_ * fVar256;
    auVar130._0_4_ = auVar104._0_4_ * fVar256;
    auVar130._8_4_ = auVar104._8_4_ * fVar256;
    auVar130._12_4_ = auVar104._12_4_ * fVar256;
    auVar130._16_4_ = auVar104._16_4_ * fVar256;
    auVar130._20_4_ = auVar104._20_4_ * fVar256;
    auVar130._24_4_ = auVar104._24_4_ * fVar256;
    auVar130._28_4_ = auVar100._28_4_;
    auVar293 = ZEXT3264(auVar130);
    auVar131._4_4_ = auVar106._4_4_ * fVar256;
    auVar131._0_4_ = auVar106._0_4_ * fVar256;
    auVar131._8_4_ = auVar106._8_4_ * fVar256;
    auVar131._12_4_ = auVar106._12_4_ * fVar256;
    auVar131._16_4_ = auVar106._16_4_ * fVar256;
    auVar131._20_4_ = auVar106._20_4_ * fVar256;
    auVar131._24_4_ = auVar106._24_4_ * fVar256;
    auVar131._28_4_ = 0x3e2aaaab;
    auVar132._4_4_ = auVar102._4_4_ * fVar256;
    auVar132._0_4_ = auVar102._0_4_ * fVar256;
    auVar132._8_4_ = auVar102._8_4_ * fVar256;
    auVar132._12_4_ = auVar102._12_4_ * fVar256;
    auVar132._16_4_ = auVar102._16_4_ * fVar256;
    auVar132._20_4_ = auVar102._20_4_ * fVar256;
    auVar132._24_4_ = auVar102._24_4_ * fVar256;
    auVar132._28_4_ = 0x40c00000;
    fVar276 = auVar107._0_4_ * fVar256;
    fVar281 = auVar107._4_4_ * fVar256;
    auVar124._4_4_ = fVar281;
    auVar124._0_4_ = fVar276;
    fVar282 = auVar107._8_4_ * fVar256;
    auVar124._8_4_ = fVar282;
    fVar283 = auVar107._12_4_ * fVar256;
    auVar124._12_4_ = fVar283;
    fVar241 = auVar107._16_4_ * fVar256;
    auVar124._16_4_ = fVar241;
    fVar242 = auVar107._20_4_ * fVar256;
    auVar124._20_4_ = fVar242;
    fVar243 = auVar107._24_4_ * fVar256;
    auVar124._24_4_ = fVar243;
    auVar124._28_4_ = fVar256;
    auVar82 = vxorps_avx512vl(auVar101._0_16_,auVar101._0_16_);
    auVar113 = vpermt2ps_avx512vl(auVar108,_DAT_01feed00,ZEXT1632(auVar82));
    auVar285 = ZEXT3264(auVar113);
    auVar114 = vpermt2ps_avx512vl(auVar109,_DAT_01feed00,ZEXT1632(auVar82));
    auVar286 = ZEXT3264(auVar114);
    auVar102 = ZEXT1632(auVar82);
    auVar115 = vpermt2ps_avx512vl(auVar110,_DAT_01feed00,auVar102);
    auVar288 = ZEXT3264(auVar115);
    auVar251._0_4_ = fVar276 + auVar105._0_4_;
    auVar251._4_4_ = fVar281 + auVar105._4_4_;
    auVar251._8_4_ = fVar282 + auVar105._8_4_;
    auVar251._12_4_ = fVar283 + auVar105._12_4_;
    auVar251._16_4_ = fVar241 + auVar105._16_4_;
    auVar251._20_4_ = fVar242 + auVar105._20_4_;
    auVar251._24_4_ = fVar243 + auVar105._24_4_;
    auVar251._28_4_ = fVar256 + auVar105._28_4_;
    auVar104 = vmaxps_avx(auVar105,auVar251);
    auVar101 = vminps_avx(auVar105,auVar251);
    auVar112 = vpermt2ps_avx512vl(auVar105,_DAT_01feed00,auVar102);
    auVar116 = vpermt2ps_avx512vl(auVar130,_DAT_01feed00,auVar102);
    auVar280 = ZEXT3264(auVar116);
    auVar117 = vpermt2ps_avx512vl(auVar131,_DAT_01feed00,auVar102);
    auVar251 = ZEXT1632(auVar82);
    auVar118 = vpermt2ps_avx512vl(auVar132,_DAT_01feed00,auVar251);
    auVar102 = vpermt2ps_avx512vl(auVar124,_DAT_01feed00,auVar251);
    auVar119 = vsubps_avx512vl(auVar112,auVar102);
    auVar102 = vsubps_avx(auVar113,auVar108);
    auVar275 = ZEXT3264(auVar102);
    auVar105 = vsubps_avx(auVar114,auVar109);
    auVar106 = vsubps_avx(auVar115,auVar110);
    auVar263 = ZEXT3264(auVar106);
    auVar107 = vmulps_avx512vl(auVar105,auVar132);
    auVar107 = vfmsub231ps_avx512vl(auVar107,auVar131,auVar106);
    auVar120 = vmulps_avx512vl(auVar106,auVar130);
    auVar120 = vfmsub231ps_avx512vl(auVar120,auVar132,auVar102);
    auVar121 = vmulps_avx512vl(auVar102,auVar131);
    auVar121 = vfmsub231ps_avx512vl(auVar121,auVar130,auVar105);
    auVar121 = vmulps_avx512vl(auVar121,auVar121);
    auVar120 = vfmadd231ps_avx512vl(auVar121,auVar120,auVar120);
    auVar120 = vfmadd231ps_avx512vl(auVar120,auVar107,auVar107);
    auVar107 = vmulps_avx512vl(auVar106,auVar106);
    auVar107 = vfmadd231ps_avx512vl(auVar107,auVar105,auVar105);
    auVar121 = vfmadd231ps_avx512vl(auVar107,auVar102,auVar102);
    auVar122 = vrcp14ps_avx512vl(auVar121);
    auVar107._8_4_ = 0x3f800000;
    auVar107._0_8_ = 0x3f8000003f800000;
    auVar107._12_4_ = 0x3f800000;
    auVar107._16_4_ = 0x3f800000;
    auVar107._20_4_ = 0x3f800000;
    auVar107._24_4_ = 0x3f800000;
    auVar107._28_4_ = 0x3f800000;
    auVar107 = vfnmadd213ps_avx512vl(auVar122,auVar121,auVar107);
    auVar107 = vfmadd132ps_avx512vl(auVar107,auVar122,auVar122);
    auVar120 = vmulps_avx512vl(auVar120,auVar107);
    auVar122 = vmulps_avx512vl(auVar105,auVar118);
    auVar122 = vfmsub231ps_avx512vl(auVar122,auVar117,auVar106);
    auVar123 = vmulps_avx512vl(auVar106,auVar116);
    auVar123 = vfmsub231ps_avx512vl(auVar123,auVar118,auVar102);
    auVar124 = vmulps_avx512vl(auVar102,auVar117);
    auVar124 = vfmsub231ps_avx512vl(auVar124,auVar116,auVar105);
    auVar124 = vmulps_avx512vl(auVar124,auVar124);
    auVar123 = vfmadd231ps_avx512vl(auVar124,auVar123,auVar123);
    auVar122 = vfmadd231ps_avx512vl(auVar123,auVar122,auVar122);
    auVar107 = vmulps_avx512vl(auVar122,auVar107);
    auVar107 = vmaxps_avx512vl(auVar120,auVar107);
    auVar107 = vsqrtps_avx512vl(auVar107);
    auVar120 = vmaxps_avx512vl(auVar119,auVar112);
    auVar104 = vmaxps_avx512vl(auVar104,auVar120);
    auVar122 = vaddps_avx512vl(auVar107,auVar104);
    auVar104 = vminps_avx512vl(auVar119,auVar112);
    auVar104 = vminps_avx(auVar101,auVar104);
    auVar104 = vsubps_avx512vl(auVar104,auVar107);
    auVar112._8_4_ = 0x3f800002;
    auVar112._0_8_ = 0x3f8000023f800002;
    auVar112._12_4_ = 0x3f800002;
    auVar112._16_4_ = 0x3f800002;
    auVar112._20_4_ = 0x3f800002;
    auVar112._24_4_ = 0x3f800002;
    auVar112._28_4_ = 0x3f800002;
    auVar101 = vmulps_avx512vl(auVar122,auVar112);
    auVar119._8_4_ = 0x3f7ffffc;
    auVar119._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar119._12_4_ = 0x3f7ffffc;
    auVar119._16_4_ = 0x3f7ffffc;
    auVar119._20_4_ = 0x3f7ffffc;
    auVar119._24_4_ = 0x3f7ffffc;
    auVar119._28_4_ = 0x3f7ffffc;
    auVar104 = vmulps_avx512vl(auVar104,auVar119);
    auVar101 = vmulps_avx512vl(auVar101,auVar101);
    auVar107 = vrsqrt14ps_avx512vl(auVar121);
    auVar120._8_4_ = 0xbf000000;
    auVar120._0_8_ = 0xbf000000bf000000;
    auVar120._12_4_ = 0xbf000000;
    auVar120._16_4_ = 0xbf000000;
    auVar120._20_4_ = 0xbf000000;
    auVar120._24_4_ = 0xbf000000;
    auVar120._28_4_ = 0xbf000000;
    auVar112 = vmulps_avx512vl(auVar121,auVar120);
    fVar276 = auVar107._0_4_;
    fVar281 = auVar107._4_4_;
    fVar282 = auVar107._8_4_;
    fVar283 = auVar107._12_4_;
    fVar241 = auVar107._16_4_;
    fVar242 = auVar107._20_4_;
    fVar243 = auVar107._24_4_;
    auVar125._4_4_ = fVar281 * fVar281 * fVar281 * auVar112._4_4_;
    auVar125._0_4_ = fVar276 * fVar276 * fVar276 * auVar112._0_4_;
    auVar125._8_4_ = fVar282 * fVar282 * fVar282 * auVar112._8_4_;
    auVar125._12_4_ = fVar283 * fVar283 * fVar283 * auVar112._12_4_;
    auVar125._16_4_ = fVar241 * fVar241 * fVar241 * auVar112._16_4_;
    auVar125._20_4_ = fVar242 * fVar242 * fVar242 * auVar112._20_4_;
    auVar125._24_4_ = fVar243 * fVar243 * fVar243 * auVar112._24_4_;
    auVar125._28_4_ = auVar122._28_4_;
    auVar121._8_4_ = 0x3fc00000;
    auVar121._0_8_ = 0x3fc000003fc00000;
    auVar121._12_4_ = 0x3fc00000;
    auVar121._16_4_ = 0x3fc00000;
    auVar121._20_4_ = 0x3fc00000;
    auVar121._24_4_ = 0x3fc00000;
    auVar121._28_4_ = 0x3fc00000;
    auVar107 = vfmadd231ps_avx512vl(auVar125,auVar107,auVar121);
    auVar112 = vmulps_avx512vl(auVar102,auVar107);
    auVar119 = vmulps_avx512vl(auVar105,auVar107);
    auVar120 = vmulps_avx512vl(auVar106,auVar107);
    auVar121 = vsubps_avx512vl(auVar251,auVar108);
    auVar122 = vsubps_avx512vl(auVar251,auVar109);
    auVar123 = vsubps_avx512vl(auVar251,auVar110);
    auVar124 = vmulps_avx512vl(local_5c0,auVar123);
    auVar124 = vfmadd231ps_avx512vl(auVar124,local_5a0,auVar122);
    auVar124 = vfmadd231ps_avx512vl(auVar124,_local_580,auVar121);
    auVar125 = vmulps_avx512vl(auVar123,auVar123);
    auVar125 = vfmadd231ps_avx512vl(auVar125,auVar122,auVar122);
    auVar125 = vfmadd231ps_avx512vl(auVar125,auVar121,auVar121);
    auVar126 = vmulps_avx512vl(local_5c0,auVar120);
    auVar126 = vfmadd231ps_avx512vl(auVar126,auVar119,local_5a0);
    auVar126 = vfmadd231ps_avx512vl(auVar126,auVar112,_local_580);
    auVar120 = vmulps_avx512vl(auVar123,auVar120);
    auVar119 = vfmadd231ps_avx512vl(auVar120,auVar122,auVar119);
    auVar112 = vfmadd231ps_avx512vl(auVar119,auVar121,auVar112);
    auVar119 = vmulps_avx512vl(auVar126,auVar126);
    auVar120 = vsubps_avx512vl(local_220,auVar119);
    auVar127 = vmulps_avx512vl(auVar126,auVar112);
    auVar124 = vsubps_avx512vl(auVar124,auVar127);
    auVar124 = vaddps_avx512vl(auVar124,auVar124);
    auVar127 = vmulps_avx512vl(auVar112,auVar112);
    local_820 = vsubps_avx512vl(auVar125,auVar127);
    auVar101 = vsubps_avx512vl(local_820,auVar101);
    local_740 = vmulps_avx512vl(auVar124,auVar124);
    _local_880 = vmulps_avx512vl(auVar120,auVar103);
    auVar125 = vmulps_avx512vl(_local_880,auVar101);
    auVar125 = vsubps_avx512vl(local_740,auVar125);
    auVar82 = vxorps_avx512vl(auVar103._0_16_,auVar103._0_16_);
    uVar73 = vcmpps_avx512vl(auVar125,auVar251,5);
    bVar62 = (byte)uVar73;
    fVar276 = (float)local_7e0._0_4_;
    fVar281 = (float)local_7e0._4_4_;
    fVar282 = fStack_7d8;
    fVar283 = fStack_7d4;
    fVar241 = fStack_7d0;
    fVar242 = fStack_7cc;
    fVar243 = fStack_7c8;
    fVar244 = fStack_7c4;
    if (bVar62 == 0) {
LAB_01ba50c7:
      auVar297 = ZEXT3264(local_8c0);
      auVar298 = ZEXT3264(local_8e0);
      auVar299 = ZEXT3264(local_900);
      auVar300 = ZEXT3264(local_920);
    }
    else {
      auVar125 = vsqrtps_avx512vl(auVar125);
      auVar127 = vaddps_avx512vl(auVar120,auVar120);
      _local_600 = vrcp14ps_avx512vl(auVar127);
      auVar103._8_4_ = 0x3f800000;
      auVar103._0_8_ = 0x3f8000003f800000;
      auVar103._12_4_ = 0x3f800000;
      auVar103._16_4_ = 0x3f800000;
      auVar103._20_4_ = 0x3f800000;
      auVar103._24_4_ = 0x3f800000;
      auVar103._28_4_ = 0x3f800000;
      auVar103 = vfnmadd213ps_avx512vl(_local_600,auVar127,auVar103);
      auVar103 = vfmadd132ps_avx512vl(auVar103,_local_600,_local_600);
      local_620 = vxorps_avx512vl(auVar124,auVar111);
      auVar111 = vsubps_avx512vl(local_620,auVar125);
      local_8a0 = vmulps_avx512vl(auVar111,auVar103);
      auVar111 = vsubps_avx512vl(auVar125,auVar124);
      local_5e0 = vmulps_avx512vl(auVar111,auVar103);
      auVar111 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar125 = vblendmps_avx512vl(auVar111,local_8a0);
      auVar128._0_4_ =
           (uint)(bVar62 & 1) * auVar125._0_4_ | (uint)!(bool)(bVar62 & 1) * auVar111._0_4_;
      bVar10 = (bool)((byte)(uVar73 >> 1) & 1);
      auVar128._4_4_ = (uint)bVar10 * auVar125._4_4_ | (uint)!bVar10 * auVar111._4_4_;
      bVar10 = (bool)((byte)(uVar73 >> 2) & 1);
      auVar128._8_4_ = (uint)bVar10 * auVar125._8_4_ | (uint)!bVar10 * auVar111._8_4_;
      bVar10 = (bool)((byte)(uVar73 >> 3) & 1);
      auVar128._12_4_ = (uint)bVar10 * auVar125._12_4_ | (uint)!bVar10 * auVar111._12_4_;
      bVar10 = (bool)((byte)(uVar73 >> 4) & 1);
      auVar128._16_4_ = (uint)bVar10 * auVar125._16_4_ | (uint)!bVar10 * auVar111._16_4_;
      bVar10 = (bool)((byte)(uVar73 >> 5) & 1);
      auVar128._20_4_ = (uint)bVar10 * auVar125._20_4_ | (uint)!bVar10 * auVar111._20_4_;
      bVar10 = (bool)((byte)(uVar73 >> 6) & 1);
      auVar128._24_4_ = (uint)bVar10 * auVar125._24_4_ | (uint)!bVar10 * auVar111._24_4_;
      bVar10 = SUB81(uVar73 >> 7,0);
      auVar128._28_4_ = (uint)bVar10 * auVar125._28_4_ | (uint)!bVar10 * auVar111._28_4_;
      auVar111 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar125 = vblendmps_avx512vl(auVar111,local_5e0);
      auVar129._0_4_ =
           (uint)(bVar62 & 1) * auVar125._0_4_ | (uint)!(bool)(bVar62 & 1) * auVar111._0_4_;
      bVar10 = (bool)((byte)(uVar73 >> 1) & 1);
      auVar129._4_4_ = (uint)bVar10 * auVar125._4_4_ | (uint)!bVar10 * auVar111._4_4_;
      bVar10 = (bool)((byte)(uVar73 >> 2) & 1);
      auVar129._8_4_ = (uint)bVar10 * auVar125._8_4_ | (uint)!bVar10 * auVar111._8_4_;
      bVar10 = (bool)((byte)(uVar73 >> 3) & 1);
      auVar129._12_4_ = (uint)bVar10 * auVar125._12_4_ | (uint)!bVar10 * auVar111._12_4_;
      bVar10 = (bool)((byte)(uVar73 >> 4) & 1);
      auVar129._16_4_ = (uint)bVar10 * auVar125._16_4_ | (uint)!bVar10 * auVar111._16_4_;
      bVar10 = (bool)((byte)(uVar73 >> 5) & 1);
      auVar129._20_4_ = (uint)bVar10 * auVar125._20_4_ | (uint)!bVar10 * auVar111._20_4_;
      bVar10 = (bool)((byte)(uVar73 >> 6) & 1);
      auVar129._24_4_ = (uint)bVar10 * auVar125._24_4_ | (uint)!bVar10 * auVar111._24_4_;
      bVar10 = SUB81(uVar73 >> 7,0);
      auVar129._28_4_ = (uint)bVar10 * auVar125._28_4_ | (uint)!bVar10 * auVar111._28_4_;
      auVar111 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar119,auVar111);
      local_640 = vmaxps_avx512vl(local_240,auVar111);
      auVar32._8_4_ = 0x36000000;
      auVar32._0_8_ = 0x3600000036000000;
      auVar32._12_4_ = 0x36000000;
      auVar32._16_4_ = 0x36000000;
      auVar32._20_4_ = 0x36000000;
      auVar32._24_4_ = 0x36000000;
      auVar32._28_4_ = 0x36000000;
      local_660 = vmulps_avx512vl(local_640,auVar32);
      vandps_avx512vl(auVar120,auVar111);
      uVar20 = vcmpps_avx512vl(local_660,local_660,1);
      uVar73 = uVar73 & uVar20;
      bVar67 = (byte)uVar73;
      if (bVar67 != 0) {
        uVar20 = vcmpps_avx512vl(auVar101,ZEXT1632(auVar82),2);
        auVar101 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar119 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar120 = vblendmps_avx512vl(auVar101,auVar119);
        bVar68 = (byte)uVar20;
        uVar75 = (uint)(bVar68 & 1) * auVar120._0_4_ | (uint)!(bool)(bVar68 & 1) * local_660._0_4_;
        bVar10 = (bool)((byte)(uVar20 >> 1) & 1);
        uVar74 = (uint)bVar10 * auVar120._4_4_ | (uint)!bVar10 * local_660._4_4_;
        bVar10 = (bool)((byte)(uVar20 >> 2) & 1);
        uVar145 = (uint)bVar10 * auVar120._8_4_ | (uint)!bVar10 * local_660._8_4_;
        bVar10 = (bool)((byte)(uVar20 >> 3) & 1);
        uVar146 = (uint)bVar10 * auVar120._12_4_ | (uint)!bVar10 * local_660._12_4_;
        bVar10 = (bool)((byte)(uVar20 >> 4) & 1);
        uVar147 = (uint)bVar10 * auVar120._16_4_ | (uint)!bVar10 * local_660._16_4_;
        bVar10 = (bool)((byte)(uVar20 >> 5) & 1);
        uVar148 = (uint)bVar10 * auVar120._20_4_ | (uint)!bVar10 * local_660._20_4_;
        bVar10 = (bool)((byte)(uVar20 >> 6) & 1);
        uVar149 = (uint)bVar10 * auVar120._24_4_ | (uint)!bVar10 * local_660._24_4_;
        bVar10 = SUB81(uVar20 >> 7,0);
        uVar150 = (uint)bVar10 * auVar120._28_4_ | (uint)!bVar10 * local_660._28_4_;
        auVar128._0_4_ = (bVar67 & 1) * uVar75 | !(bool)(bVar67 & 1) * auVar128._0_4_;
        bVar10 = (bool)((byte)(uVar73 >> 1) & 1);
        auVar128._4_4_ = bVar10 * uVar74 | !bVar10 * auVar128._4_4_;
        bVar10 = (bool)((byte)(uVar73 >> 2) & 1);
        auVar128._8_4_ = bVar10 * uVar145 | !bVar10 * auVar128._8_4_;
        bVar10 = (bool)((byte)(uVar73 >> 3) & 1);
        auVar128._12_4_ = bVar10 * uVar146 | !bVar10 * auVar128._12_4_;
        bVar10 = (bool)((byte)(uVar73 >> 4) & 1);
        auVar128._16_4_ = bVar10 * uVar147 | !bVar10 * auVar128._16_4_;
        bVar10 = (bool)((byte)(uVar73 >> 5) & 1);
        auVar128._20_4_ = bVar10 * uVar148 | !bVar10 * auVar128._20_4_;
        bVar10 = (bool)((byte)(uVar73 >> 6) & 1);
        auVar128._24_4_ = bVar10 * uVar149 | !bVar10 * auVar128._24_4_;
        bVar10 = SUB81(uVar73 >> 7,0);
        auVar128._28_4_ = bVar10 * uVar150 | !bVar10 * auVar128._28_4_;
        auVar101 = vblendmps_avx512vl(auVar119,auVar101);
        bVar10 = (bool)((byte)(uVar20 >> 1) & 1);
        bVar12 = (bool)((byte)(uVar20 >> 2) & 1);
        bVar13 = (bool)((byte)(uVar20 >> 3) & 1);
        bVar14 = (bool)((byte)(uVar20 >> 4) & 1);
        bVar15 = (bool)((byte)(uVar20 >> 5) & 1);
        bVar16 = (bool)((byte)(uVar20 >> 6) & 1);
        bVar17 = SUB81(uVar20 >> 7,0);
        auVar129._0_4_ =
             (uint)(bVar67 & 1) *
             ((uint)(bVar68 & 1) * auVar101._0_4_ | !(bool)(bVar68 & 1) * uVar75) |
             !(bool)(bVar67 & 1) * auVar129._0_4_;
        bVar11 = (bool)((byte)(uVar73 >> 1) & 1);
        auVar129._4_4_ =
             (uint)bVar11 * ((uint)bVar10 * auVar101._4_4_ | !bVar10 * uVar74) |
             !bVar11 * auVar129._4_4_;
        bVar10 = (bool)((byte)(uVar73 >> 2) & 1);
        auVar129._8_4_ =
             (uint)bVar10 * ((uint)bVar12 * auVar101._8_4_ | !bVar12 * uVar145) |
             !bVar10 * auVar129._8_4_;
        bVar10 = (bool)((byte)(uVar73 >> 3) & 1);
        auVar129._12_4_ =
             (uint)bVar10 * ((uint)bVar13 * auVar101._12_4_ | !bVar13 * uVar146) |
             !bVar10 * auVar129._12_4_;
        bVar10 = (bool)((byte)(uVar73 >> 4) & 1);
        auVar129._16_4_ =
             (uint)bVar10 * ((uint)bVar14 * auVar101._16_4_ | !bVar14 * uVar147) |
             !bVar10 * auVar129._16_4_;
        bVar10 = (bool)((byte)(uVar73 >> 5) & 1);
        auVar129._20_4_ =
             (uint)bVar10 * ((uint)bVar15 * auVar101._20_4_ | !bVar15 * uVar148) |
             !bVar10 * auVar129._20_4_;
        bVar10 = (bool)((byte)(uVar73 >> 6) & 1);
        auVar129._24_4_ =
             (uint)bVar10 * ((uint)bVar16 * auVar101._24_4_ | !bVar16 * uVar149) |
             !bVar10 * auVar129._24_4_;
        bVar10 = SUB81(uVar73 >> 7,0);
        auVar129._28_4_ =
             (uint)bVar10 * ((uint)bVar17 * auVar101._28_4_ | !bVar17 * uVar150) |
             !bVar10 * auVar129._28_4_;
        bVar62 = (~bVar67 | bVar68) & bVar62;
      }
      if ((bVar62 & 0x7f) == 0) {
        auVar297 = ZEXT3264(local_8c0);
        auVar298 = ZEXT3264(local_8e0);
        auVar299 = ZEXT3264(local_900);
        auVar300 = ZEXT3264(local_920);
      }
      else {
        auVar101 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar119 = vxorps_avx512vl(auVar118,auVar101);
        auVar120 = vxorps_avx512vl(auVar116,auVar101);
        uVar75 = *(uint *)(ray + k * 4 + 0x100);
        auVar111 = vxorps_avx512vl(auVar117,auVar101);
        auVar82 = vsubss_avx512f(ZEXT416(uVar75),ZEXT416((uint)local_6f0._0_4_));
        auVar116 = vbroadcastss_avx512vl(auVar82);
        auVar116 = vminps_avx512vl(auVar116,auVar129);
        auVar61._4_4_ = fStack_2dc;
        auVar61._0_4_ = local_2e0;
        auVar61._8_4_ = fStack_2d8;
        auVar61._12_4_ = fStack_2d4;
        auVar61._16_4_ = fStack_2d0;
        auVar61._20_4_ = fStack_2cc;
        auVar61._24_4_ = fStack_2c8;
        auVar61._28_4_ = fStack_2c4;
        auVar117 = vmaxps_avx512vl(auVar61,auVar128);
        auVar118 = vmulps_avx512vl(auVar132,auVar123);
        auVar118 = vfmadd213ps_avx512vl(auVar122,auVar131,auVar118);
        auVar82 = vfmadd213ps_fma(auVar121,auVar130,auVar118);
        auVar121 = vmulps_avx512vl(local_5c0,auVar132);
        auVar121 = vfmadd231ps_avx512vl(auVar121,local_5a0,auVar131);
        auVar83 = vfmadd231ps_fma(auVar121,_local_580,auVar130);
        auVar121 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        vandps_avx512vl(ZEXT1632(auVar83),auVar121);
        auVar118 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
        uVar19 = vcmpps_avx512vl(auVar121,auVar118,1);
        auVar122 = vxorps_avx512vl(ZEXT1632(auVar82),auVar101);
        auVar123 = vrcp14ps_avx512vl(ZEXT1632(auVar83));
        auVar103 = ZEXT1632(auVar83);
        auVar130 = vxorps_avx512vl(auVar103,auVar101);
        auVar131 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar132 = vfnmadd213ps_avx512vl(auVar123,auVar103,auVar131);
        auVar82 = vfmadd132ps_fma(auVar132,auVar123,auVar123);
        fVar245 = auVar82._0_4_ * auVar122._0_4_;
        fVar254 = auVar82._4_4_ * auVar122._4_4_;
        auVar37._4_4_ = fVar254;
        auVar37._0_4_ = fVar245;
        fVar255 = auVar82._8_4_ * auVar122._8_4_;
        auVar37._8_4_ = fVar255;
        fVar256 = auVar82._12_4_ * auVar122._12_4_;
        auVar37._12_4_ = fVar256;
        fVar152 = auVar122._16_4_ * 0.0;
        auVar37._16_4_ = fVar152;
        fVar174 = auVar122._20_4_ * 0.0;
        auVar37._20_4_ = fVar174;
        fVar175 = auVar122._24_4_ * 0.0;
        auVar37._24_4_ = fVar175;
        auVar37._28_4_ = auVar122._28_4_;
        uVar21 = vcmpps_avx512vl(auVar103,auVar130,1);
        bVar67 = (byte)uVar19 | (byte)uVar21;
        auVar132 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar125 = vblendmps_avx512vl(auVar37,auVar132);
        auVar133._0_4_ =
             (uint)(bVar67 & 1) * auVar125._0_4_ | (uint)!(bool)(bVar67 & 1) * auVar123._0_4_;
        bVar10 = (bool)(bVar67 >> 1 & 1);
        auVar133._4_4_ = (uint)bVar10 * auVar125._4_4_ | (uint)!bVar10 * auVar123._4_4_;
        bVar10 = (bool)(bVar67 >> 2 & 1);
        auVar133._8_4_ = (uint)bVar10 * auVar125._8_4_ | (uint)!bVar10 * auVar123._8_4_;
        bVar10 = (bool)(bVar67 >> 3 & 1);
        auVar133._12_4_ = (uint)bVar10 * auVar125._12_4_ | (uint)!bVar10 * auVar123._12_4_;
        bVar10 = (bool)(bVar67 >> 4 & 1);
        auVar133._16_4_ = (uint)bVar10 * auVar125._16_4_ | (uint)!bVar10 * auVar123._16_4_;
        bVar10 = (bool)(bVar67 >> 5 & 1);
        auVar133._20_4_ = (uint)bVar10 * auVar125._20_4_ | (uint)!bVar10 * auVar123._20_4_;
        bVar10 = (bool)(bVar67 >> 6 & 1);
        auVar133._24_4_ = (uint)bVar10 * auVar125._24_4_ | (uint)!bVar10 * auVar123._24_4_;
        auVar133._28_4_ =
             (uint)(bVar67 >> 7) * auVar125._28_4_ | (uint)!(bool)(bVar67 >> 7) * auVar123._28_4_;
        auVar123 = vmaxps_avx512vl(auVar117,auVar133);
        auVar293 = ZEXT3264(auVar123);
        uVar21 = vcmpps_avx512vl(auVar103,auVar130,6);
        bVar67 = (byte)uVar19 | (byte)uVar21;
        auVar134._0_4_ = (uint)(bVar67 & 1) * 0x7f800000 | (uint)!(bool)(bVar67 & 1) * (int)fVar245;
        bVar10 = (bool)(bVar67 >> 1 & 1);
        auVar134._4_4_ = (uint)bVar10 * 0x7f800000 | (uint)!bVar10 * (int)fVar254;
        bVar10 = (bool)(bVar67 >> 2 & 1);
        auVar134._8_4_ = (uint)bVar10 * 0x7f800000 | (uint)!bVar10 * (int)fVar255;
        bVar10 = (bool)(bVar67 >> 3 & 1);
        auVar134._12_4_ = (uint)bVar10 * 0x7f800000 | (uint)!bVar10 * (int)fVar256;
        bVar10 = (bool)(bVar67 >> 4 & 1);
        auVar134._16_4_ = (uint)bVar10 * 0x7f800000 | (uint)!bVar10 * (int)fVar152;
        bVar10 = (bool)(bVar67 >> 5 & 1);
        auVar134._20_4_ = (uint)bVar10 * 0x7f800000 | (uint)!bVar10 * (int)fVar174;
        bVar10 = (bool)(bVar67 >> 6 & 1);
        auVar134._24_4_ = (uint)bVar10 * 0x7f800000 | (uint)!bVar10 * (int)fVar175;
        auVar134._28_4_ =
             (uint)(bVar67 >> 7) * 0x7f800000 | (uint)!(bool)(bVar67 >> 7) * auVar122._28_4_;
        auVar122 = vminps_avx512vl(auVar116,auVar134);
        auVar82 = vxorps_avx512vl(auVar117._0_16_,auVar117._0_16_);
        auVar113 = vsubps_avx512vl(ZEXT1632(auVar82),auVar113);
        auVar114 = vsubps_avx512vl(ZEXT1632(auVar82),auVar114);
        auVar117 = ZEXT1632(auVar82);
        auVar115 = vsubps_avx512vl(auVar117,auVar115);
        auVar115 = vmulps_avx512vl(auVar115,auVar119);
        auVar114 = vfmadd231ps_avx512vl(auVar115,auVar111,auVar114);
        auVar113 = vfmadd231ps_avx512vl(auVar114,auVar120,auVar113);
        auVar119 = vmulps_avx512vl(local_5c0,auVar119);
        auVar119 = vfmadd231ps_avx512vl(auVar119,local_5a0,auVar111);
        auVar119 = vfmadd231ps_avx512vl(auVar119,_local_580,auVar120);
        vandps_avx512vl(auVar119,auVar121);
        uVar19 = vcmpps_avx512vl(auVar119,auVar118,1);
        auVar120 = vxorps_avx512vl(auVar113,auVar101);
        auVar121 = vrcp14ps_avx512vl(auVar119);
        auVar101 = vxorps_avx512vl(auVar119,auVar101);
        auVar288 = ZEXT3264(auVar101);
        auVar111 = vfnmadd213ps_avx512vl(auVar121,auVar119,auVar131);
        auVar82 = vfmadd132ps_fma(auVar111,auVar121,auVar121);
        fVar245 = auVar82._0_4_ * auVar120._0_4_;
        fVar254 = auVar82._4_4_ * auVar120._4_4_;
        auVar38._4_4_ = fVar254;
        auVar38._0_4_ = fVar245;
        fVar255 = auVar82._8_4_ * auVar120._8_4_;
        auVar38._8_4_ = fVar255;
        fVar256 = auVar82._12_4_ * auVar120._12_4_;
        auVar38._12_4_ = fVar256;
        fVar152 = auVar120._16_4_ * 0.0;
        auVar38._16_4_ = fVar152;
        fVar174 = auVar120._20_4_ * 0.0;
        auVar38._20_4_ = fVar174;
        fVar175 = auVar120._24_4_ * 0.0;
        auVar38._24_4_ = fVar175;
        auVar38._28_4_ = auVar120._28_4_;
        uVar21 = vcmpps_avx512vl(auVar119,auVar101,1);
        bVar67 = (byte)uVar19 | (byte)uVar21;
        auVar111 = vblendmps_avx512vl(auVar38,auVar132);
        auVar135._0_4_ =
             (uint)(bVar67 & 1) * auVar111._0_4_ | (uint)!(bool)(bVar67 & 1) * auVar121._0_4_;
        bVar10 = (bool)(bVar67 >> 1 & 1);
        auVar135._4_4_ = (uint)bVar10 * auVar111._4_4_ | (uint)!bVar10 * auVar121._4_4_;
        bVar10 = (bool)(bVar67 >> 2 & 1);
        auVar135._8_4_ = (uint)bVar10 * auVar111._8_4_ | (uint)!bVar10 * auVar121._8_4_;
        bVar10 = (bool)(bVar67 >> 3 & 1);
        auVar135._12_4_ = (uint)bVar10 * auVar111._12_4_ | (uint)!bVar10 * auVar121._12_4_;
        bVar10 = (bool)(bVar67 >> 4 & 1);
        auVar135._16_4_ = (uint)bVar10 * auVar111._16_4_ | (uint)!bVar10 * auVar121._16_4_;
        bVar10 = (bool)(bVar67 >> 5 & 1);
        auVar135._20_4_ = (uint)bVar10 * auVar111._20_4_ | (uint)!bVar10 * auVar121._20_4_;
        bVar10 = (bool)(bVar67 >> 6 & 1);
        auVar135._24_4_ = (uint)bVar10 * auVar111._24_4_ | (uint)!bVar10 * auVar121._24_4_;
        auVar135._28_4_ =
             (uint)(bVar67 >> 7) * auVar111._28_4_ | (uint)!(bool)(bVar67 >> 7) * auVar121._28_4_;
        auVar286 = ZEXT3264(auVar135);
        _local_680 = vmaxps_avx(auVar123,auVar135);
        auVar280 = ZEXT3264(_local_680);
        uVar21 = vcmpps_avx512vl(auVar119,auVar101,6);
        bVar67 = (byte)uVar19 | (byte)uVar21;
        auVar136._0_4_ = (uint)(bVar67 & 1) * 0x7f800000 | (uint)!(bool)(bVar67 & 1) * (int)fVar245;
        bVar10 = (bool)(bVar67 >> 1 & 1);
        auVar136._4_4_ = (uint)bVar10 * 0x7f800000 | (uint)!bVar10 * (int)fVar254;
        bVar10 = (bool)(bVar67 >> 2 & 1);
        auVar136._8_4_ = (uint)bVar10 * 0x7f800000 | (uint)!bVar10 * (int)fVar255;
        bVar10 = (bool)(bVar67 >> 3 & 1);
        auVar136._12_4_ = (uint)bVar10 * 0x7f800000 | (uint)!bVar10 * (int)fVar256;
        bVar10 = (bool)(bVar67 >> 4 & 1);
        auVar136._16_4_ = (uint)bVar10 * 0x7f800000 | (uint)!bVar10 * (int)fVar152;
        bVar10 = (bool)(bVar67 >> 5 & 1);
        auVar136._20_4_ = (uint)bVar10 * 0x7f800000 | (uint)!bVar10 * (int)fVar174;
        bVar10 = (bool)(bVar67 >> 6 & 1);
        auVar136._24_4_ = (uint)bVar10 * 0x7f800000 | (uint)!bVar10 * (int)fVar175;
        auVar136._28_4_ =
             (uint)(bVar67 >> 7) * 0x7f800000 | (uint)!(bool)(bVar67 >> 7) * auVar120._28_4_;
        local_340 = vminps_avx(auVar122,auVar136);
        auVar285 = ZEXT3264(local_340);
        uVar19 = vcmpps_avx512vl(_local_680,local_340,2);
        bVar62 = bVar62 & 0x7f & (byte)uVar19;
        if (bVar62 == 0) goto LAB_01ba50c7;
        auVar101 = vmaxps_avx512vl(auVar117,auVar104);
        auVar104 = vfmadd213ps_avx512vl(local_8a0,auVar126,auVar112);
        fVar245 = auVar107._0_4_;
        fVar254 = auVar107._4_4_;
        auVar39._4_4_ = fVar254 * auVar104._4_4_;
        auVar39._0_4_ = fVar245 * auVar104._0_4_;
        fVar255 = auVar107._8_4_;
        auVar39._8_4_ = fVar255 * auVar104._8_4_;
        fVar256 = auVar107._12_4_;
        auVar39._12_4_ = fVar256 * auVar104._12_4_;
        fVar152 = auVar107._16_4_;
        auVar39._16_4_ = fVar152 * auVar104._16_4_;
        fVar174 = auVar107._20_4_;
        auVar39._20_4_ = fVar174 * auVar104._20_4_;
        fVar175 = auVar107._24_4_;
        auVar39._24_4_ = fVar175 * auVar104._24_4_;
        auVar39._28_4_ = auVar104._28_4_;
        auVar104 = vfmadd213ps_avx512vl(local_5e0,auVar126,auVar112);
        auVar40._4_4_ = fVar254 * auVar104._4_4_;
        auVar40._0_4_ = fVar245 * auVar104._0_4_;
        auVar40._8_4_ = fVar255 * auVar104._8_4_;
        auVar40._12_4_ = fVar256 * auVar104._12_4_;
        auVar40._16_4_ = fVar152 * auVar104._16_4_;
        auVar40._20_4_ = fVar174 * auVar104._20_4_;
        auVar40._24_4_ = fVar175 * auVar104._24_4_;
        auVar40._28_4_ = auVar135._28_4_;
        auVar104 = vminps_avx512vl(auVar39,auVar131);
        auVar49 = ZEXT812(0);
        auVar119 = ZEXT1232(auVar49) << 0x20;
        auVar104 = vmaxps_avx(auVar104,ZEXT1232(auVar49) << 0x20);
        auVar120 = vminps_avx512vl(auVar40,auVar131);
        auVar41._4_4_ = (auVar104._4_4_ + 1.0) * 0.125;
        auVar41._0_4_ = (auVar104._0_4_ + 0.0) * 0.125;
        auVar41._8_4_ = (auVar104._8_4_ + 2.0) * 0.125;
        auVar41._12_4_ = (auVar104._12_4_ + 3.0) * 0.125;
        auVar41._16_4_ = (auVar104._16_4_ + 4.0) * 0.125;
        auVar41._20_4_ = (auVar104._20_4_ + 5.0) * 0.125;
        auVar41._24_4_ = (auVar104._24_4_ + 6.0) * 0.125;
        auVar41._28_4_ = auVar104._28_4_ + 7.0;
        auVar82 = vfmadd213ps_fma(auVar41,auVar164,local_860);
        local_1a0 = ZEXT1632(auVar82);
        auVar104 = vmaxps_avx(auVar120,ZEXT1232(auVar49) << 0x20);
        auVar42._4_4_ = (auVar104._4_4_ + 1.0) * 0.125;
        auVar42._0_4_ = (auVar104._0_4_ + 0.0) * 0.125;
        auVar42._8_4_ = (auVar104._8_4_ + 2.0) * 0.125;
        auVar42._12_4_ = (auVar104._12_4_ + 3.0) * 0.125;
        auVar42._16_4_ = (auVar104._16_4_ + 4.0) * 0.125;
        auVar42._20_4_ = (auVar104._20_4_ + 5.0) * 0.125;
        auVar42._24_4_ = (auVar104._24_4_ + 6.0) * 0.125;
        auVar42._28_4_ = auVar104._28_4_ + 7.0;
        auVar82 = vfmadd213ps_fma(auVar42,auVar164,local_860);
        local_1c0 = ZEXT1632(auVar82);
        auVar43._4_4_ = auVar101._4_4_ * auVar101._4_4_;
        auVar43._0_4_ = auVar101._0_4_ * auVar101._0_4_;
        auVar43._8_4_ = auVar101._8_4_ * auVar101._8_4_;
        auVar43._12_4_ = auVar101._12_4_ * auVar101._12_4_;
        auVar43._16_4_ = auVar101._16_4_ * auVar101._16_4_;
        auVar43._20_4_ = auVar101._20_4_ * auVar101._20_4_;
        auVar43._24_4_ = auVar101._24_4_ * auVar101._24_4_;
        auVar43._28_4_ = auVar101._28_4_;
        auVar104 = vsubps_avx(local_820,auVar43);
        auVar44._4_4_ = auVar104._4_4_ * (float)local_880._4_4_;
        auVar44._0_4_ = auVar104._0_4_ * (float)local_880._0_4_;
        auVar44._8_4_ = auVar104._8_4_ * fStack_878;
        auVar44._12_4_ = auVar104._12_4_ * fStack_874;
        auVar44._16_4_ = auVar104._16_4_ * fStack_870;
        auVar44._20_4_ = auVar104._20_4_ * fStack_86c;
        auVar44._24_4_ = auVar104._24_4_ * fStack_868;
        auVar44._28_4_ = auVar101._28_4_;
        auVar101 = vsubps_avx(local_740,auVar44);
        uVar19 = vcmpps_avx512vl(auVar101,ZEXT1232(auVar49) << 0x20,5);
        bVar67 = (byte)uVar19;
        auVar299 = ZEXT3264(local_900);
        auVar300 = ZEXT3264(local_920);
        if (bVar67 == 0) {
          bVar67 = 0;
          auVar102 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar199 = ZEXT864(0) << 0x20;
          auVar101 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar120 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar286 = ZEXT864(0) << 0x20;
          auVar137._8_4_ = 0x7f800000;
          auVar137._0_8_ = 0x7f8000007f800000;
          auVar137._12_4_ = 0x7f800000;
          auVar137._16_4_ = 0x7f800000;
          auVar137._20_4_ = 0x7f800000;
          auVar137._24_4_ = 0x7f800000;
          auVar137._28_4_ = 0x7f800000;
          auVar138._8_4_ = 0xff800000;
          auVar138._0_8_ = 0xff800000ff800000;
          auVar138._12_4_ = 0xff800000;
          auVar138._16_4_ = 0xff800000;
          auVar138._20_4_ = 0xff800000;
          auVar138._24_4_ = 0xff800000;
          auVar138._28_4_ = 0xff800000;
        }
        else {
          auVar83 = vxorps_avx512vl(auVar116._0_16_,auVar116._0_16_);
          uVar73 = vcmpps_avx512vl(auVar101,auVar117,5);
          auVar101 = vsqrtps_avx(auVar101);
          auVar119 = vfnmadd213ps_avx512vl(auVar127,_local_600,auVar131);
          auVar121 = vfmadd132ps_avx512vl(auVar119,_local_600,_local_600);
          auVar119 = vsubps_avx(local_620,auVar101);
          auVar111 = vmulps_avx512vl(auVar119,auVar121);
          auVar101 = vsubps_avx512vl(auVar101,auVar124);
          auVar121 = vmulps_avx512vl(auVar101,auVar121);
          auVar101 = vfmadd213ps_avx512vl(auVar126,auVar111,auVar112);
          auVar45._4_4_ = fVar254 * auVar101._4_4_;
          auVar45._0_4_ = fVar245 * auVar101._0_4_;
          auVar45._8_4_ = fVar255 * auVar101._8_4_;
          auVar45._12_4_ = fVar256 * auVar101._12_4_;
          auVar45._16_4_ = fVar152 * auVar101._16_4_;
          auVar45._20_4_ = fVar174 * auVar101._20_4_;
          auVar45._24_4_ = fVar175 * auVar101._24_4_;
          auVar45._28_4_ = auVar120._28_4_;
          auVar46._4_4_ = (float)local_580._4_4_ * auVar111._4_4_;
          auVar46._0_4_ = (float)local_580._0_4_ * auVar111._0_4_;
          auVar46._8_4_ = fStack_578 * auVar111._8_4_;
          auVar46._12_4_ = fStack_574 * auVar111._12_4_;
          auVar46._16_4_ = fStack_570 * auVar111._16_4_;
          auVar46._20_4_ = fStack_56c * auVar111._20_4_;
          auVar46._24_4_ = fStack_568 * auVar111._24_4_;
          auVar46._28_4_ = auVar101._28_4_;
          auVar119 = vmulps_avx512vl(local_5a0,auVar111);
          auVar113 = vmulps_avx512vl(local_5c0,auVar111);
          auVar101 = vfmadd213ps_avx512vl(auVar102,auVar45,auVar108);
          auVar101 = vsubps_avx512vl(auVar46,auVar101);
          auVar120 = vfmadd213ps_avx512vl(auVar105,auVar45,auVar109);
          auVar120 = vsubps_avx512vl(auVar119,auVar120);
          auVar82 = vfmadd213ps_fma(auVar45,auVar106,auVar110);
          auVar119 = vsubps_avx(auVar113,ZEXT1632(auVar82));
          auVar286 = ZEXT3264(auVar119);
          auVar112 = vfmadd213ps_avx512vl(auVar126,auVar121,auVar112);
          auVar107 = vmulps_avx512vl(auVar107,auVar112);
          auVar47._4_4_ = (float)local_580._4_4_ * auVar121._4_4_;
          auVar47._0_4_ = (float)local_580._0_4_ * auVar121._0_4_;
          auVar47._8_4_ = fStack_578 * auVar121._8_4_;
          auVar47._12_4_ = fStack_574 * auVar121._12_4_;
          auVar47._16_4_ = fStack_570 * auVar121._16_4_;
          auVar47._20_4_ = fStack_56c * auVar121._20_4_;
          auVar47._24_4_ = fStack_568 * auVar121._24_4_;
          auVar47._28_4_ = auVar113._28_4_;
          auVar112 = vmulps_avx512vl(local_5a0,auVar121);
          auVar113 = vmulps_avx512vl(local_5c0,auVar121);
          auVar82 = vfmadd213ps_fma(auVar102,auVar107,auVar108);
          auVar119 = vsubps_avx(auVar47,ZEXT1632(auVar82));
          auVar82 = vfmadd213ps_fma(auVar105,auVar107,auVar109);
          auVar102 = vsubps_avx512vl(auVar112,ZEXT1632(auVar82));
          auVar82 = vfmadd213ps_fma(auVar106,auVar107,auVar110);
          auVar105 = vsubps_avx512vl(auVar113,ZEXT1632(auVar82));
          auVar199 = ZEXT3264(auVar105);
          auVar165._8_4_ = 0x7f800000;
          auVar165._0_8_ = 0x7f8000007f800000;
          auVar165._12_4_ = 0x7f800000;
          auVar165._16_4_ = 0x7f800000;
          auVar165._20_4_ = 0x7f800000;
          auVar165._24_4_ = 0x7f800000;
          auVar165._28_4_ = 0x7f800000;
          auVar105 = vblendmps_avx512vl(auVar165,auVar111);
          bVar10 = (bool)((byte)uVar73 & 1);
          auVar137._0_4_ = (uint)bVar10 * auVar105._0_4_ | (uint)!bVar10 * auVar108._0_4_;
          bVar10 = (bool)((byte)(uVar73 >> 1) & 1);
          auVar137._4_4_ = (uint)bVar10 * auVar105._4_4_ | (uint)!bVar10 * auVar108._4_4_;
          bVar10 = (bool)((byte)(uVar73 >> 2) & 1);
          auVar137._8_4_ = (uint)bVar10 * auVar105._8_4_ | (uint)!bVar10 * auVar108._8_4_;
          bVar10 = (bool)((byte)(uVar73 >> 3) & 1);
          auVar137._12_4_ = (uint)bVar10 * auVar105._12_4_ | (uint)!bVar10 * auVar108._12_4_;
          bVar10 = (bool)((byte)(uVar73 >> 4) & 1);
          auVar137._16_4_ = (uint)bVar10 * auVar105._16_4_ | (uint)!bVar10 * auVar108._16_4_;
          bVar10 = (bool)((byte)(uVar73 >> 5) & 1);
          auVar137._20_4_ = (uint)bVar10 * auVar105._20_4_ | (uint)!bVar10 * auVar108._20_4_;
          bVar10 = (bool)((byte)(uVar73 >> 6) & 1);
          auVar137._24_4_ = (uint)bVar10 * auVar105._24_4_ | (uint)!bVar10 * auVar108._24_4_;
          bVar10 = SUB81(uVar73 >> 7,0);
          auVar137._28_4_ = (uint)bVar10 * auVar105._28_4_ | (uint)!bVar10 * auVar108._28_4_;
          auVar166._8_4_ = 0xff800000;
          auVar166._0_8_ = 0xff800000ff800000;
          auVar166._12_4_ = 0xff800000;
          auVar166._16_4_ = 0xff800000;
          auVar166._20_4_ = 0xff800000;
          auVar166._24_4_ = 0xff800000;
          auVar166._28_4_ = 0xff800000;
          auVar105 = vblendmps_avx512vl(auVar166,auVar121);
          bVar10 = (bool)((byte)uVar73 & 1);
          auVar138._0_4_ = (uint)bVar10 * auVar105._0_4_ | (uint)!bVar10 * -0x800000;
          bVar10 = (bool)((byte)(uVar73 >> 1) & 1);
          auVar138._4_4_ = (uint)bVar10 * auVar105._4_4_ | (uint)!bVar10 * -0x800000;
          bVar10 = (bool)((byte)(uVar73 >> 2) & 1);
          auVar138._8_4_ = (uint)bVar10 * auVar105._8_4_ | (uint)!bVar10 * -0x800000;
          bVar10 = (bool)((byte)(uVar73 >> 3) & 1);
          auVar138._12_4_ = (uint)bVar10 * auVar105._12_4_ | (uint)!bVar10 * -0x800000;
          bVar10 = (bool)((byte)(uVar73 >> 4) & 1);
          auVar138._16_4_ = (uint)bVar10 * auVar105._16_4_ | (uint)!bVar10 * -0x800000;
          bVar10 = (bool)((byte)(uVar73 >> 5) & 1);
          auVar138._20_4_ = (uint)bVar10 * auVar105._20_4_ | (uint)!bVar10 * -0x800000;
          bVar10 = (bool)((byte)(uVar73 >> 6) & 1);
          auVar138._24_4_ = (uint)bVar10 * auVar105._24_4_ | (uint)!bVar10 * -0x800000;
          bVar10 = SUB81(uVar73 >> 7,0);
          auVar138._28_4_ = (uint)bVar10 * auVar105._28_4_ | (uint)!bVar10 * -0x800000;
          auVar33._8_4_ = 0x36000000;
          auVar33._0_8_ = 0x3600000036000000;
          auVar33._12_4_ = 0x36000000;
          auVar33._16_4_ = 0x36000000;
          auVar33._20_4_ = 0x36000000;
          auVar33._24_4_ = 0x36000000;
          auVar33._28_4_ = 0x36000000;
          auVar105 = vmulps_avx512vl(local_640,auVar33);
          uVar20 = vcmpps_avx512vl(auVar105,local_660,0xe);
          uVar73 = uVar73 & uVar20;
          bVar68 = (byte)uVar73;
          if (bVar68 != 0) {
            uVar20 = vcmpps_avx512vl(auVar104,ZEXT1632(auVar83),2);
            auVar274._8_4_ = 0x7f800000;
            auVar274._0_8_ = 0x7f8000007f800000;
            auVar274._12_4_ = 0x7f800000;
            auVar274._16_4_ = 0x7f800000;
            auVar274._20_4_ = 0x7f800000;
            auVar274._24_4_ = 0x7f800000;
            auVar274._28_4_ = 0x7f800000;
            auVar292._8_4_ = 0xff800000;
            auVar292._0_8_ = 0xff800000ff800000;
            auVar292._12_4_ = 0xff800000;
            auVar292._16_4_ = 0xff800000;
            auVar292._20_4_ = 0xff800000;
            auVar292._24_4_ = 0xff800000;
            auVar292._28_4_ = 0xff800000;
            auVar104 = vblendmps_avx512vl(auVar274,auVar292);
            bVar71 = (byte)uVar20;
            uVar74 = (uint)(bVar71 & 1) * auVar104._0_4_ |
                     (uint)!(bool)(bVar71 & 1) * auVar105._0_4_;
            bVar10 = (bool)((byte)(uVar20 >> 1) & 1);
            uVar145 = (uint)bVar10 * auVar104._4_4_ | (uint)!bVar10 * auVar105._4_4_;
            bVar10 = (bool)((byte)(uVar20 >> 2) & 1);
            uVar146 = (uint)bVar10 * auVar104._8_4_ | (uint)!bVar10 * auVar105._8_4_;
            bVar10 = (bool)((byte)(uVar20 >> 3) & 1);
            uVar147 = (uint)bVar10 * auVar104._12_4_ | (uint)!bVar10 * auVar105._12_4_;
            bVar10 = (bool)((byte)(uVar20 >> 4) & 1);
            uVar148 = (uint)bVar10 * auVar104._16_4_ | (uint)!bVar10 * auVar105._16_4_;
            bVar10 = (bool)((byte)(uVar20 >> 5) & 1);
            uVar149 = (uint)bVar10 * auVar104._20_4_ | (uint)!bVar10 * auVar105._20_4_;
            bVar10 = (bool)((byte)(uVar20 >> 6) & 1);
            uVar150 = (uint)bVar10 * auVar104._24_4_ | (uint)!bVar10 * auVar105._24_4_;
            bVar10 = SUB81(uVar20 >> 7,0);
            uVar151 = (uint)bVar10 * auVar104._28_4_ | (uint)!bVar10 * auVar105._28_4_;
            auVar137._0_4_ = (bVar68 & 1) * uVar74 | !(bool)(bVar68 & 1) * auVar137._0_4_;
            bVar10 = (bool)((byte)(uVar73 >> 1) & 1);
            auVar137._4_4_ = bVar10 * uVar145 | !bVar10 * auVar137._4_4_;
            bVar10 = (bool)((byte)(uVar73 >> 2) & 1);
            auVar137._8_4_ = bVar10 * uVar146 | !bVar10 * auVar137._8_4_;
            bVar10 = (bool)((byte)(uVar73 >> 3) & 1);
            auVar137._12_4_ = bVar10 * uVar147 | !bVar10 * auVar137._12_4_;
            bVar10 = (bool)((byte)(uVar73 >> 4) & 1);
            auVar137._16_4_ = bVar10 * uVar148 | !bVar10 * auVar137._16_4_;
            bVar10 = (bool)((byte)(uVar73 >> 5) & 1);
            auVar137._20_4_ = bVar10 * uVar149 | !bVar10 * auVar137._20_4_;
            bVar10 = (bool)((byte)(uVar73 >> 6) & 1);
            auVar137._24_4_ = bVar10 * uVar150 | !bVar10 * auVar137._24_4_;
            bVar10 = SUB81(uVar73 >> 7,0);
            auVar137._28_4_ = bVar10 * uVar151 | !bVar10 * auVar137._28_4_;
            auVar104 = vblendmps_avx512vl(auVar292,auVar274);
            bVar10 = (bool)((byte)(uVar20 >> 1) & 1);
            bVar12 = (bool)((byte)(uVar20 >> 2) & 1);
            bVar13 = (bool)((byte)(uVar20 >> 3) & 1);
            bVar14 = (bool)((byte)(uVar20 >> 4) & 1);
            bVar15 = (bool)((byte)(uVar20 >> 5) & 1);
            bVar16 = (bool)((byte)(uVar20 >> 6) & 1);
            bVar17 = SUB81(uVar20 >> 7,0);
            auVar138._0_4_ =
                 (uint)(bVar68 & 1) *
                 ((uint)(bVar71 & 1) * auVar104._0_4_ | !(bool)(bVar71 & 1) * uVar74) |
                 !(bool)(bVar68 & 1) * auVar138._0_4_;
            bVar11 = (bool)((byte)(uVar73 >> 1) & 1);
            auVar138._4_4_ =
                 (uint)bVar11 * ((uint)bVar10 * auVar104._4_4_ | !bVar10 * uVar145) |
                 !bVar11 * auVar138._4_4_;
            bVar10 = (bool)((byte)(uVar73 >> 2) & 1);
            auVar138._8_4_ =
                 (uint)bVar10 * ((uint)bVar12 * auVar104._8_4_ | !bVar12 * uVar146) |
                 !bVar10 * auVar138._8_4_;
            bVar10 = (bool)((byte)(uVar73 >> 3) & 1);
            auVar138._12_4_ =
                 (uint)bVar10 * ((uint)bVar13 * auVar104._12_4_ | !bVar13 * uVar147) |
                 !bVar10 * auVar138._12_4_;
            bVar10 = (bool)((byte)(uVar73 >> 4) & 1);
            auVar138._16_4_ =
                 (uint)bVar10 * ((uint)bVar14 * auVar104._16_4_ | !bVar14 * uVar148) |
                 !bVar10 * auVar138._16_4_;
            bVar10 = (bool)((byte)(uVar73 >> 5) & 1);
            auVar138._20_4_ =
                 (uint)bVar10 * ((uint)bVar15 * auVar104._20_4_ | !bVar15 * uVar149) |
                 !bVar10 * auVar138._20_4_;
            bVar10 = (bool)((byte)(uVar73 >> 6) & 1);
            auVar138._24_4_ =
                 (uint)bVar10 * ((uint)bVar16 * auVar104._24_4_ | !bVar16 * uVar150) |
                 !bVar10 * auVar138._24_4_;
            bVar10 = SUB81(uVar73 >> 7,0);
            auVar138._28_4_ =
                 (uint)bVar10 * ((uint)bVar17 * auVar104._28_4_ | !bVar17 * uVar151) |
                 !bVar10 * auVar138._28_4_;
            bVar67 = (~bVar68 | bVar71) & bVar67;
          }
        }
        auVar293 = ZEXT3264(local_5c0);
        auVar263._0_4_ = local_5c0._0_4_ * auVar199._0_4_;
        auVar263._4_4_ = local_5c0._4_4_ * auVar199._4_4_;
        auVar263._8_4_ = local_5c0._8_4_ * auVar199._8_4_;
        auVar263._12_4_ = local_5c0._12_4_ * auVar199._12_4_;
        auVar263._16_4_ = local_5c0._16_4_ * auVar199._16_4_;
        auVar263._20_4_ = local_5c0._20_4_ * auVar199._20_4_;
        auVar263._28_36_ = auVar199._28_36_;
        auVar263._24_4_ = local_5c0._24_4_ * auVar199._24_4_;
        auVar280 = ZEXT3264(local_5a0);
        auVar82 = vfmadd231ps_fma(auVar263._0_32_,local_5a0,auVar102);
        auVar275 = ZEXT3264(_local_580);
        auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),_local_580,auVar119);
        auVar288 = ZEXT3264(_local_680);
        _local_200 = _local_680;
        local_1e0 = vminps_avx(local_340,auVar137);
        auVar269._8_4_ = 0x7fffffff;
        auVar269._0_8_ = 0x7fffffff7fffffff;
        auVar269._12_4_ = 0x7fffffff;
        auVar269._16_4_ = 0x7fffffff;
        auVar269._20_4_ = 0x7fffffff;
        auVar269._24_4_ = 0x7fffffff;
        auVar269._28_4_ = 0x7fffffff;
        auVar104 = vandps_avx(ZEXT1632(auVar82),auVar269);
        local_360 = vmaxps_avx(_local_680,auVar138);
        auVar263 = ZEXT3264(local_360);
        auVar167._8_4_ = 0x3e99999a;
        auVar167._0_8_ = 0x3e99999a3e99999a;
        auVar167._12_4_ = 0x3e99999a;
        auVar167._16_4_ = 0x3e99999a;
        auVar167._20_4_ = 0x3e99999a;
        auVar167._24_4_ = 0x3e99999a;
        auVar167._28_4_ = 0x3e99999a;
        uVar19 = vcmpps_avx512vl(auVar104,auVar167,1);
        local_560._0_2_ = (short)uVar19;
        uVar19 = vcmpps_avx512vl(_local_680,local_1e0,2);
        bVar68 = (byte)uVar19 & bVar62;
        uVar21 = vcmpps_avx512vl(local_360,local_340,2);
        auVar297 = ZEXT3264(local_8c0);
        auVar298 = ZEXT3264(local_8e0);
        if ((bVar62 & ((byte)uVar21 | (byte)uVar19)) != 0) {
          auVar48._4_4_ = local_5c0._4_4_ * auVar286._4_4_;
          auVar48._0_4_ = local_5c0._0_4_ * auVar286._0_4_;
          auVar48._8_4_ = local_5c0._8_4_ * auVar286._8_4_;
          auVar48._12_4_ = local_5c0._12_4_ * auVar286._12_4_;
          auVar48._16_4_ = local_5c0._16_4_ * auVar286._16_4_;
          auVar48._20_4_ = local_5c0._20_4_ * auVar286._20_4_;
          auVar48._24_4_ = local_5c0._24_4_ * auVar286._24_4_;
          auVar48._28_4_ = 0x3e99999a;
          auVar82 = vfmadd213ps_fma(auVar120,local_5a0,auVar48);
          auVar82 = vfmadd213ps_fma(auVar101,_local_580,ZEXT1632(auVar82));
          auVar104 = vandps_avx(ZEXT1632(auVar82),auVar269);
          uVar19 = vcmpps_avx512vl(auVar104,auVar167,1);
          bVar71 = (byte)uVar19 | ~bVar67;
          auVar168._8_4_ = 2;
          auVar168._0_8_ = 0x200000002;
          auVar168._12_4_ = 2;
          auVar168._16_4_ = 2;
          auVar168._20_4_ = 2;
          auVar168._24_4_ = 2;
          auVar168._28_4_ = 2;
          auVar34._8_4_ = 3;
          auVar34._0_8_ = 0x300000003;
          auVar34._12_4_ = 3;
          auVar34._16_4_ = 3;
          auVar34._20_4_ = 3;
          auVar34._24_4_ = 3;
          auVar34._28_4_ = 3;
          auVar104 = vpblendmd_avx512vl(auVar168,auVar34);
          local_300._0_4_ = (uint)(bVar71 & 1) * auVar104._0_4_ | (uint)!(bool)(bVar71 & 1) * 2;
          bVar10 = (bool)(bVar71 >> 1 & 1);
          local_300._4_4_ = (uint)bVar10 * auVar104._4_4_ | (uint)!bVar10 * 2;
          bVar10 = (bool)(bVar71 >> 2 & 1);
          local_300._8_4_ = (uint)bVar10 * auVar104._8_4_ | (uint)!bVar10 * 2;
          bVar10 = (bool)(bVar71 >> 3 & 1);
          local_300._12_4_ = (uint)bVar10 * auVar104._12_4_ | (uint)!bVar10 * 2;
          bVar10 = (bool)(bVar71 >> 4 & 1);
          local_300._16_4_ = (uint)bVar10 * auVar104._16_4_ | (uint)!bVar10 * 2;
          bVar10 = (bool)(bVar71 >> 5 & 1);
          local_300._20_4_ = (uint)bVar10 * auVar104._20_4_ | (uint)!bVar10 * 2;
          bVar10 = (bool)(bVar71 >> 6 & 1);
          local_300._24_4_ = (uint)bVar10 * auVar104._24_4_ | (uint)!bVar10 * 2;
          local_300._28_4_ = (uint)(bVar71 >> 7) * auVar104._28_4_ | (uint)!(bool)(bVar71 >> 7) * 2;
          local_4e0 = vpbroadcastd_avx512vl();
          uVar19 = vpcmpd_avx512vl(local_4e0,local_300,5);
          bVar71 = (byte)uVar19 & bVar68;
          if (bVar71 == 0) {
            auVar170._4_4_ = uVar75;
            auVar170._0_4_ = uVar75;
            auVar170._8_4_ = uVar75;
            auVar170._12_4_ = uVar75;
            auVar170._16_4_ = uVar75;
            auVar170._20_4_ = uVar75;
            auVar170._24_4_ = uVar75;
            auVar170._28_4_ = uVar75;
          }
          else {
            local_320 = local_360;
            auVar83 = vminps_avx(local_760._0_16_,local_7a0._0_16_);
            auVar82 = vmaxps_avx(local_760._0_16_,local_7a0._0_16_);
            auVar18 = vminps_avx(local_780._0_16_,local_7c0._0_16_);
            auVar84 = vminps_avx(auVar83,auVar18);
            auVar83 = vmaxps_avx(local_780._0_16_,local_7c0._0_16_);
            auVar18 = vmaxps_avx(auVar82,auVar83);
            auVar204._8_4_ = 0x7fffffff;
            auVar204._0_8_ = 0x7fffffff7fffffff;
            auVar204._12_4_ = 0x7fffffff;
            auVar82 = vandps_avx(auVar84,auVar204);
            auVar83 = vandps_avx(auVar18,auVar204);
            auVar82 = vmaxps_avx(auVar82,auVar83);
            auVar83 = vmovshdup_avx(auVar82);
            auVar83 = vmaxss_avx(auVar83,auVar82);
            auVar82 = vshufpd_avx(auVar82,auVar82,1);
            auVar82 = vmaxss_avx(auVar82,auVar83);
            local_840._0_4_ = auVar82._0_4_ * 1.9073486e-06;
            local_6e0 = vshufps_avx(auVar18,auVar18,0xff);
            local_540 = (float)local_680._0_4_ + (float)local_7e0._0_4_;
            fStack_53c = (float)local_680._4_4_ + (float)local_7e0._4_4_;
            fStack_538 = fStack_678 + fStack_7d8;
            fStack_534 = fStack_674 + fStack_7d4;
            fStack_530 = fStack_670 + fStack_7d0;
            fStack_52c = fStack_66c + fStack_7cc;
            fStack_528 = fStack_668 + fStack_7c8;
            fStack_524 = fStack_664 + fStack_7c4;
            do {
              auVar169._8_4_ = 0x7f800000;
              auVar169._0_8_ = 0x7f8000007f800000;
              auVar169._12_4_ = 0x7f800000;
              auVar169._16_4_ = 0x7f800000;
              auVar169._20_4_ = 0x7f800000;
              auVar169._24_4_ = 0x7f800000;
              auVar169._28_4_ = 0x7f800000;
              auVar104 = vblendmps_avx512vl(auVar169,_local_680);
              auVar139._0_4_ =
                   (uint)(bVar71 & 1) * auVar104._0_4_ | (uint)!(bool)(bVar71 & 1) * 0x7f800000;
              bVar10 = (bool)(bVar71 >> 1 & 1);
              auVar139._4_4_ = (uint)bVar10 * auVar104._4_4_ | (uint)!bVar10 * 0x7f800000;
              bVar10 = (bool)(bVar71 >> 2 & 1);
              auVar139._8_4_ = (uint)bVar10 * auVar104._8_4_ | (uint)!bVar10 * 0x7f800000;
              bVar10 = (bool)(bVar71 >> 3 & 1);
              auVar139._12_4_ = (uint)bVar10 * auVar104._12_4_ | (uint)!bVar10 * 0x7f800000;
              bVar10 = (bool)(bVar71 >> 4 & 1);
              auVar139._16_4_ = (uint)bVar10 * auVar104._16_4_ | (uint)!bVar10 * 0x7f800000;
              bVar10 = (bool)(bVar71 >> 5 & 1);
              auVar139._20_4_ = (uint)bVar10 * auVar104._20_4_ | (uint)!bVar10 * 0x7f800000;
              auVar139._24_4_ =
                   (uint)(bVar71 >> 6) * auVar104._24_4_ | (uint)!(bool)(bVar71 >> 6) * 0x7f800000;
              auVar139._28_4_ = 0x7f800000;
              auVar104 = vshufps_avx(auVar139,auVar139,0xb1);
              auVar104 = vminps_avx(auVar139,auVar104);
              auVar101 = vshufpd_avx(auVar104,auVar104,5);
              auVar104 = vminps_avx(auVar104,auVar101);
              auVar101 = vpermpd_avx2(auVar104,0x4e);
              auVar104 = vminps_avx(auVar104,auVar101);
              uVar19 = vcmpps_avx512vl(auVar139,auVar104,0);
              bVar63 = (byte)uVar19 & bVar71;
              bVar64 = bVar71;
              if (bVar63 != 0) {
                bVar64 = bVar63;
              }
              iVar23 = 0;
              for (uVar75 = (uint)bVar64; (uVar75 & 1) == 0; uVar75 = uVar75 >> 1 | 0x80000000) {
                iVar23 = iVar23 + 1;
              }
              uVar75 = *(uint *)(local_200 + (uint)(iVar23 << 2));
              fVar276 = auVar79._0_4_;
              auVar82 = ZEXT416(*(uint *)(local_1a0 + (uint)(iVar23 << 2)));
              if ((float)local_800._0_4_ < 0.0) {
                local_860._0_16_ = ZEXT416(*(uint *)(local_1a0 + (uint)(iVar23 << 2)));
                fVar276 = sqrtf((float)local_800._0_4_);
                auVar82 = local_860._0_16_;
              }
              auVar82 = vinsertps_avx(ZEXT416(uVar75),auVar82,0x10);
              auVar285 = ZEXT1664(auVar82);
              lVar72 = 5;
              do {
                uVar180 = auVar285._0_4_;
                auVar157._4_4_ = uVar180;
                auVar157._0_4_ = uVar180;
                auVar157._8_4_ = uVar180;
                auVar157._12_4_ = uVar180;
                auVar82 = vfmadd132ps_fma(auVar157,ZEXT816(0) << 0x40,local_7f0);
                local_740 = auVar285._0_32_;
                auVar83 = vmovshdup_avx(auVar285._0_16_);
                fVar242 = auVar83._0_4_;
                fVar241 = 1.0 - fVar242;
                fVar283 = fVar241 * fVar241 * fVar241;
                fVar281 = fVar242 * fVar242;
                fVar243 = fVar281 * fVar242;
                auVar18 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar283),
                                          ZEXT416((uint)fVar243));
                fVar282 = fVar242 * fVar241;
                local_860._0_16_ = ZEXT416((uint)fVar241);
                auVar89 = vfmadd231ss_fma(ZEXT416((uint)(fVar282 * fVar242 * 6.0)),
                                          ZEXT416((uint)(fVar282 * fVar241)),
                                          SUB6416(ZEXT464(0x41400000),0));
                auVar84 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar243),
                                          ZEXT416((uint)fVar283));
                auVar81 = vfmadd231ss_fma(ZEXT416((uint)(fVar282 * fVar241 * 6.0)),
                                          SUB6416(ZEXT464(0x41400000),0),
                                          ZEXT416((uint)(fVar282 * fVar242)));
                fVar283 = fVar283 * 0.16666667;
                fVar241 = (auVar18._0_4_ + auVar89._0_4_) * 0.16666667;
                fVar242 = (auVar84._0_4_ + auVar81._0_4_) * 0.16666667;
                fVar243 = fVar243 * 0.16666667;
                auVar205._0_4_ = fVar243 * (float)local_7c0._0_4_;
                auVar205._4_4_ = fVar243 * (float)local_7c0._4_4_;
                auVar205._8_4_ = fVar243 * fStack_7b8;
                auVar205._12_4_ = fVar243 * fStack_7b4;
                auVar249._4_4_ = fVar242;
                auVar249._0_4_ = fVar242;
                auVar249._8_4_ = fVar242;
                auVar249._12_4_ = fVar242;
                auVar18 = vfmadd132ps_fma(auVar249,auVar205,local_780._0_16_);
                auVar206._4_4_ = fVar241;
                auVar206._0_4_ = fVar241;
                auVar206._8_4_ = fVar241;
                auVar206._12_4_ = fVar241;
                auVar18 = vfmadd132ps_fma(auVar206,auVar18,local_7a0._0_16_);
                auVar184._4_4_ = fVar283;
                auVar184._0_4_ = fVar283;
                auVar184._8_4_ = fVar283;
                auVar184._12_4_ = fVar283;
                auVar18 = vfmadd132ps_fma(auVar184,auVar18,local_760._0_16_);
                local_5e0._0_16_ = auVar18;
                auVar18 = vsubps_avx(auVar82,auVar18);
                auVar82 = vdpps_avx(auVar18,auVar18,0x7f);
                local_820._0_16_ = auVar82;
                if (auVar82._0_4_ < 0.0) {
                  local_880._0_4_ = fVar281;
                  local_8a0._0_4_ = fVar282;
                  auVar275._0_4_ = sqrtf(auVar82._0_4_);
                  auVar275._4_60_ = extraout_var;
                  auVar82 = auVar275._0_16_;
                  fVar282 = (float)local_8a0._0_4_;
                }
                else {
                  auVar82 = vsqrtss_avx(auVar82,auVar82);
                  local_880._0_4_ = fVar281;
                }
                local_600._4_4_ = local_860._0_4_;
                local_600._0_4_ = local_600._4_4_;
                fStack_5f8 = (float)local_600._4_4_;
                fStack_5f4 = (float)local_600._4_4_;
                auVar89 = vfnmsub213ss_fma(auVar83,auVar83,ZEXT416((uint)(fVar282 * 4.0)));
                auVar84 = vfmadd231ss_fma(ZEXT416((uint)(fVar282 * 4.0)),local_860._0_16_,
                                          local_860._0_16_);
                fVar281 = (float)local_600._4_4_ * -(float)local_600._4_4_ * 0.5;
                fVar282 = auVar89._0_4_ * 0.5;
                fVar283 = auVar84._0_4_ * 0.5;
                local_880._0_4_ = (float)local_880._0_4_ * 0.5;
                auVar227._0_4_ = (float)local_880._0_4_ * (float)local_7c0._0_4_;
                auVar227._4_4_ = (float)local_880._0_4_ * (float)local_7c0._4_4_;
                auVar227._8_4_ = (float)local_880._0_4_ * fStack_7b8;
                auVar227._12_4_ = (float)local_880._0_4_ * fStack_7b4;
                auVar185._4_4_ = fVar283;
                auVar185._0_4_ = fVar283;
                auVar185._8_4_ = fVar283;
                auVar185._12_4_ = fVar283;
                auVar84 = vfmadd132ps_fma(auVar185,auVar227,local_780._0_16_);
                auVar207._4_4_ = fVar282;
                auVar207._0_4_ = fVar282;
                auVar207._8_4_ = fVar282;
                auVar207._12_4_ = fVar282;
                auVar84 = vfmadd132ps_fma(auVar207,auVar84,local_7a0._0_16_);
                auVar290._4_4_ = fVar281;
                auVar290._0_4_ = fVar281;
                auVar290._8_4_ = fVar281;
                auVar290._12_4_ = fVar281;
                _local_880 = vfmadd132ps_fma(auVar290,auVar84,local_760._0_16_);
                local_620._0_16_ = vdpps_avx(_local_880,_local_880,0x7f);
                auVar50._12_4_ = 0;
                auVar50._0_12_ = ZEXT812(0);
                fVar281 = local_620._0_4_;
                auVar84 = vrsqrt14ss_avx512f(auVar50 << 0x20,ZEXT416((uint)fVar281));
                fVar282 = auVar84._0_4_;
                local_640._0_16_ = vrcp14ss_avx512f(auVar50 << 0x20,ZEXT416((uint)fVar281));
                auVar84 = vfnmadd213ss_fma(local_640._0_16_,local_620._0_16_,ZEXT416(0x40000000));
                local_660._0_4_ = auVar84._0_4_;
                local_8a0._0_4_ = auVar82._0_4_;
                if (fVar281 < -fVar281) {
                  fVar283 = sqrtf(fVar281);
                  auVar82 = ZEXT416((uint)local_8a0._0_4_);
                  auVar84 = _local_880;
                }
                else {
                  auVar84 = vsqrtss_avx(local_620._0_16_,local_620._0_16_);
                  fVar283 = auVar84._0_4_;
                  auVar84 = _local_880;
                }
                fVar281 = fVar282 * 1.5 + fVar281 * -0.5 * fVar282 * fVar282 * fVar282;
                auVar158._0_4_ = auVar84._0_4_ * fVar281;
                auVar158._4_4_ = auVar84._4_4_ * fVar281;
                auVar158._8_4_ = auVar84._8_4_ * fVar281;
                auVar158._12_4_ = auVar84._12_4_ * fVar281;
                auVar89 = vdpps_avx(auVar18,auVar158,0x7f);
                fVar242 = auVar82._0_4_;
                fVar282 = auVar89._0_4_;
                auVar159._0_4_ = fVar282 * fVar282;
                auVar159._4_4_ = auVar89._4_4_ * auVar89._4_4_;
                auVar159._8_4_ = auVar89._8_4_ * auVar89._8_4_;
                auVar159._12_4_ = auVar89._12_4_ * auVar89._12_4_;
                auVar81 = vsubps_avx(local_820._0_16_,auVar159);
                fVar241 = auVar81._0_4_;
                auVar186._4_12_ = ZEXT812(0) << 0x20;
                auVar186._0_4_ = fVar241;
                auVar85 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar186);
                auVar86 = vmulss_avx512f(auVar85,ZEXT416(0x3fc00000));
                auVar87 = vmulss_avx512f(auVar81,ZEXT416(0xbf000000));
                if (fVar241 < 0.0) {
                  local_6a0._0_4_ = fVar283;
                  local_6c0._0_4_ = auVar86._0_4_;
                  local_6d0._4_4_ = fVar281;
                  local_6d0._0_4_ = fVar281;
                  fStack_6c8 = fVar281;
                  fStack_6c4 = fVar281;
                  local_6b0 = auVar85;
                  fVar241 = sqrtf(fVar241);
                  auVar87 = ZEXT416(auVar87._0_4_);
                  auVar86 = ZEXT416((uint)local_6c0._0_4_);
                  auVar82 = ZEXT416((uint)local_8a0._0_4_);
                  auVar85 = local_6b0;
                  auVar84 = _local_880;
                  fVar281 = (float)local_6d0._0_4_;
                  fVar243 = (float)local_6d0._4_4_;
                  fVar244 = fStack_6c8;
                  fVar245 = fStack_6c4;
                  fVar283 = (float)local_6a0._0_4_;
                }
                else {
                  auVar81 = vsqrtss_avx(auVar81,auVar81);
                  fVar241 = auVar81._0_4_;
                  fVar243 = fVar281;
                  fVar244 = fVar281;
                  fVar245 = fVar281;
                }
                auVar293 = ZEXT1664(auVar84);
                auVar288 = ZEXT1664(local_820._0_16_);
                auVar286 = ZEXT1664(auVar18);
                auVar297 = ZEXT3264(local_8c0);
                auVar298 = ZEXT3264(local_8e0);
                auVar299 = ZEXT3264(local_900);
                auVar300 = ZEXT3264(local_920);
                auVar81 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_860._0_16_,auVar83);
                auVar90 = vfmadd213ss_fma(auVar83,SUB6416(ZEXT464(0xc0000000),0),local_860._0_16_);
                auVar92 = local_740._0_16_;
                auVar83 = vshufps_avx(auVar92,auVar92,0x55);
                auVar208._0_4_ = auVar83._0_4_ * (float)local_7c0._0_4_;
                auVar208._4_4_ = auVar83._4_4_ * (float)local_7c0._4_4_;
                auVar208._8_4_ = auVar83._8_4_ * fStack_7b8;
                auVar208._12_4_ = auVar83._12_4_ * fStack_7b4;
                auVar228._0_4_ = auVar90._0_4_;
                auVar228._4_4_ = auVar228._0_4_;
                auVar228._8_4_ = auVar228._0_4_;
                auVar228._12_4_ = auVar228._0_4_;
                auVar83 = vfmadd132ps_fma(auVar228,auVar208,local_780._0_16_);
                auVar187._0_4_ = auVar81._0_4_;
                auVar187._4_4_ = auVar187._0_4_;
                auVar187._8_4_ = auVar187._0_4_;
                auVar187._12_4_ = auVar187._0_4_;
                auVar83 = vfmadd132ps_fma(auVar187,auVar83,local_7a0._0_16_);
                auVar83 = vfmadd132ps_fma(_local_600,auVar83,local_760._0_16_);
                auVar188._0_4_ = auVar83._0_4_ * (float)local_620._0_4_;
                auVar188._4_4_ = auVar83._4_4_ * (float)local_620._0_4_;
                auVar188._8_4_ = auVar83._8_4_ * (float)local_620._0_4_;
                auVar188._12_4_ = auVar83._12_4_ * (float)local_620._0_4_;
                auVar83 = vdpps_avx(auVar84,auVar83,0x7f);
                fVar254 = auVar83._0_4_;
                auVar209._0_4_ = auVar84._0_4_ * fVar254;
                auVar209._4_4_ = auVar84._4_4_ * fVar254;
                auVar209._8_4_ = auVar84._8_4_ * fVar254;
                auVar209._12_4_ = auVar84._12_4_ * fVar254;
                auVar83 = vsubps_avx(auVar188,auVar209);
                fVar254 = (float)local_660._0_4_ * (float)local_640._0_4_;
                auVar90 = vmaxss_avx(ZEXT416((uint)local_840._0_4_),
                                     ZEXT416((uint)(local_740._0_4_ * fVar276 * 1.9073486e-06)));
                auVar25._8_4_ = 0x80000000;
                auVar25._0_8_ = 0x8000000080000000;
                auVar25._12_4_ = 0x80000000;
                auVar88 = vxorps_avx512vl(auVar84,auVar25);
                auVar210._0_4_ = fVar281 * auVar83._0_4_ * fVar254;
                auVar210._4_4_ = fVar243 * auVar83._4_4_ * fVar254;
                auVar210._8_4_ = fVar244 * auVar83._8_4_ * fVar254;
                auVar210._12_4_ = fVar245 * auVar83._12_4_ * fVar254;
                auVar83 = vdpps_avx(auVar88,auVar158,0x7f);
                auVar81 = vfmadd213ss_fma(auVar82,ZEXT416((uint)local_840._0_4_),auVar90);
                auVar82 = vdpps_avx(auVar18,auVar210,0x7f);
                auVar91 = vfmadd213ss_fma(ZEXT416((uint)(fVar242 + 1.0)),
                                          ZEXT416((uint)((float)local_840._0_4_ / fVar283)),auVar81)
                ;
                fVar281 = auVar83._0_4_ + auVar82._0_4_;
                auVar82 = vdpps_avx(local_7f0,auVar158,0x7f);
                auVar83 = vdpps_avx(auVar18,auVar88,0x7f);
                auVar81 = vmulss_avx512f(auVar87,auVar85);
                auVar87 = vaddss_avx512f(auVar86,ZEXT416((uint)(auVar81._0_4_ *
                                                               auVar85._0_4_ * auVar85._0_4_)));
                auVar81 = vdpps_avx(auVar18,local_7f0,0x7f);
                auVar86 = vfnmadd231ss_fma(auVar83,auVar89,ZEXT416((uint)fVar281));
                auVar81 = vfnmadd231ss_fma(auVar81,auVar89,auVar82);
                auVar83 = vpermilps_avx(local_5e0._0_16_,0xff);
                fVar241 = fVar241 - auVar83._0_4_;
                auVar85 = vshufps_avx(auVar84,auVar84,0xff);
                auVar83 = vfmsub213ss_fma(auVar86,auVar87,auVar85);
                auVar278._8_4_ = 0x80000000;
                auVar278._0_8_ = 0x8000000080000000;
                auVar278._12_4_ = 0x80000000;
                auVar280 = ZEXT1664(auVar278);
                auVar272._0_8_ = auVar83._0_8_ ^ 0x8000000080000000;
                auVar272._8_4_ = auVar83._8_4_ ^ 0x80000000;
                auVar272._12_4_ = auVar83._12_4_ ^ 0x80000000;
                auVar275 = ZEXT1664(auVar272);
                auVar81 = ZEXT416((uint)(auVar81._0_4_ * auVar87._0_4_));
                auVar86 = vfmsub231ss_fma(ZEXT416((uint)(auVar82._0_4_ * auVar83._0_4_)),
                                          ZEXT416((uint)fVar281),auVar81);
                auVar83 = vinsertps_avx(auVar272,auVar81,0x1c);
                auVar261._0_8_ = auVar82._0_8_ ^ 0x8000000080000000;
                auVar261._8_4_ = auVar82._8_4_ ^ 0x80000000;
                auVar261._12_4_ = auVar82._12_4_ ^ 0x80000000;
                auVar81 = vinsertps_avx(ZEXT416((uint)fVar281),auVar261,0x10);
                auVar229._0_4_ = auVar86._0_4_;
                auVar229._4_4_ = auVar229._0_4_;
                auVar229._8_4_ = auVar229._0_4_;
                auVar229._12_4_ = auVar229._0_4_;
                auVar82 = vdivps_avx(auVar83,auVar229);
                auVar83 = vdivps_avx(auVar81,auVar229);
                auVar230._0_4_ = fVar282 * auVar82._0_4_ + fVar241 * auVar83._0_4_;
                auVar230._4_4_ = fVar282 * auVar82._4_4_ + fVar241 * auVar83._4_4_;
                auVar230._8_4_ = fVar282 * auVar82._8_4_ + fVar241 * auVar83._8_4_;
                auVar230._12_4_ = fVar282 * auVar82._12_4_ + fVar241 * auVar83._12_4_;
                auVar82 = vsubps_avx(auVar92,auVar230);
                auVar285 = ZEXT1664(auVar82);
                auVar26._8_4_ = 0x7fffffff;
                auVar26._0_8_ = 0x7fffffff7fffffff;
                auVar26._12_4_ = 0x7fffffff;
                auVar83 = vandps_avx512vl(auVar89,auVar26);
                if (auVar83._0_4_ < auVar91._0_4_) {
                  auVar83 = vfmadd231ss_fma(ZEXT416((uint)(auVar91._0_4_ + auVar90._0_4_)),local_6e0
                                            ,ZEXT416(0x36000000));
                  auVar27._8_4_ = 0x7fffffff;
                  auVar27._0_8_ = 0x7fffffff7fffffff;
                  auVar27._12_4_ = 0x7fffffff;
                  auVar89 = vandps_avx512vl(ZEXT416((uint)fVar241),auVar27);
                  if (auVar89._0_4_ < auVar83._0_4_) {
                    fVar276 = auVar82._0_4_ + (float)local_6f0._0_4_;
                    if ((fVar276 < fVar173) ||
                       (fVar281 = *(float *)(ray + k * 4 + 0x100), fVar281 < fVar276)) break;
                    auVar83 = vmovshdup_avx(auVar82);
                    fVar282 = auVar83._0_4_;
                    if ((fVar282 < 0.0) || (1.0 < fVar282)) break;
                    auVar83 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,ZEXT416((uint)local_820._0_4_));
                    fVar283 = auVar83._0_4_;
                    pGVar4 = (context->scene->geometries).items[uVar65].ptr;
                    if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) break;
                    fVar283 = fVar283 * 1.5 + local_820._0_4_ * -0.5 * fVar283 * fVar283 * fVar283;
                    auVar231._0_4_ = auVar18._0_4_ * fVar283;
                    auVar231._4_4_ = auVar18._4_4_ * fVar283;
                    auVar231._8_4_ = auVar18._8_4_ * fVar283;
                    auVar231._12_4_ = auVar18._12_4_ * fVar283;
                    auVar85 = vfmadd213ps_fma(auVar85,auVar231,auVar84);
                    auVar83 = vshufps_avx(auVar231,auVar231,0xc9);
                    auVar89 = vshufps_avx(auVar84,auVar84,0xc9);
                    auVar232._0_4_ = auVar231._0_4_ * auVar89._0_4_;
                    auVar232._4_4_ = auVar231._4_4_ * auVar89._4_4_;
                    auVar232._8_4_ = auVar231._8_4_ * auVar89._8_4_;
                    auVar232._12_4_ = auVar231._12_4_ * auVar89._12_4_;
                    auVar81 = vfmsub231ps_fma(auVar232,auVar84,auVar83);
                    auVar83 = vshufps_avx(auVar81,auVar81,0xc9);
                    auVar89 = vshufps_avx(auVar85,auVar85,0xc9);
                    auVar81 = vshufps_avx(auVar81,auVar81,0xd2);
                    auVar160._0_4_ = auVar85._0_4_ * auVar81._0_4_;
                    auVar160._4_4_ = auVar85._4_4_ * auVar81._4_4_;
                    auVar160._8_4_ = auVar85._8_4_ * auVar81._8_4_;
                    auVar160._12_4_ = auVar85._12_4_ * auVar81._12_4_;
                    auVar83 = vfmsub231ps_fma(auVar160,auVar83,auVar89);
                    uVar180 = auVar83._0_4_;
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      *(float *)(ray + k * 4 + 0x100) = fVar276;
                      uVar3 = vextractps_avx(auVar83,1);
                      *(undefined4 *)(ray + k * 4 + 0x180) = uVar3;
                      uVar3 = vextractps_avx(auVar83,2);
                      *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar3;
                      *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar180;
                      *(float *)(ray + k * 4 + 0x1e0) = fVar282;
                      *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                      *(int *)(ray + k * 4 + 0x220) = (int)local_828;
                      *(uint *)(ray + k * 4 + 0x240) = uVar65;
                      *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                      *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                      break;
                    }
                    pRVar8 = context->user;
                    auVar239._8_4_ = 1;
                    auVar239._0_8_ = 0x100000001;
                    auVar239._12_4_ = 1;
                    auVar239._16_4_ = 1;
                    auVar239._20_4_ = 1;
                    auVar239._24_4_ = 1;
                    auVar239._28_4_ = 1;
                    local_420 = vpermps_avx2(auVar239,ZEXT1632(auVar82));
                    auVar104 = vpermps_avx2(auVar239,ZEXT1632(auVar83));
                    auVar252._8_4_ = 2;
                    auVar252._0_8_ = 0x200000002;
                    auVar252._12_4_ = 2;
                    auVar252._16_4_ = 2;
                    auVar252._20_4_ = 2;
                    auVar252._24_4_ = 2;
                    auVar252._28_4_ = 2;
                    local_460 = vpermps_avx2(auVar252,ZEXT1632(auVar83));
                    local_480[0] = (RTCHitN)auVar104[0];
                    local_480[1] = (RTCHitN)auVar104[1];
                    local_480[2] = (RTCHitN)auVar104[2];
                    local_480[3] = (RTCHitN)auVar104[3];
                    local_480[4] = (RTCHitN)auVar104[4];
                    local_480[5] = (RTCHitN)auVar104[5];
                    local_480[6] = (RTCHitN)auVar104[6];
                    local_480[7] = (RTCHitN)auVar104[7];
                    local_480[8] = (RTCHitN)auVar104[8];
                    local_480[9] = (RTCHitN)auVar104[9];
                    local_480[10] = (RTCHitN)auVar104[10];
                    local_480[0xb] = (RTCHitN)auVar104[0xb];
                    local_480[0xc] = (RTCHitN)auVar104[0xc];
                    local_480[0xd] = (RTCHitN)auVar104[0xd];
                    local_480[0xe] = (RTCHitN)auVar104[0xe];
                    local_480[0xf] = (RTCHitN)auVar104[0xf];
                    local_480[0x10] = (RTCHitN)auVar104[0x10];
                    local_480[0x11] = (RTCHitN)auVar104[0x11];
                    local_480[0x12] = (RTCHitN)auVar104[0x12];
                    local_480[0x13] = (RTCHitN)auVar104[0x13];
                    local_480[0x14] = (RTCHitN)auVar104[0x14];
                    local_480[0x15] = (RTCHitN)auVar104[0x15];
                    local_480[0x16] = (RTCHitN)auVar104[0x16];
                    local_480[0x17] = (RTCHitN)auVar104[0x17];
                    local_480[0x18] = (RTCHitN)auVar104[0x18];
                    local_480[0x19] = (RTCHitN)auVar104[0x19];
                    local_480[0x1a] = (RTCHitN)auVar104[0x1a];
                    local_480[0x1b] = (RTCHitN)auVar104[0x1b];
                    local_480[0x1c] = (RTCHitN)auVar104[0x1c];
                    local_480[0x1d] = (RTCHitN)auVar104[0x1d];
                    local_480[0x1e] = (RTCHitN)auVar104[0x1e];
                    local_480[0x1f] = (RTCHitN)auVar104[0x1f];
                    local_440 = uVar180;
                    uStack_43c = uVar180;
                    uStack_438 = uVar180;
                    uStack_434 = uVar180;
                    uStack_430 = uVar180;
                    uStack_42c = uVar180;
                    uStack_428 = uVar180;
                    uStack_424 = uVar180;
                    local_400 = ZEXT432(0) << 0x20;
                    local_3e0 = local_4c0._0_8_;
                    uStack_3d8 = local_4c0._8_8_;
                    uStack_3d0 = local_4c0._16_8_;
                    uStack_3c8 = local_4c0._24_8_;
                    local_3c0 = local_4a0;
                    auVar104 = vpcmpeqd_avx2(local_4a0,local_4a0);
                    local_830[1] = auVar104;
                    *local_830 = auVar104;
                    local_3a0 = pRVar8->instID[0];
                    uStack_39c = local_3a0;
                    uStack_398 = local_3a0;
                    uStack_394 = local_3a0;
                    uStack_390 = local_3a0;
                    uStack_38c = local_3a0;
                    uStack_388 = local_3a0;
                    uStack_384 = local_3a0;
                    local_380 = pRVar8->instPrimID[0];
                    uStack_37c = local_380;
                    uStack_378 = local_380;
                    uStack_374 = local_380;
                    uStack_370 = local_380;
                    uStack_36c = local_380;
                    uStack_368 = local_380;
                    uStack_364 = local_380;
                    *(float *)(ray + k * 4 + 0x100) = fVar276;
                    local_720 = local_500;
                    local_950.valid = (int *)local_720;
                    local_950.geometryUserPtr = pGVar4->userPtr;
                    local_950.context = context->user;
                    local_950.hit = local_480;
                    local_950.N = 8;
                    local_950.ray = (RTCRayN *)ray;
                    if (pGVar4->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar275 = ZEXT1664(auVar272);
                      auVar280 = ZEXT1664(auVar278);
                      auVar285 = ZEXT1664(auVar82);
                      auVar286 = ZEXT1664(auVar18);
                      auVar288 = ZEXT1664(local_820._0_16_);
                      auVar293 = ZEXT1664(auVar84);
                      (*pGVar4->intersectionFilterN)(&local_950);
                      auVar300 = ZEXT3264(local_920);
                      auVar299 = ZEXT3264(local_900);
                      auVar298 = ZEXT3264(local_8e0);
                      auVar297 = ZEXT3264(local_8c0);
                    }
                    if (local_720 != (undefined1  [32])0x0) {
                      p_Var9 = context->args->filter;
                      if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar275 = ZEXT1664(auVar275._0_16_);
                        auVar280 = ZEXT1664(auVar280._0_16_);
                        auVar285 = ZEXT1664(auVar285._0_16_);
                        auVar286 = ZEXT1664(auVar286._0_16_);
                        auVar288 = ZEXT1664(auVar288._0_16_);
                        auVar293 = ZEXT1664(auVar293._0_16_);
                        (*p_Var9)(&local_950);
                        auVar300 = ZEXT3264(local_920);
                        auVar299 = ZEXT3264(local_900);
                        auVar298 = ZEXT3264(local_8e0);
                        auVar297 = ZEXT3264(local_8c0);
                      }
                      if (local_720 != (undefined1  [32])0x0) {
                        uVar73 = vptestmd_avx512vl(local_720,local_720);
                        iVar52 = *(int *)(local_950.hit + 4);
                        iVar53 = *(int *)(local_950.hit + 8);
                        iVar54 = *(int *)(local_950.hit + 0xc);
                        iVar55 = *(int *)(local_950.hit + 0x10);
                        iVar56 = *(int *)(local_950.hit + 0x14);
                        iVar57 = *(int *)(local_950.hit + 0x18);
                        iVar58 = *(int *)(local_950.hit + 0x1c);
                        bVar64 = (byte)uVar73;
                        bVar10 = (bool)((byte)(uVar73 >> 1) & 1);
                        bVar11 = (bool)((byte)(uVar73 >> 2) & 1);
                        bVar12 = (bool)((byte)(uVar73 >> 3) & 1);
                        bVar13 = (bool)((byte)(uVar73 >> 4) & 1);
                        bVar14 = (bool)((byte)(uVar73 >> 5) & 1);
                        bVar15 = (bool)((byte)(uVar73 >> 6) & 1);
                        bVar16 = SUB81(uVar73 >> 7,0);
                        *(uint *)(local_950.ray + 0x180) =
                             (uint)(bVar64 & 1) * *(int *)local_950.hit |
                             (uint)!(bool)(bVar64 & 1) * *(int *)(local_950.ray + 0x180);
                        *(uint *)(local_950.ray + 0x184) =
                             (uint)bVar10 * iVar52 | (uint)!bVar10 * *(int *)(local_950.ray + 0x184)
                        ;
                        *(uint *)(local_950.ray + 0x188) =
                             (uint)bVar11 * iVar53 | (uint)!bVar11 * *(int *)(local_950.ray + 0x188)
                        ;
                        *(uint *)(local_950.ray + 0x18c) =
                             (uint)bVar12 * iVar54 | (uint)!bVar12 * *(int *)(local_950.ray + 0x18c)
                        ;
                        *(uint *)(local_950.ray + 400) =
                             (uint)bVar13 * iVar55 | (uint)!bVar13 * *(int *)(local_950.ray + 400);
                        *(uint *)(local_950.ray + 0x194) =
                             (uint)bVar14 * iVar56 | (uint)!bVar14 * *(int *)(local_950.ray + 0x194)
                        ;
                        *(uint *)(local_950.ray + 0x198) =
                             (uint)bVar15 * iVar57 | (uint)!bVar15 * *(int *)(local_950.ray + 0x198)
                        ;
                        *(uint *)(local_950.ray + 0x19c) =
                             (uint)bVar16 * iVar58 | (uint)!bVar16 * *(int *)(local_950.ray + 0x19c)
                        ;
                        iVar52 = *(int *)(local_950.hit + 0x24);
                        iVar53 = *(int *)(local_950.hit + 0x28);
                        iVar54 = *(int *)(local_950.hit + 0x2c);
                        iVar55 = *(int *)(local_950.hit + 0x30);
                        iVar56 = *(int *)(local_950.hit + 0x34);
                        iVar57 = *(int *)(local_950.hit + 0x38);
                        iVar58 = *(int *)(local_950.hit + 0x3c);
                        bVar10 = (bool)((byte)(uVar73 >> 1) & 1);
                        bVar11 = (bool)((byte)(uVar73 >> 2) & 1);
                        bVar12 = (bool)((byte)(uVar73 >> 3) & 1);
                        bVar13 = (bool)((byte)(uVar73 >> 4) & 1);
                        bVar14 = (bool)((byte)(uVar73 >> 5) & 1);
                        bVar15 = (bool)((byte)(uVar73 >> 6) & 1);
                        bVar16 = SUB81(uVar73 >> 7,0);
                        *(uint *)(local_950.ray + 0x1a0) =
                             (uint)(bVar64 & 1) * *(int *)(local_950.hit + 0x20) |
                             (uint)!(bool)(bVar64 & 1) * *(int *)(local_950.ray + 0x1a0);
                        *(uint *)(local_950.ray + 0x1a4) =
                             (uint)bVar10 * iVar52 | (uint)!bVar10 * *(int *)(local_950.ray + 0x1a4)
                        ;
                        *(uint *)(local_950.ray + 0x1a8) =
                             (uint)bVar11 * iVar53 | (uint)!bVar11 * *(int *)(local_950.ray + 0x1a8)
                        ;
                        *(uint *)(local_950.ray + 0x1ac) =
                             (uint)bVar12 * iVar54 | (uint)!bVar12 * *(int *)(local_950.ray + 0x1ac)
                        ;
                        *(uint *)(local_950.ray + 0x1b0) =
                             (uint)bVar13 * iVar55 | (uint)!bVar13 * *(int *)(local_950.ray + 0x1b0)
                        ;
                        *(uint *)(local_950.ray + 0x1b4) =
                             (uint)bVar14 * iVar56 | (uint)!bVar14 * *(int *)(local_950.ray + 0x1b4)
                        ;
                        *(uint *)(local_950.ray + 0x1b8) =
                             (uint)bVar15 * iVar57 | (uint)!bVar15 * *(int *)(local_950.ray + 0x1b8)
                        ;
                        *(uint *)(local_950.ray + 0x1bc) =
                             (uint)bVar16 * iVar58 | (uint)!bVar16 * *(int *)(local_950.ray + 0x1bc)
                        ;
                        iVar52 = *(int *)(local_950.hit + 0x44);
                        iVar53 = *(int *)(local_950.hit + 0x48);
                        iVar54 = *(int *)(local_950.hit + 0x4c);
                        iVar55 = *(int *)(local_950.hit + 0x50);
                        iVar56 = *(int *)(local_950.hit + 0x54);
                        iVar57 = *(int *)(local_950.hit + 0x58);
                        iVar58 = *(int *)(local_950.hit + 0x5c);
                        bVar10 = (bool)((byte)(uVar73 >> 1) & 1);
                        bVar11 = (bool)((byte)(uVar73 >> 2) & 1);
                        bVar12 = (bool)((byte)(uVar73 >> 3) & 1);
                        bVar13 = (bool)((byte)(uVar73 >> 4) & 1);
                        bVar14 = (bool)((byte)(uVar73 >> 5) & 1);
                        bVar15 = (bool)((byte)(uVar73 >> 6) & 1);
                        bVar16 = SUB81(uVar73 >> 7,0);
                        *(uint *)(local_950.ray + 0x1c0) =
                             (uint)(bVar64 & 1) * *(int *)(local_950.hit + 0x40) |
                             (uint)!(bool)(bVar64 & 1) * *(int *)(local_950.ray + 0x1c0);
                        *(uint *)(local_950.ray + 0x1c4) =
                             (uint)bVar10 * iVar52 | (uint)!bVar10 * *(int *)(local_950.ray + 0x1c4)
                        ;
                        *(uint *)(local_950.ray + 0x1c8) =
                             (uint)bVar11 * iVar53 | (uint)!bVar11 * *(int *)(local_950.ray + 0x1c8)
                        ;
                        *(uint *)(local_950.ray + 0x1cc) =
                             (uint)bVar12 * iVar54 | (uint)!bVar12 * *(int *)(local_950.ray + 0x1cc)
                        ;
                        *(uint *)(local_950.ray + 0x1d0) =
                             (uint)bVar13 * iVar55 | (uint)!bVar13 * *(int *)(local_950.ray + 0x1d0)
                        ;
                        *(uint *)(local_950.ray + 0x1d4) =
                             (uint)bVar14 * iVar56 | (uint)!bVar14 * *(int *)(local_950.ray + 0x1d4)
                        ;
                        *(uint *)(local_950.ray + 0x1d8) =
                             (uint)bVar15 * iVar57 | (uint)!bVar15 * *(int *)(local_950.ray + 0x1d8)
                        ;
                        *(uint *)(local_950.ray + 0x1dc) =
                             (uint)bVar16 * iVar58 | (uint)!bVar16 * *(int *)(local_950.ray + 0x1dc)
                        ;
                        iVar52 = *(int *)(local_950.hit + 100);
                        iVar53 = *(int *)(local_950.hit + 0x68);
                        iVar54 = *(int *)(local_950.hit + 0x6c);
                        iVar55 = *(int *)(local_950.hit + 0x70);
                        iVar56 = *(int *)(local_950.hit + 0x74);
                        iVar57 = *(int *)(local_950.hit + 0x78);
                        iVar58 = *(int *)(local_950.hit + 0x7c);
                        bVar10 = (bool)((byte)(uVar73 >> 1) & 1);
                        bVar11 = (bool)((byte)(uVar73 >> 2) & 1);
                        bVar12 = (bool)((byte)(uVar73 >> 3) & 1);
                        bVar13 = (bool)((byte)(uVar73 >> 4) & 1);
                        bVar14 = (bool)((byte)(uVar73 >> 5) & 1);
                        bVar15 = (bool)((byte)(uVar73 >> 6) & 1);
                        bVar16 = SUB81(uVar73 >> 7,0);
                        *(uint *)(local_950.ray + 0x1e0) =
                             (uint)(bVar64 & 1) * *(int *)(local_950.hit + 0x60) |
                             (uint)!(bool)(bVar64 & 1) * *(int *)(local_950.ray + 0x1e0);
                        *(uint *)(local_950.ray + 0x1e4) =
                             (uint)bVar10 * iVar52 | (uint)!bVar10 * *(int *)(local_950.ray + 0x1e4)
                        ;
                        *(uint *)(local_950.ray + 0x1e8) =
                             (uint)bVar11 * iVar53 | (uint)!bVar11 * *(int *)(local_950.ray + 0x1e8)
                        ;
                        *(uint *)(local_950.ray + 0x1ec) =
                             (uint)bVar12 * iVar54 | (uint)!bVar12 * *(int *)(local_950.ray + 0x1ec)
                        ;
                        *(uint *)(local_950.ray + 0x1f0) =
                             (uint)bVar13 * iVar55 | (uint)!bVar13 * *(int *)(local_950.ray + 0x1f0)
                        ;
                        *(uint *)(local_950.ray + 500) =
                             (uint)bVar14 * iVar56 | (uint)!bVar14 * *(int *)(local_950.ray + 500);
                        *(uint *)(local_950.ray + 0x1f8) =
                             (uint)bVar15 * iVar57 | (uint)!bVar15 * *(int *)(local_950.ray + 0x1f8)
                        ;
                        *(uint *)(local_950.ray + 0x1fc) =
                             (uint)bVar16 * iVar58 | (uint)!bVar16 * *(int *)(local_950.ray + 0x1fc)
                        ;
                        iVar52 = *(int *)(local_950.hit + 0x84);
                        iVar53 = *(int *)(local_950.hit + 0x88);
                        iVar54 = *(int *)(local_950.hit + 0x8c);
                        iVar55 = *(int *)(local_950.hit + 0x90);
                        iVar56 = *(int *)(local_950.hit + 0x94);
                        iVar57 = *(int *)(local_950.hit + 0x98);
                        iVar58 = *(int *)(local_950.hit + 0x9c);
                        bVar10 = (bool)((byte)(uVar73 >> 1) & 1);
                        bVar11 = (bool)((byte)(uVar73 >> 2) & 1);
                        bVar12 = (bool)((byte)(uVar73 >> 3) & 1);
                        bVar13 = (bool)((byte)(uVar73 >> 4) & 1);
                        bVar14 = (bool)((byte)(uVar73 >> 5) & 1);
                        bVar15 = (bool)((byte)(uVar73 >> 6) & 1);
                        bVar16 = SUB81(uVar73 >> 7,0);
                        *(uint *)(local_950.ray + 0x200) =
                             (uint)(bVar64 & 1) * *(int *)(local_950.hit + 0x80) |
                             (uint)!(bool)(bVar64 & 1) * *(int *)(local_950.ray + 0x200);
                        *(uint *)(local_950.ray + 0x204) =
                             (uint)bVar10 * iVar52 | (uint)!bVar10 * *(int *)(local_950.ray + 0x204)
                        ;
                        *(uint *)(local_950.ray + 0x208) =
                             (uint)bVar11 * iVar53 | (uint)!bVar11 * *(int *)(local_950.ray + 0x208)
                        ;
                        *(uint *)(local_950.ray + 0x20c) =
                             (uint)bVar12 * iVar54 | (uint)!bVar12 * *(int *)(local_950.ray + 0x20c)
                        ;
                        *(uint *)(local_950.ray + 0x210) =
                             (uint)bVar13 * iVar55 | (uint)!bVar13 * *(int *)(local_950.ray + 0x210)
                        ;
                        *(uint *)(local_950.ray + 0x214) =
                             (uint)bVar14 * iVar56 | (uint)!bVar14 * *(int *)(local_950.ray + 0x214)
                        ;
                        *(uint *)(local_950.ray + 0x218) =
                             (uint)bVar15 * iVar57 | (uint)!bVar15 * *(int *)(local_950.ray + 0x218)
                        ;
                        *(uint *)(local_950.ray + 0x21c) =
                             (uint)bVar16 * iVar58 | (uint)!bVar16 * *(int *)(local_950.ray + 0x21c)
                        ;
                        auVar104 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_950.hit + 0xa0));
                        *(undefined1 (*) [32])(local_950.ray + 0x220) = auVar104;
                        auVar104 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_950.hit + 0xc0));
                        *(undefined1 (*) [32])(local_950.ray + 0x240) = auVar104;
                        auVar104 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_950.hit + 0xe0));
                        *(undefined1 (*) [32])(local_950.ray + 0x260) = auVar104;
                        auVar104 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_950.hit + 0x100))
                        ;
                        *(undefined1 (*) [32])(local_950.ray + 0x280) = auVar104;
                        break;
                      }
                    }
                    *(float *)(ray + k * 4 + 0x100) = fVar281;
                    break;
                  }
                }
                lVar72 = lVar72 + -1;
              } while (lVar72 != 0);
              uVar180 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar170._4_4_ = uVar180;
              auVar170._0_4_ = uVar180;
              auVar170._8_4_ = uVar180;
              auVar170._12_4_ = uVar180;
              auVar170._16_4_ = uVar180;
              auVar170._20_4_ = uVar180;
              auVar170._24_4_ = uVar180;
              auVar170._28_4_ = uVar180;
              auVar59._4_4_ = fStack_53c;
              auVar59._0_4_ = local_540;
              auVar59._8_4_ = fStack_538;
              auVar59._12_4_ = fStack_534;
              auVar59._16_4_ = fStack_530;
              auVar59._20_4_ = fStack_52c;
              auVar59._24_4_ = fStack_528;
              auVar59._28_4_ = fStack_524;
              uVar19 = vcmpps_avx512vl(auVar170,auVar59,0xd);
              bVar71 = ~('\x01' << ((byte)iVar23 & 0x1f)) & bVar71 & (byte)uVar19;
            } while (bVar71 != 0);
            auVar263 = ZEXT3264(local_320);
          }
          bVar67 = local_560[0] | ~bVar67;
          auVar195._0_4_ = (float)local_7e0._0_4_ + auVar263._0_4_;
          auVar195._4_4_ = (float)local_7e0._4_4_ + auVar263._4_4_;
          auVar195._8_4_ = fStack_7d8 + auVar263._8_4_;
          auVar195._12_4_ = fStack_7d4 + auVar263._12_4_;
          auVar195._16_4_ = fStack_7d0 + auVar263._16_4_;
          auVar195._20_4_ = fStack_7cc + auVar263._20_4_;
          auVar195._24_4_ = fStack_7c8 + auVar263._24_4_;
          auVar195._28_4_ = fStack_7c4 + auVar263._28_4_;
          uVar19 = vcmpps_avx512vl(auVar195,auVar170,2);
          bVar62 = (byte)uVar21 & bVar62 & (byte)uVar19;
          auVar196._8_4_ = 2;
          auVar196._0_8_ = 0x200000002;
          auVar196._12_4_ = 2;
          auVar196._16_4_ = 2;
          auVar196._20_4_ = 2;
          auVar196._24_4_ = 2;
          auVar196._28_4_ = 2;
          auVar35._8_4_ = 3;
          auVar35._0_8_ = 0x300000003;
          auVar35._12_4_ = 3;
          auVar35._16_4_ = 3;
          auVar35._20_4_ = 3;
          auVar35._24_4_ = 3;
          auVar35._28_4_ = 3;
          auVar104 = vpblendmd_avx512vl(auVar196,auVar35);
          auVar140._0_4_ = (uint)(bVar67 & 1) * auVar104._0_4_ | (uint)!(bool)(bVar67 & 1) * 2;
          bVar10 = (bool)(bVar67 >> 1 & 1);
          auVar140._4_4_ = (uint)bVar10 * auVar104._4_4_ | (uint)!bVar10 * 2;
          bVar10 = (bool)(bVar67 >> 2 & 1);
          auVar140._8_4_ = (uint)bVar10 * auVar104._8_4_ | (uint)!bVar10 * 2;
          bVar10 = (bool)(bVar67 >> 3 & 1);
          auVar140._12_4_ = (uint)bVar10 * auVar104._12_4_ | (uint)!bVar10 * 2;
          bVar10 = (bool)(bVar67 >> 4 & 1);
          auVar140._16_4_ = (uint)bVar10 * auVar104._16_4_ | (uint)!bVar10 * 2;
          bVar10 = (bool)(bVar67 >> 5 & 1);
          auVar140._20_4_ = (uint)bVar10 * auVar104._20_4_ | (uint)!bVar10 * 2;
          bVar10 = (bool)(bVar67 >> 6 & 1);
          auVar140._24_4_ = (uint)bVar10 * auVar104._24_4_ | (uint)!bVar10 * 2;
          auVar140._28_4_ = (uint)(bVar67 >> 7) * auVar104._28_4_ | (uint)!(bool)(bVar67 >> 7) * 2;
          uVar19 = vpcmpd_avx512vl(local_4e0,auVar140,5);
          bVar67 = (byte)uVar19 & bVar62;
          fVar276 = (float)local_7e0._0_4_;
          fVar281 = (float)local_7e0._4_4_;
          fVar282 = fStack_7d8;
          fVar283 = fStack_7d4;
          fVar241 = fStack_7d0;
          fVar242 = fStack_7cc;
          fVar243 = fStack_7c8;
          fVar244 = fStack_7c4;
          if (bVar67 != 0) {
            auVar83 = vminps_avx(local_760._0_16_,local_7a0._0_16_);
            auVar82 = vmaxps_avx(local_760._0_16_,local_7a0._0_16_);
            auVar18 = vminps_avx(local_780._0_16_,local_7c0._0_16_);
            auVar84 = vminps_avx(auVar83,auVar18);
            auVar83 = vmaxps_avx(local_780._0_16_,local_7c0._0_16_);
            auVar18 = vmaxps_avx(auVar82,auVar83);
            auVar211._8_4_ = 0x7fffffff;
            auVar211._0_8_ = 0x7fffffff7fffffff;
            auVar211._12_4_ = 0x7fffffff;
            auVar82 = vandps_avx(auVar84,auVar211);
            auVar83 = vandps_avx(auVar18,auVar211);
            auVar82 = vmaxps_avx(auVar82,auVar83);
            auVar83 = vmovshdup_avx(auVar82);
            auVar83 = vmaxss_avx(auVar83,auVar82);
            auVar82 = vshufpd_avx(auVar82,auVar82,1);
            auVar82 = vmaxss_avx(auVar82,auVar83);
            fVar276 = auVar82._0_4_ * 1.9073486e-06;
            local_6e0 = vshufps_avx(auVar18,auVar18,0xff);
            local_540 = (float)local_7e0._0_4_ + local_360._0_4_;
            fStack_53c = (float)local_7e0._4_4_ + local_360._4_4_;
            fStack_538 = fStack_7d8 + local_360._8_4_;
            fStack_534 = fStack_7d4 + local_360._12_4_;
            fStack_530 = fStack_7d0 + local_360._16_4_;
            fStack_52c = fStack_7cc + local_360._20_4_;
            fStack_528 = fStack_7c8 + local_360._24_4_;
            fStack_524 = fStack_7c4 + local_360._28_4_;
            _local_680 = local_360;
            local_560 = auVar140;
            do {
              auVar171._8_4_ = 0x7f800000;
              auVar171._0_8_ = 0x7f8000007f800000;
              auVar171._12_4_ = 0x7f800000;
              auVar171._16_4_ = 0x7f800000;
              auVar171._20_4_ = 0x7f800000;
              auVar171._24_4_ = 0x7f800000;
              auVar171._28_4_ = 0x7f800000;
              auVar104 = vblendmps_avx512vl(auVar171,_local_680);
              auVar141._0_4_ =
                   (uint)(bVar67 & 1) * auVar104._0_4_ | (uint)!(bool)(bVar67 & 1) * 0x7f800000;
              bVar10 = (bool)(bVar67 >> 1 & 1);
              auVar141._4_4_ = (uint)bVar10 * auVar104._4_4_ | (uint)!bVar10 * 0x7f800000;
              bVar10 = (bool)(bVar67 >> 2 & 1);
              auVar141._8_4_ = (uint)bVar10 * auVar104._8_4_ | (uint)!bVar10 * 0x7f800000;
              bVar10 = (bool)(bVar67 >> 3 & 1);
              auVar141._12_4_ = (uint)bVar10 * auVar104._12_4_ | (uint)!bVar10 * 0x7f800000;
              bVar10 = (bool)(bVar67 >> 4 & 1);
              auVar141._16_4_ = (uint)bVar10 * auVar104._16_4_ | (uint)!bVar10 * 0x7f800000;
              bVar10 = (bool)(bVar67 >> 5 & 1);
              auVar141._20_4_ = (uint)bVar10 * auVar104._20_4_ | (uint)!bVar10 * 0x7f800000;
              auVar141._24_4_ =
                   (uint)(bVar67 >> 6) * auVar104._24_4_ | (uint)!(bool)(bVar67 >> 6) * 0x7f800000;
              auVar141._28_4_ = 0x7f800000;
              auVar104 = vshufps_avx(auVar141,auVar141,0xb1);
              auVar104 = vminps_avx(auVar141,auVar104);
              auVar101 = vshufpd_avx(auVar104,auVar104,5);
              auVar104 = vminps_avx(auVar104,auVar101);
              auVar101 = vpermpd_avx2(auVar104,0x4e);
              auVar104 = vminps_avx(auVar104,auVar101);
              uVar19 = vcmpps_avx512vl(auVar141,auVar104,0);
              bVar64 = (byte)uVar19 & bVar67;
              bVar71 = bVar67;
              if (bVar64 != 0) {
                bVar71 = bVar64;
              }
              iVar23 = 0;
              for (uVar75 = (uint)bVar71; (uVar75 & 1) == 0; uVar75 = uVar75 >> 1 | 0x80000000) {
                iVar23 = iVar23 + 1;
              }
              uVar75 = *(uint *)(local_340 + (uint)(iVar23 << 2));
              fVar281 = auVar80._0_4_;
              auVar82 = ZEXT416(*(uint *)(local_1c0 + (uint)(iVar23 << 2)));
              if ((float)local_800._0_4_ < 0.0) {
                local_860._0_16_ = ZEXT416(*(uint *)(local_1c0 + (uint)(iVar23 << 2)));
                fVar281 = sqrtf((float)local_800._0_4_);
                auVar82 = local_860._0_16_;
              }
              auVar82 = vinsertps_avx(ZEXT416(uVar75),auVar82,0x10);
              auVar285 = ZEXT1664(auVar82);
              lVar72 = 5;
              do {
                uVar180 = auVar285._0_4_;
                auVar161._4_4_ = uVar180;
                auVar161._0_4_ = uVar180;
                auVar161._8_4_ = uVar180;
                auVar161._12_4_ = uVar180;
                auVar82 = vfmadd132ps_fma(auVar161,ZEXT816(0) << 0x40,local_7f0);
                local_740 = auVar285._0_32_;
                auVar83 = vmovshdup_avx(auVar285._0_16_);
                fVar243 = auVar83._0_4_;
                fVar242 = 1.0 - fVar243;
                fVar241 = fVar242 * fVar242 * fVar242;
                fVar282 = fVar243 * fVar243;
                fVar244 = fVar282 * fVar243;
                auVar18 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar241),
                                          ZEXT416((uint)fVar244));
                fVar283 = fVar243 * fVar242;
                local_860._0_16_ = ZEXT416((uint)fVar242);
                auVar89 = vfmadd231ss_fma(ZEXT416((uint)(fVar283 * fVar243 * 6.0)),
                                          ZEXT416((uint)(fVar283 * fVar242)),
                                          SUB6416(ZEXT464(0x41400000),0));
                auVar84 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar244),
                                          ZEXT416((uint)fVar241));
                auVar81 = vfmadd231ss_fma(ZEXT416((uint)(fVar283 * fVar242 * 6.0)),
                                          SUB6416(ZEXT464(0x41400000),0),
                                          ZEXT416((uint)(fVar283 * fVar243)));
                fVar241 = fVar241 * 0.16666667;
                fVar242 = (auVar18._0_4_ + auVar89._0_4_) * 0.16666667;
                fVar243 = (auVar84._0_4_ + auVar81._0_4_) * 0.16666667;
                fVar244 = fVar244 * 0.16666667;
                auVar212._0_4_ = fVar244 * (float)local_7c0._0_4_;
                auVar212._4_4_ = fVar244 * (float)local_7c0._4_4_;
                auVar212._8_4_ = fVar244 * fStack_7b8;
                auVar212._12_4_ = fVar244 * fStack_7b4;
                auVar250._4_4_ = fVar243;
                auVar250._0_4_ = fVar243;
                auVar250._8_4_ = fVar243;
                auVar250._12_4_ = fVar243;
                auVar18 = vfmadd132ps_fma(auVar250,auVar212,local_780._0_16_);
                auVar213._4_4_ = fVar242;
                auVar213._0_4_ = fVar242;
                auVar213._8_4_ = fVar242;
                auVar213._12_4_ = fVar242;
                auVar18 = vfmadd132ps_fma(auVar213,auVar18,local_7a0._0_16_);
                auVar189._4_4_ = fVar241;
                auVar189._0_4_ = fVar241;
                auVar189._8_4_ = fVar241;
                auVar189._12_4_ = fVar241;
                auVar18 = vfmadd132ps_fma(auVar189,auVar18,local_760._0_16_);
                local_5e0._0_16_ = auVar18;
                auVar18 = vsubps_avx(auVar82,auVar18);
                auVar82 = vdpps_avx(auVar18,auVar18,0x7f);
                local_820._0_16_ = auVar82;
                if (auVar82._0_4_ < 0.0) {
                  local_880._0_4_ = fVar282;
                  local_8a0._0_4_ = fVar283;
                  auVar280._0_4_ = sqrtf(auVar82._0_4_);
                  auVar280._4_60_ = extraout_var_00;
                  auVar82 = auVar280._0_16_;
                  fVar283 = (float)local_8a0._0_4_;
                }
                else {
                  auVar82 = vsqrtss_avx(auVar82,auVar82);
                  local_880._0_4_ = fVar282;
                }
                local_600._4_4_ = local_860._0_4_;
                local_600._0_4_ = local_600._4_4_;
                fStack_5f8 = (float)local_600._4_4_;
                fStack_5f4 = (float)local_600._4_4_;
                auVar89 = vfnmsub213ss_fma(auVar83,auVar83,ZEXT416((uint)(fVar283 * 4.0)));
                auVar84 = vfmadd231ss_fma(ZEXT416((uint)(fVar283 * 4.0)),local_860._0_16_,
                                          local_860._0_16_);
                fVar282 = (float)local_600._4_4_ * -(float)local_600._4_4_ * 0.5;
                fVar283 = auVar89._0_4_ * 0.5;
                fVar241 = auVar84._0_4_ * 0.5;
                local_880._0_4_ = (float)local_880._0_4_ * 0.5;
                auVar233._0_4_ = (float)local_880._0_4_ * (float)local_7c0._0_4_;
                auVar233._4_4_ = (float)local_880._0_4_ * (float)local_7c0._4_4_;
                auVar233._8_4_ = (float)local_880._0_4_ * fStack_7b8;
                auVar233._12_4_ = (float)local_880._0_4_ * fStack_7b4;
                auVar190._4_4_ = fVar241;
                auVar190._0_4_ = fVar241;
                auVar190._8_4_ = fVar241;
                auVar190._12_4_ = fVar241;
                auVar84 = vfmadd132ps_fma(auVar190,auVar233,local_780._0_16_);
                auVar214._4_4_ = fVar283;
                auVar214._0_4_ = fVar283;
                auVar214._8_4_ = fVar283;
                auVar214._12_4_ = fVar283;
                auVar84 = vfmadd132ps_fma(auVar214,auVar84,local_7a0._0_16_);
                auVar291._4_4_ = fVar282;
                auVar291._0_4_ = fVar282;
                auVar291._8_4_ = fVar282;
                auVar291._12_4_ = fVar282;
                _local_880 = vfmadd132ps_fma(auVar291,auVar84,local_760._0_16_);
                local_620._0_16_ = vdpps_avx(_local_880,_local_880,0x7f);
                auVar51._12_4_ = 0;
                auVar51._0_12_ = ZEXT812(0);
                fVar282 = local_620._0_4_;
                auVar89 = vrsqrt14ss_avx512f(auVar51 << 0x20,ZEXT416((uint)fVar282));
                local_640._0_16_ = vrcp14ss_avx512f(auVar51 << 0x20,ZEXT416((uint)fVar282));
                auVar84 = vfnmadd213ss_fma(local_640._0_16_,local_620._0_16_,ZEXT416(0x40000000));
                local_660._0_4_ = auVar84._0_4_;
                local_8a0._0_4_ = auVar82._0_4_;
                if (fVar282 < -fVar282) {
                  local_840 = auVar89;
                  fVar283 = sqrtf(fVar282);
                  auVar82 = ZEXT416((uint)local_8a0._0_4_);
                  auVar84 = local_840;
                  auVar81 = _local_880;
                }
                else {
                  auVar84 = vsqrtss_avx(local_620._0_16_,local_620._0_16_);
                  fVar283 = auVar84._0_4_;
                  auVar84 = auVar89;
                  auVar81 = _local_880;
                }
                fVar241 = auVar84._0_4_;
                auVar87 = vbroadcastss_avx512vl
                                    (ZEXT416((uint)(auVar89._0_4_ * 1.5 +
                                                   fVar282 * -0.5 * fVar241 * fVar241 * fVar241)));
                auVar86 = vmulps_avx512vl(auVar81,auVar87);
                auVar84 = vdpps_avx(auVar18,auVar86,0x7f);
                fVar282 = auVar82._0_4_ + 1.0;
                fVar241 = auVar84._0_4_;
                auVar162._0_4_ = fVar241 * fVar241;
                auVar162._4_4_ = auVar84._4_4_ * auVar84._4_4_;
                auVar162._8_4_ = auVar84._8_4_ * auVar84._8_4_;
                auVar162._12_4_ = auVar84._12_4_ * auVar84._12_4_;
                auVar89 = vsubps_avx(local_820._0_16_,auVar162);
                fVar242 = auVar89._0_4_;
                auVar191._4_12_ = ZEXT812(0) << 0x20;
                auVar191._0_4_ = fVar242;
                auVar85 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar191);
                auVar90 = vmulss_avx512f(auVar85,ZEXT416(0x3fc00000));
                auVar91 = vmulss_avx512f(auVar89,ZEXT416(0xbf000000));
                if (fVar242 < 0.0) {
                  local_840._0_4_ = fVar282;
                  local_6b0._0_4_ = auVar90._0_4_;
                  _local_6d0 = auVar87;
                  local_6c0 = auVar86;
                  local_6a0 = auVar85;
                  fVar242 = sqrtf(fVar242);
                  auVar91 = ZEXT416(auVar91._0_4_);
                  auVar90 = ZEXT416((uint)local_6b0._0_4_);
                  auVar82 = ZEXT416((uint)local_8a0._0_4_);
                  auVar85 = local_6a0;
                  auVar81 = _local_880;
                  fVar282 = (float)local_840._0_4_;
                  auVar86 = local_6c0;
                  auVar87 = _local_6d0;
                }
                else {
                  auVar89 = vsqrtss_avx(auVar89,auVar89);
                  fVar242 = auVar89._0_4_;
                }
                auVar293 = ZEXT1664(auVar81);
                auVar288 = ZEXT1664(local_820._0_16_);
                auVar286 = ZEXT1664(auVar18);
                auVar297 = ZEXT3264(local_8c0);
                auVar298 = ZEXT3264(local_8e0);
                auVar299 = ZEXT3264(local_900);
                auVar300 = ZEXT3264(local_920);
                auVar89 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_860._0_16_,auVar83);
                auVar88 = vfmadd213ss_fma(auVar83,SUB6416(ZEXT464(0xc0000000),0),local_860._0_16_);
                auVar284 = local_740._0_16_;
                auVar83 = vshufps_avx(auVar284,auVar284,0x55);
                auVar215._0_4_ = auVar83._0_4_ * (float)local_7c0._0_4_;
                auVar215._4_4_ = auVar83._4_4_ * (float)local_7c0._4_4_;
                auVar215._8_4_ = auVar83._8_4_ * fStack_7b8;
                auVar215._12_4_ = auVar83._12_4_ * fStack_7b4;
                auVar234._0_4_ = auVar88._0_4_;
                auVar234._4_4_ = auVar234._0_4_;
                auVar234._8_4_ = auVar234._0_4_;
                auVar234._12_4_ = auVar234._0_4_;
                auVar83 = vfmadd132ps_fma(auVar234,auVar215,local_780._0_16_);
                auVar192._0_4_ = auVar89._0_4_;
                auVar192._4_4_ = auVar192._0_4_;
                auVar192._8_4_ = auVar192._0_4_;
                auVar192._12_4_ = auVar192._0_4_;
                auVar83 = vfmadd132ps_fma(auVar192,auVar83,local_7a0._0_16_);
                auVar83 = vfmadd132ps_fma(_local_600,auVar83,local_760._0_16_);
                auVar193._0_4_ = auVar83._0_4_ * (float)local_620._0_4_;
                auVar193._4_4_ = auVar83._4_4_ * (float)local_620._0_4_;
                auVar193._8_4_ = auVar83._8_4_ * (float)local_620._0_4_;
                auVar193._12_4_ = auVar83._12_4_ * (float)local_620._0_4_;
                auVar83 = vdpps_avx(auVar81,auVar83,0x7f);
                fVar243 = auVar83._0_4_;
                auVar216._0_4_ = auVar81._0_4_ * fVar243;
                auVar216._4_4_ = auVar81._4_4_ * fVar243;
                auVar216._8_4_ = auVar81._8_4_ * fVar243;
                auVar216._12_4_ = auVar81._12_4_ * fVar243;
                auVar83 = vsubps_avx(auVar193,auVar216);
                fVar243 = (float)local_660._0_4_ * (float)local_640._0_4_;
                auVar88 = vmaxss_avx(ZEXT416((uint)fVar276),
                                     ZEXT416((uint)(local_740._0_4_ * fVar281 * 1.9073486e-06)));
                auVar217._0_4_ = auVar83._0_4_ * fVar243;
                auVar217._4_4_ = auVar83._4_4_ * fVar243;
                auVar217._8_4_ = auVar83._8_4_ * fVar243;
                auVar217._12_4_ = auVar83._12_4_ * fVar243;
                auVar28._8_4_ = 0x80000000;
                auVar28._0_8_ = 0x8000000080000000;
                auVar28._12_4_ = 0x80000000;
                auVar92 = vxorps_avx512vl(auVar81,auVar28);
                auVar87 = vmulps_avx512vl(auVar87,auVar217);
                auVar83 = vdpps_avx(auVar92,auVar86,0x7f);
                auVar89 = vfmadd213ss_fma(auVar82,ZEXT416((uint)fVar276),auVar88);
                auVar82 = vdpps_avx(auVar18,auVar87,0x7f);
                auVar87 = vfmadd213ss_fma(ZEXT416((uint)fVar282),ZEXT416((uint)(fVar276 / fVar283)),
                                          auVar89);
                fVar282 = auVar83._0_4_ + auVar82._0_4_;
                auVar82 = vdpps_avx(local_7f0,auVar86,0x7f);
                auVar83 = vdpps_avx(auVar18,auVar92,0x7f);
                auVar89 = vmulss_avx512f(auVar91,auVar85);
                auVar90 = vaddss_avx512f(auVar90,ZEXT416((uint)(auVar89._0_4_ *
                                                               auVar85._0_4_ * auVar85._0_4_)));
                auVar89 = vdpps_avx(auVar18,local_7f0,0x7f);
                auVar86 = vfnmadd231ss_fma(auVar83,auVar84,ZEXT416((uint)fVar282));
                auVar89 = vfnmadd231ss_fma(auVar89,auVar84,auVar82);
                auVar83 = vpermilps_avx(local_5e0._0_16_,0xff);
                fVar242 = fVar242 - auVar83._0_4_;
                auVar85 = vshufps_avx(auVar81,auVar81,0xff);
                auVar83 = vfmsub213ss_fma(auVar86,auVar90,auVar85);
                auVar279._8_4_ = 0x80000000;
                auVar279._0_8_ = 0x8000000080000000;
                auVar279._12_4_ = 0x80000000;
                auVar280 = ZEXT1664(auVar279);
                auVar273._0_8_ = auVar83._0_8_ ^ 0x8000000080000000;
                auVar273._8_4_ = auVar83._8_4_ ^ 0x80000000;
                auVar273._12_4_ = auVar83._12_4_ ^ 0x80000000;
                auVar275 = ZEXT1664(auVar273);
                auVar89 = ZEXT416((uint)(auVar89._0_4_ * auVar90._0_4_));
                auVar86 = vfmsub231ss_fma(ZEXT416((uint)(auVar82._0_4_ * auVar83._0_4_)),
                                          ZEXT416((uint)fVar282),auVar89);
                auVar83 = vinsertps_avx(auVar273,auVar89,0x1c);
                auVar262._0_8_ = auVar82._0_8_ ^ 0x8000000080000000;
                auVar262._8_4_ = auVar82._8_4_ ^ 0x80000000;
                auVar262._12_4_ = auVar82._12_4_ ^ 0x80000000;
                auVar89 = vinsertps_avx(ZEXT416((uint)fVar282),auVar262,0x10);
                auVar235._0_4_ = auVar86._0_4_;
                auVar235._4_4_ = auVar235._0_4_;
                auVar235._8_4_ = auVar235._0_4_;
                auVar235._12_4_ = auVar235._0_4_;
                auVar82 = vdivps_avx(auVar83,auVar235);
                auVar83 = vdivps_avx(auVar89,auVar235);
                auVar263 = ZEXT1664(CONCAT412(fVar242,CONCAT48(fVar242,CONCAT44(fVar242,fVar242))));
                auVar236._0_4_ = fVar241 * auVar82._0_4_ + fVar242 * auVar83._0_4_;
                auVar236._4_4_ = fVar241 * auVar82._4_4_ + fVar242 * auVar83._4_4_;
                auVar236._8_4_ = fVar241 * auVar82._8_4_ + fVar242 * auVar83._8_4_;
                auVar236._12_4_ = fVar241 * auVar82._12_4_ + fVar242 * auVar83._12_4_;
                auVar82 = vsubps_avx(auVar284,auVar236);
                auVar285 = ZEXT1664(auVar82);
                auVar29._8_4_ = 0x7fffffff;
                auVar29._0_8_ = 0x7fffffff7fffffff;
                auVar29._12_4_ = 0x7fffffff;
                auVar83 = vandps_avx512vl(auVar84,auVar29);
                if (auVar83._0_4_ < auVar87._0_4_) {
                  auVar83 = vfmadd231ss_fma(ZEXT416((uint)(auVar87._0_4_ + auVar88._0_4_)),local_6e0
                                            ,ZEXT416(0x36000000));
                  auVar30._8_4_ = 0x7fffffff;
                  auVar30._0_8_ = 0x7fffffff7fffffff;
                  auVar30._12_4_ = 0x7fffffff;
                  auVar84 = vandps_avx512vl(ZEXT416((uint)fVar242),auVar30);
                  if (auVar84._0_4_ < auVar83._0_4_) {
                    fVar281 = auVar82._0_4_ + (float)local_6f0._0_4_;
                    if ((fVar281 < fVar173) ||
                       (fVar282 = *(float *)(ray + k * 4 + 0x100), fVar282 < fVar281)) break;
                    auVar83 = vmovshdup_avx(auVar82);
                    fVar283 = auVar83._0_4_;
                    if ((fVar283 < 0.0) || (1.0 < fVar283)) break;
                    auVar83 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,ZEXT416((uint)local_820._0_4_));
                    fVar242 = auVar83._0_4_;
                    fVar241 = local_820._0_4_ * -0.5;
                    auVar263 = ZEXT464((uint)fVar241);
                    pGVar4 = (context->scene->geometries).items[uVar65].ptr;
                    if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) break;
                    fVar241 = fVar242 * 1.5 + fVar241 * fVar242 * fVar242 * fVar242;
                    auVar237._0_4_ = auVar18._0_4_ * fVar241;
                    auVar237._4_4_ = auVar18._4_4_ * fVar241;
                    auVar237._8_4_ = auVar18._8_4_ * fVar241;
                    auVar237._12_4_ = auVar18._12_4_ * fVar241;
                    auVar85 = vfmadd213ps_fma(auVar85,auVar237,auVar81);
                    auVar83 = vshufps_avx(auVar237,auVar237,0xc9);
                    auVar84 = vshufps_avx(auVar81,auVar81,0xc9);
                    auVar238._0_4_ = auVar237._0_4_ * auVar84._0_4_;
                    auVar238._4_4_ = auVar237._4_4_ * auVar84._4_4_;
                    auVar238._8_4_ = auVar237._8_4_ * auVar84._8_4_;
                    auVar238._12_4_ = auVar237._12_4_ * auVar84._12_4_;
                    auVar89 = vfmsub231ps_fma(auVar238,auVar81,auVar83);
                    auVar83 = vshufps_avx(auVar89,auVar89,0xc9);
                    auVar84 = vshufps_avx(auVar85,auVar85,0xc9);
                    auVar263 = ZEXT1664(auVar84);
                    auVar89 = vshufps_avx(auVar89,auVar89,0xd2);
                    auVar163._0_4_ = auVar85._0_4_ * auVar89._0_4_;
                    auVar163._4_4_ = auVar85._4_4_ * auVar89._4_4_;
                    auVar163._8_4_ = auVar85._8_4_ * auVar89._8_4_;
                    auVar163._12_4_ = auVar85._12_4_ * auVar89._12_4_;
                    auVar83 = vfmsub231ps_fma(auVar163,auVar83,auVar84);
                    uVar180 = auVar83._0_4_;
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      *(float *)(ray + k * 4 + 0x100) = fVar281;
                      uVar3 = vextractps_avx(auVar83,1);
                      *(undefined4 *)(ray + k * 4 + 0x180) = uVar3;
                      uVar3 = vextractps_avx(auVar83,2);
                      *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar3;
                      *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar180;
                      *(float *)(ray + k * 4 + 0x1e0) = fVar283;
                      *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                      *(int *)(ray + k * 4 + 0x220) = (int)local_828;
                      *(uint *)(ray + k * 4 + 0x240) = uVar65;
                      *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                      *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                      break;
                    }
                    pRVar8 = context->user;
                    auVar240._8_4_ = 1;
                    auVar240._0_8_ = 0x100000001;
                    auVar240._12_4_ = 1;
                    auVar240._16_4_ = 1;
                    auVar240._20_4_ = 1;
                    auVar240._24_4_ = 1;
                    auVar240._28_4_ = 1;
                    local_420 = vpermps_avx2(auVar240,ZEXT1632(auVar82));
                    auVar104 = vpermps_avx2(auVar240,ZEXT1632(auVar83));
                    auVar253._8_4_ = 2;
                    auVar253._0_8_ = 0x200000002;
                    auVar253._12_4_ = 2;
                    auVar253._16_4_ = 2;
                    auVar253._20_4_ = 2;
                    auVar253._24_4_ = 2;
                    auVar253._28_4_ = 2;
                    local_460 = vpermps_avx2(auVar253,ZEXT1632(auVar83));
                    local_480[0] = (RTCHitN)auVar104[0];
                    local_480[1] = (RTCHitN)auVar104[1];
                    local_480[2] = (RTCHitN)auVar104[2];
                    local_480[3] = (RTCHitN)auVar104[3];
                    local_480[4] = (RTCHitN)auVar104[4];
                    local_480[5] = (RTCHitN)auVar104[5];
                    local_480[6] = (RTCHitN)auVar104[6];
                    local_480[7] = (RTCHitN)auVar104[7];
                    local_480[8] = (RTCHitN)auVar104[8];
                    local_480[9] = (RTCHitN)auVar104[9];
                    local_480[10] = (RTCHitN)auVar104[10];
                    local_480[0xb] = (RTCHitN)auVar104[0xb];
                    local_480[0xc] = (RTCHitN)auVar104[0xc];
                    local_480[0xd] = (RTCHitN)auVar104[0xd];
                    local_480[0xe] = (RTCHitN)auVar104[0xe];
                    local_480[0xf] = (RTCHitN)auVar104[0xf];
                    local_480[0x10] = (RTCHitN)auVar104[0x10];
                    local_480[0x11] = (RTCHitN)auVar104[0x11];
                    local_480[0x12] = (RTCHitN)auVar104[0x12];
                    local_480[0x13] = (RTCHitN)auVar104[0x13];
                    local_480[0x14] = (RTCHitN)auVar104[0x14];
                    local_480[0x15] = (RTCHitN)auVar104[0x15];
                    local_480[0x16] = (RTCHitN)auVar104[0x16];
                    local_480[0x17] = (RTCHitN)auVar104[0x17];
                    local_480[0x18] = (RTCHitN)auVar104[0x18];
                    local_480[0x19] = (RTCHitN)auVar104[0x19];
                    local_480[0x1a] = (RTCHitN)auVar104[0x1a];
                    local_480[0x1b] = (RTCHitN)auVar104[0x1b];
                    local_480[0x1c] = (RTCHitN)auVar104[0x1c];
                    local_480[0x1d] = (RTCHitN)auVar104[0x1d];
                    local_480[0x1e] = (RTCHitN)auVar104[0x1e];
                    local_480[0x1f] = (RTCHitN)auVar104[0x1f];
                    local_440 = uVar180;
                    uStack_43c = uVar180;
                    uStack_438 = uVar180;
                    uStack_434 = uVar180;
                    uStack_430 = uVar180;
                    uStack_42c = uVar180;
                    uStack_428 = uVar180;
                    uStack_424 = uVar180;
                    local_400 = ZEXT432(0) << 0x20;
                    local_3e0 = local_4c0._0_8_;
                    uStack_3d8 = local_4c0._8_8_;
                    uStack_3d0 = local_4c0._16_8_;
                    uStack_3c8 = local_4c0._24_8_;
                    local_3c0 = local_4a0;
                    auVar104 = vpcmpeqd_avx2(local_4a0,local_4a0);
                    local_830[1] = auVar104;
                    *local_830 = auVar104;
                    local_3a0 = pRVar8->instID[0];
                    uStack_39c = local_3a0;
                    uStack_398 = local_3a0;
                    uStack_394 = local_3a0;
                    uStack_390 = local_3a0;
                    uStack_38c = local_3a0;
                    uStack_388 = local_3a0;
                    uStack_384 = local_3a0;
                    local_380 = pRVar8->instPrimID[0];
                    uStack_37c = local_380;
                    uStack_378 = local_380;
                    uStack_374 = local_380;
                    uStack_370 = local_380;
                    uStack_36c = local_380;
                    uStack_368 = local_380;
                    uStack_364 = local_380;
                    *(float *)(ray + k * 4 + 0x100) = fVar281;
                    local_720 = local_500;
                    local_950.valid = (int *)local_720;
                    local_950.geometryUserPtr = pGVar4->userPtr;
                    local_950.context = context->user;
                    local_950.hit = local_480;
                    local_950.N = 8;
                    local_950.ray = (RTCRayN *)ray;
                    if (pGVar4->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar263 = ZEXT1664(auVar84);
                      auVar275 = ZEXT1664(auVar273);
                      auVar280 = ZEXT1664(auVar279);
                      auVar285 = ZEXT1664(auVar82);
                      auVar286 = ZEXT1664(auVar18);
                      auVar288 = ZEXT1664(local_820._0_16_);
                      auVar293 = ZEXT1664(auVar81);
                      (*pGVar4->intersectionFilterN)(&local_950);
                      auVar300 = ZEXT3264(local_920);
                      auVar299 = ZEXT3264(local_900);
                      auVar298 = ZEXT3264(local_8e0);
                      auVar297 = ZEXT3264(local_8c0);
                    }
                    if (local_720 != (undefined1  [32])0x0) {
                      p_Var9 = context->args->filter;
                      if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar263 = ZEXT1664(auVar263._0_16_);
                        auVar275 = ZEXT1664(auVar275._0_16_);
                        auVar280 = ZEXT1664(auVar280._0_16_);
                        auVar285 = ZEXT1664(auVar285._0_16_);
                        auVar286 = ZEXT1664(auVar286._0_16_);
                        auVar288 = ZEXT1664(auVar288._0_16_);
                        auVar293 = ZEXT1664(auVar293._0_16_);
                        (*p_Var9)(&local_950);
                        auVar300 = ZEXT3264(local_920);
                        auVar299 = ZEXT3264(local_900);
                        auVar298 = ZEXT3264(local_8e0);
                        auVar297 = ZEXT3264(local_8c0);
                      }
                      if (local_720 != (undefined1  [32])0x0) {
                        uVar73 = vptestmd_avx512vl(local_720,local_720);
                        iVar52 = *(int *)(local_950.hit + 4);
                        iVar53 = *(int *)(local_950.hit + 8);
                        iVar54 = *(int *)(local_950.hit + 0xc);
                        iVar55 = *(int *)(local_950.hit + 0x10);
                        iVar56 = *(int *)(local_950.hit + 0x14);
                        iVar57 = *(int *)(local_950.hit + 0x18);
                        iVar58 = *(int *)(local_950.hit + 0x1c);
                        bVar71 = (byte)uVar73;
                        bVar10 = (bool)((byte)(uVar73 >> 1) & 1);
                        bVar11 = (bool)((byte)(uVar73 >> 2) & 1);
                        bVar12 = (bool)((byte)(uVar73 >> 3) & 1);
                        bVar13 = (bool)((byte)(uVar73 >> 4) & 1);
                        bVar14 = (bool)((byte)(uVar73 >> 5) & 1);
                        bVar15 = (bool)((byte)(uVar73 >> 6) & 1);
                        bVar16 = SUB81(uVar73 >> 7,0);
                        *(uint *)(local_950.ray + 0x180) =
                             (uint)(bVar71 & 1) * *(int *)local_950.hit |
                             (uint)!(bool)(bVar71 & 1) * *(int *)(local_950.ray + 0x180);
                        *(uint *)(local_950.ray + 0x184) =
                             (uint)bVar10 * iVar52 | (uint)!bVar10 * *(int *)(local_950.ray + 0x184)
                        ;
                        *(uint *)(local_950.ray + 0x188) =
                             (uint)bVar11 * iVar53 | (uint)!bVar11 * *(int *)(local_950.ray + 0x188)
                        ;
                        *(uint *)(local_950.ray + 0x18c) =
                             (uint)bVar12 * iVar54 | (uint)!bVar12 * *(int *)(local_950.ray + 0x18c)
                        ;
                        *(uint *)(local_950.ray + 400) =
                             (uint)bVar13 * iVar55 | (uint)!bVar13 * *(int *)(local_950.ray + 400);
                        *(uint *)(local_950.ray + 0x194) =
                             (uint)bVar14 * iVar56 | (uint)!bVar14 * *(int *)(local_950.ray + 0x194)
                        ;
                        *(uint *)(local_950.ray + 0x198) =
                             (uint)bVar15 * iVar57 | (uint)!bVar15 * *(int *)(local_950.ray + 0x198)
                        ;
                        *(uint *)(local_950.ray + 0x19c) =
                             (uint)bVar16 * iVar58 | (uint)!bVar16 * *(int *)(local_950.ray + 0x19c)
                        ;
                        iVar52 = *(int *)(local_950.hit + 0x24);
                        iVar53 = *(int *)(local_950.hit + 0x28);
                        iVar54 = *(int *)(local_950.hit + 0x2c);
                        iVar55 = *(int *)(local_950.hit + 0x30);
                        iVar56 = *(int *)(local_950.hit + 0x34);
                        iVar57 = *(int *)(local_950.hit + 0x38);
                        iVar58 = *(int *)(local_950.hit + 0x3c);
                        bVar10 = (bool)((byte)(uVar73 >> 1) & 1);
                        bVar11 = (bool)((byte)(uVar73 >> 2) & 1);
                        bVar12 = (bool)((byte)(uVar73 >> 3) & 1);
                        bVar13 = (bool)((byte)(uVar73 >> 4) & 1);
                        bVar14 = (bool)((byte)(uVar73 >> 5) & 1);
                        bVar15 = (bool)((byte)(uVar73 >> 6) & 1);
                        bVar16 = SUB81(uVar73 >> 7,0);
                        *(uint *)(local_950.ray + 0x1a0) =
                             (uint)(bVar71 & 1) * *(int *)(local_950.hit + 0x20) |
                             (uint)!(bool)(bVar71 & 1) * *(int *)(local_950.ray + 0x1a0);
                        *(uint *)(local_950.ray + 0x1a4) =
                             (uint)bVar10 * iVar52 | (uint)!bVar10 * *(int *)(local_950.ray + 0x1a4)
                        ;
                        *(uint *)(local_950.ray + 0x1a8) =
                             (uint)bVar11 * iVar53 | (uint)!bVar11 * *(int *)(local_950.ray + 0x1a8)
                        ;
                        *(uint *)(local_950.ray + 0x1ac) =
                             (uint)bVar12 * iVar54 | (uint)!bVar12 * *(int *)(local_950.ray + 0x1ac)
                        ;
                        *(uint *)(local_950.ray + 0x1b0) =
                             (uint)bVar13 * iVar55 | (uint)!bVar13 * *(int *)(local_950.ray + 0x1b0)
                        ;
                        *(uint *)(local_950.ray + 0x1b4) =
                             (uint)bVar14 * iVar56 | (uint)!bVar14 * *(int *)(local_950.ray + 0x1b4)
                        ;
                        *(uint *)(local_950.ray + 0x1b8) =
                             (uint)bVar15 * iVar57 | (uint)!bVar15 * *(int *)(local_950.ray + 0x1b8)
                        ;
                        *(uint *)(local_950.ray + 0x1bc) =
                             (uint)bVar16 * iVar58 | (uint)!bVar16 * *(int *)(local_950.ray + 0x1bc)
                        ;
                        iVar52 = *(int *)(local_950.hit + 0x44);
                        iVar53 = *(int *)(local_950.hit + 0x48);
                        iVar54 = *(int *)(local_950.hit + 0x4c);
                        iVar55 = *(int *)(local_950.hit + 0x50);
                        iVar56 = *(int *)(local_950.hit + 0x54);
                        iVar57 = *(int *)(local_950.hit + 0x58);
                        iVar58 = *(int *)(local_950.hit + 0x5c);
                        bVar10 = (bool)((byte)(uVar73 >> 1) & 1);
                        bVar11 = (bool)((byte)(uVar73 >> 2) & 1);
                        bVar12 = (bool)((byte)(uVar73 >> 3) & 1);
                        bVar13 = (bool)((byte)(uVar73 >> 4) & 1);
                        bVar14 = (bool)((byte)(uVar73 >> 5) & 1);
                        bVar15 = (bool)((byte)(uVar73 >> 6) & 1);
                        bVar16 = SUB81(uVar73 >> 7,0);
                        *(uint *)(local_950.ray + 0x1c0) =
                             (uint)(bVar71 & 1) * *(int *)(local_950.hit + 0x40) |
                             (uint)!(bool)(bVar71 & 1) * *(int *)(local_950.ray + 0x1c0);
                        *(uint *)(local_950.ray + 0x1c4) =
                             (uint)bVar10 * iVar52 | (uint)!bVar10 * *(int *)(local_950.ray + 0x1c4)
                        ;
                        *(uint *)(local_950.ray + 0x1c8) =
                             (uint)bVar11 * iVar53 | (uint)!bVar11 * *(int *)(local_950.ray + 0x1c8)
                        ;
                        *(uint *)(local_950.ray + 0x1cc) =
                             (uint)bVar12 * iVar54 | (uint)!bVar12 * *(int *)(local_950.ray + 0x1cc)
                        ;
                        *(uint *)(local_950.ray + 0x1d0) =
                             (uint)bVar13 * iVar55 | (uint)!bVar13 * *(int *)(local_950.ray + 0x1d0)
                        ;
                        *(uint *)(local_950.ray + 0x1d4) =
                             (uint)bVar14 * iVar56 | (uint)!bVar14 * *(int *)(local_950.ray + 0x1d4)
                        ;
                        *(uint *)(local_950.ray + 0x1d8) =
                             (uint)bVar15 * iVar57 | (uint)!bVar15 * *(int *)(local_950.ray + 0x1d8)
                        ;
                        *(uint *)(local_950.ray + 0x1dc) =
                             (uint)bVar16 * iVar58 | (uint)!bVar16 * *(int *)(local_950.ray + 0x1dc)
                        ;
                        iVar52 = *(int *)(local_950.hit + 100);
                        iVar53 = *(int *)(local_950.hit + 0x68);
                        iVar54 = *(int *)(local_950.hit + 0x6c);
                        iVar55 = *(int *)(local_950.hit + 0x70);
                        iVar56 = *(int *)(local_950.hit + 0x74);
                        iVar57 = *(int *)(local_950.hit + 0x78);
                        iVar58 = *(int *)(local_950.hit + 0x7c);
                        bVar10 = (bool)((byte)(uVar73 >> 1) & 1);
                        bVar11 = (bool)((byte)(uVar73 >> 2) & 1);
                        bVar12 = (bool)((byte)(uVar73 >> 3) & 1);
                        bVar13 = (bool)((byte)(uVar73 >> 4) & 1);
                        bVar14 = (bool)((byte)(uVar73 >> 5) & 1);
                        bVar15 = (bool)((byte)(uVar73 >> 6) & 1);
                        bVar16 = SUB81(uVar73 >> 7,0);
                        *(uint *)(local_950.ray + 0x1e0) =
                             (uint)(bVar71 & 1) * *(int *)(local_950.hit + 0x60) |
                             (uint)!(bool)(bVar71 & 1) * *(int *)(local_950.ray + 0x1e0);
                        *(uint *)(local_950.ray + 0x1e4) =
                             (uint)bVar10 * iVar52 | (uint)!bVar10 * *(int *)(local_950.ray + 0x1e4)
                        ;
                        *(uint *)(local_950.ray + 0x1e8) =
                             (uint)bVar11 * iVar53 | (uint)!bVar11 * *(int *)(local_950.ray + 0x1e8)
                        ;
                        *(uint *)(local_950.ray + 0x1ec) =
                             (uint)bVar12 * iVar54 | (uint)!bVar12 * *(int *)(local_950.ray + 0x1ec)
                        ;
                        *(uint *)(local_950.ray + 0x1f0) =
                             (uint)bVar13 * iVar55 | (uint)!bVar13 * *(int *)(local_950.ray + 0x1f0)
                        ;
                        *(uint *)(local_950.ray + 500) =
                             (uint)bVar14 * iVar56 | (uint)!bVar14 * *(int *)(local_950.ray + 500);
                        *(uint *)(local_950.ray + 0x1f8) =
                             (uint)bVar15 * iVar57 | (uint)!bVar15 * *(int *)(local_950.ray + 0x1f8)
                        ;
                        *(uint *)(local_950.ray + 0x1fc) =
                             (uint)bVar16 * iVar58 | (uint)!bVar16 * *(int *)(local_950.ray + 0x1fc)
                        ;
                        auVar142._0_4_ =
                             (uint)(bVar71 & 1) * *(int *)(local_950.hit + 0x80) |
                             (uint)!(bool)(bVar71 & 1) * *(int *)(local_950.ray + 0x200);
                        bVar10 = (bool)((byte)(uVar73 >> 1) & 1);
                        auVar142._4_4_ =
                             (uint)bVar10 * *(int *)(local_950.hit + 0x84) |
                             (uint)!bVar10 * *(int *)(local_950.ray + 0x204);
                        bVar10 = (bool)((byte)(uVar73 >> 2) & 1);
                        auVar142._8_4_ =
                             (uint)bVar10 * *(int *)(local_950.hit + 0x88) |
                             (uint)!bVar10 * *(int *)(local_950.ray + 0x208);
                        bVar10 = (bool)((byte)(uVar73 >> 3) & 1);
                        auVar142._12_4_ =
                             (uint)bVar10 * *(int *)(local_950.hit + 0x8c) |
                             (uint)!bVar10 * *(int *)(local_950.ray + 0x20c);
                        bVar10 = (bool)((byte)(uVar73 >> 4) & 1);
                        auVar142._16_4_ =
                             (uint)bVar10 * *(int *)(local_950.hit + 0x90) |
                             (uint)!bVar10 * *(int *)(local_950.ray + 0x210);
                        bVar10 = (bool)((byte)(uVar73 >> 5) & 1);
                        auVar142._20_4_ =
                             (uint)bVar10 * *(int *)(local_950.hit + 0x94) |
                             (uint)!bVar10 * *(int *)(local_950.ray + 0x214);
                        bVar10 = (bool)((byte)(uVar73 >> 6) & 1);
                        auVar142._24_4_ =
                             (uint)bVar10 * *(int *)(local_950.hit + 0x98) |
                             (uint)!bVar10 * *(int *)(local_950.ray + 0x218);
                        bVar10 = SUB81(uVar73 >> 7,0);
                        auVar142._28_4_ =
                             (uint)bVar10 * *(int *)(local_950.hit + 0x9c) |
                             (uint)!bVar10 * *(int *)(local_950.ray + 0x21c);
                        *(undefined1 (*) [32])(local_950.ray + 0x200) = auVar142;
                        auVar104 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_950.hit + 0xa0));
                        *(undefined1 (*) [32])(local_950.ray + 0x220) = auVar104;
                        auVar104 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_950.hit + 0xc0));
                        *(undefined1 (*) [32])(local_950.ray + 0x240) = auVar104;
                        auVar104 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_950.hit + 0xe0));
                        *(undefined1 (*) [32])(local_950.ray + 0x260) = auVar104;
                        auVar104 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_950.hit + 0x100))
                        ;
                        *(undefined1 (*) [32])(local_950.ray + 0x280) = auVar104;
                        break;
                      }
                    }
                    *(float *)(ray + k * 4 + 0x100) = fVar282;
                    break;
                  }
                }
                lVar72 = lVar72 + -1;
              } while (lVar72 != 0);
              uVar180 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar170._4_4_ = uVar180;
              auVar170._0_4_ = uVar180;
              auVar170._8_4_ = uVar180;
              auVar170._12_4_ = uVar180;
              auVar170._16_4_ = uVar180;
              auVar170._20_4_ = uVar180;
              auVar170._24_4_ = uVar180;
              auVar170._28_4_ = uVar180;
              auVar60._4_4_ = fStack_53c;
              auVar60._0_4_ = local_540;
              auVar60._8_4_ = fStack_538;
              auVar60._12_4_ = fStack_534;
              auVar60._16_4_ = fStack_530;
              auVar60._20_4_ = fStack_52c;
              auVar60._24_4_ = fStack_528;
              auVar60._28_4_ = fStack_524;
              uVar19 = vcmpps_avx512vl(auVar170,auVar60,0xd);
              bVar67 = ~('\x01' << ((byte)iVar23 & 0x1f)) & bVar67 & (byte)uVar19;
            } while (bVar67 != 0);
            auVar140 = local_560;
            fVar276 = (float)local_7e0._0_4_;
            fVar281 = (float)local_7e0._4_4_;
            fVar282 = fStack_7d8;
            fVar283 = fStack_7d4;
            fVar241 = fStack_7d0;
            fVar242 = fStack_7cc;
            fVar243 = fStack_7c8;
            fVar244 = fStack_7c4;
          }
          uVar21 = vpcmpgtd_avx512vl(auVar140,local_4e0);
          uVar22 = vpcmpd_avx512vl(local_4e0,local_300,1);
          auVar218._0_4_ = fVar276 + (float)local_200._0_4_;
          auVar218._4_4_ = fVar281 + (float)local_200._4_4_;
          auVar218._8_4_ = fVar282 + fStack_1f8;
          auVar218._12_4_ = fVar283 + fStack_1f4;
          auVar218._16_4_ = fVar241 + fStack_1f0;
          auVar218._20_4_ = fVar242 + fStack_1ec;
          auVar218._24_4_ = fVar243 + fStack_1e8;
          auVar218._28_4_ = fVar244 + fStack_1e4;
          uVar19 = vcmpps_avx512vl(auVar218,auVar170,2);
          bVar68 = bVar68 & (byte)uVar22 & (byte)uVar19;
          auVar219._0_4_ = fVar276 + local_360._0_4_;
          auVar219._4_4_ = fVar281 + local_360._4_4_;
          auVar219._8_4_ = fVar282 + local_360._8_4_;
          auVar219._12_4_ = fVar283 + local_360._12_4_;
          auVar219._16_4_ = fVar241 + local_360._16_4_;
          auVar219._20_4_ = fVar242 + local_360._20_4_;
          auVar219._24_4_ = fVar243 + local_360._24_4_;
          auVar219._28_4_ = fVar244 + local_360._28_4_;
          uVar19 = vcmpps_avx512vl(auVar219,auVar170,2);
          bVar62 = bVar62 & (byte)uVar21 & (byte)uVar19 | bVar68;
          if (bVar62 != 0) {
            abStack_180[uVar66 * 0x60] = bVar62;
            auVar143._0_4_ =
                 (uint)(bVar68 & 1) * local_200._0_4_ |
                 (uint)!(bool)(bVar68 & 1) * (int)local_360._0_4_;
            bVar10 = (bool)(bVar68 >> 1 & 1);
            auVar143._4_4_ = (uint)bVar10 * local_200._4_4_ | (uint)!bVar10 * (int)local_360._4_4_;
            bVar10 = (bool)(bVar68 >> 2 & 1);
            auVar143._8_4_ = (uint)bVar10 * (int)fStack_1f8 | (uint)!bVar10 * (int)local_360._8_4_;
            bVar10 = (bool)(bVar68 >> 3 & 1);
            auVar143._12_4_ = (uint)bVar10 * (int)fStack_1f4 | (uint)!bVar10 * (int)local_360._12_4_
            ;
            bVar10 = (bool)(bVar68 >> 4 & 1);
            auVar143._16_4_ = (uint)bVar10 * (int)fStack_1f0 | (uint)!bVar10 * (int)local_360._16_4_
            ;
            bVar10 = (bool)(bVar68 >> 5 & 1);
            auVar143._20_4_ = (uint)bVar10 * (int)fStack_1ec | (uint)!bVar10 * (int)local_360._20_4_
            ;
            auVar143._24_4_ =
                 (uint)(bVar68 >> 6) * (int)fStack_1e8 |
                 (uint)!(bool)(bVar68 >> 6) * (int)local_360._24_4_;
            auVar143._28_4_ = local_360._28_4_;
            *(undefined1 (*) [32])(auStack_160 + uVar66 * 0x60) = auVar143;
            uVar73 = vmovlps_avx(local_510);
            (&uStack_140)[uVar66 * 0xc] = uVar73;
            aiStack_138[uVar66 * 0x18] = iVar69 + 1;
            uVar66 = (ulong)((int)uVar66 + 1);
          }
        }
      }
    }
    do {
      uVar75 = (uint)uVar66;
      uVar66 = (ulong)(uVar75 - 1);
      if (uVar75 == 0) {
        uVar180 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar31._4_4_ = uVar180;
        auVar31._0_4_ = uVar180;
        auVar31._8_4_ = uVar180;
        auVar31._12_4_ = uVar180;
        uVar19 = vcmpps_avx512vl(local_520,auVar31,2);
        uVar65 = (uint)uVar19 & (uint)local_688 - 1 & (uint)local_688;
        local_688 = (ulong)uVar65;
        if (uVar65 == 0) {
          return;
        }
        goto LAB_01ba4336;
      }
      lVar72 = uVar66 * 0x60;
      auVar104 = *(undefined1 (*) [32])(auStack_160 + lVar72);
      auVar197._0_4_ = fVar276 + auVar104._0_4_;
      auVar197._4_4_ = fVar281 + auVar104._4_4_;
      auVar197._8_4_ = fVar282 + auVar104._8_4_;
      auVar197._12_4_ = fVar283 + auVar104._12_4_;
      auVar197._16_4_ = fVar241 + auVar104._16_4_;
      auVar197._20_4_ = fVar242 + auVar104._20_4_;
      auVar197._24_4_ = fVar243 + auVar104._24_4_;
      auVar197._28_4_ = fVar244 + auVar104._28_4_;
      uVar180 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar36._4_4_ = uVar180;
      auVar36._0_4_ = uVar180;
      auVar36._8_4_ = uVar180;
      auVar36._12_4_ = uVar180;
      auVar36._16_4_ = uVar180;
      auVar36._20_4_ = uVar180;
      auVar36._24_4_ = uVar180;
      auVar36._28_4_ = uVar180;
      uVar19 = vcmpps_avx512vl(auVar197,auVar36,2);
      uVar74 = (uint)uVar19 & (uint)abStack_180[lVar72];
    } while (uVar74 == 0);
    uVar73 = (&uStack_140)[uVar66 * 0xc];
    auVar194._8_8_ = 0;
    auVar194._0_8_ = uVar73;
    auVar220._8_4_ = 0x7f800000;
    auVar220._0_8_ = 0x7f8000007f800000;
    auVar220._12_4_ = 0x7f800000;
    auVar220._16_4_ = 0x7f800000;
    auVar220._20_4_ = 0x7f800000;
    auVar220._24_4_ = 0x7f800000;
    auVar220._28_4_ = 0x7f800000;
    auVar101 = vblendmps_avx512vl(auVar220,auVar104);
    bVar62 = (byte)uVar74;
    auVar144._0_4_ =
         (uint)(bVar62 & 1) * auVar101._0_4_ | (uint)!(bool)(bVar62 & 1) * (int)auVar104._0_4_;
    bVar10 = (bool)((byte)(uVar74 >> 1) & 1);
    auVar144._4_4_ = (uint)bVar10 * auVar101._4_4_ | (uint)!bVar10 * (int)auVar104._4_4_;
    bVar10 = (bool)((byte)(uVar74 >> 2) & 1);
    auVar144._8_4_ = (uint)bVar10 * auVar101._8_4_ | (uint)!bVar10 * (int)auVar104._8_4_;
    bVar10 = (bool)((byte)(uVar74 >> 3) & 1);
    auVar144._12_4_ = (uint)bVar10 * auVar101._12_4_ | (uint)!bVar10 * (int)auVar104._12_4_;
    bVar10 = (bool)((byte)(uVar74 >> 4) & 1);
    auVar144._16_4_ = (uint)bVar10 * auVar101._16_4_ | (uint)!bVar10 * (int)auVar104._16_4_;
    bVar10 = (bool)((byte)(uVar74 >> 5) & 1);
    auVar144._20_4_ = (uint)bVar10 * auVar101._20_4_ | (uint)!bVar10 * (int)auVar104._20_4_;
    bVar10 = (bool)((byte)(uVar74 >> 6) & 1);
    auVar144._24_4_ = (uint)bVar10 * auVar101._24_4_ | (uint)!bVar10 * (int)auVar104._24_4_;
    auVar144._28_4_ =
         (uVar74 >> 7) * auVar101._28_4_ | (uint)!SUB41(uVar74 >> 7,0) * (int)auVar104._28_4_;
    auVar104 = vshufps_avx(auVar144,auVar144,0xb1);
    auVar104 = vminps_avx(auVar144,auVar104);
    auVar101 = vshufpd_avx(auVar104,auVar104,5);
    auVar104 = vminps_avx(auVar104,auVar101);
    auVar101 = vpermpd_avx2(auVar104,0x4e);
    auVar104 = vminps_avx(auVar104,auVar101);
    uVar19 = vcmpps_avx512vl(auVar144,auVar104,0);
    bVar67 = (byte)uVar19 & bVar62;
    if (bVar67 != 0) {
      uVar74 = (uint)bVar67;
    }
    uVar145 = 0;
    for (; (uVar74 & 1) == 0; uVar74 = uVar74 >> 1 | 0x80000000) {
      uVar145 = uVar145 + 1;
    }
    iVar69 = aiStack_138[uVar66 * 0x18];
    bVar62 = ~('\x01' << ((byte)uVar145 & 0x1f)) & bVar62;
    abStack_180[lVar72] = bVar62;
    if (bVar62 == 0) {
      uVar75 = uVar75 - 1;
    }
    uVar180 = (undefined4)uVar73;
    auVar172._4_4_ = uVar180;
    auVar172._0_4_ = uVar180;
    auVar172._8_4_ = uVar180;
    auVar172._12_4_ = uVar180;
    auVar172._16_4_ = uVar180;
    auVar172._20_4_ = uVar180;
    auVar172._24_4_ = uVar180;
    auVar172._28_4_ = uVar180;
    auVar82 = vmovshdup_avx(auVar194);
    auVar82 = vsubps_avx(auVar82,auVar194);
    auVar198._0_4_ = auVar82._0_4_;
    auVar198._4_4_ = auVar198._0_4_;
    auVar198._8_4_ = auVar198._0_4_;
    auVar198._12_4_ = auVar198._0_4_;
    auVar198._16_4_ = auVar198._0_4_;
    auVar198._20_4_ = auVar198._0_4_;
    auVar198._24_4_ = auVar198._0_4_;
    auVar198._28_4_ = auVar198._0_4_;
    auVar82 = vfmadd132ps_fma(auVar198,auVar172,_DAT_01faff20);
    auVar104 = ZEXT1632(auVar82);
    local_480[0] = (RTCHitN)auVar104[0];
    local_480[1] = (RTCHitN)auVar104[1];
    local_480[2] = (RTCHitN)auVar104[2];
    local_480[3] = (RTCHitN)auVar104[3];
    local_480[4] = (RTCHitN)auVar104[4];
    local_480[5] = (RTCHitN)auVar104[5];
    local_480[6] = (RTCHitN)auVar104[6];
    local_480[7] = (RTCHitN)auVar104[7];
    local_480[8] = (RTCHitN)auVar104[8];
    local_480[9] = (RTCHitN)auVar104[9];
    local_480[10] = (RTCHitN)auVar104[10];
    local_480[0xb] = (RTCHitN)auVar104[0xb];
    local_480[0xc] = (RTCHitN)auVar104[0xc];
    local_480[0xd] = (RTCHitN)auVar104[0xd];
    local_480[0xe] = (RTCHitN)auVar104[0xe];
    local_480[0xf] = (RTCHitN)auVar104[0xf];
    local_480[0x10] = (RTCHitN)auVar104[0x10];
    local_480[0x11] = (RTCHitN)auVar104[0x11];
    local_480[0x12] = (RTCHitN)auVar104[0x12];
    local_480[0x13] = (RTCHitN)auVar104[0x13];
    local_480[0x14] = (RTCHitN)auVar104[0x14];
    local_480[0x15] = (RTCHitN)auVar104[0x15];
    local_480[0x16] = (RTCHitN)auVar104[0x16];
    local_480[0x17] = (RTCHitN)auVar104[0x17];
    local_480[0x18] = (RTCHitN)auVar104[0x18];
    local_480[0x19] = (RTCHitN)auVar104[0x19];
    local_480[0x1a] = (RTCHitN)auVar104[0x1a];
    local_480[0x1b] = (RTCHitN)auVar104[0x1b];
    local_480[0x1c] = (RTCHitN)auVar104[0x1c];
    local_480[0x1d] = (RTCHitN)auVar104[0x1d];
    local_480[0x1e] = (RTCHitN)auVar104[0x1e];
    local_480[0x1f] = (RTCHitN)auVar104[0x1f];
    auVar199 = ZEXT864(*(ulong *)(local_480 + (ulong)uVar145 * 4));
    uVar66 = (ulong)uVar75;
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }